

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testapi.c
# Opt level: O3

int test_tree(void)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  int iVar9;
  int iVar10;
  int iVar11;
  int iVar12;
  int iVar13;
  int iVar14;
  int iVar15;
  int iVar16;
  int iVar17;
  int iVar18;
  int iVar19;
  int iVar20;
  int iVar21;
  int iVar22;
  int iVar23;
  int iVar24;
  int iVar25;
  int iVar26;
  int iVar27;
  int iVar28;
  int iVar29;
  int iVar30;
  int iVar31;
  int iVar32;
  int iVar33;
  int iVar34;
  int iVar35;
  int iVar36;
  int iVar37;
  int iVar38;
  int iVar39;
  int iVar40;
  xmlNodePtr pxVar41;
  xmlBufferPtr pxVar42;
  xmlDocPtr pxVar43;
  xmlAttrPtr pxVar44;
  long lVar45;
  size_t sVar46;
  undefined8 uVar47;
  xmlDocPtr pxVar48;
  xmlDocPtr pxVar49;
  xmlDocPtr pxVar50;
  xmlNodePtr pxVar51;
  FILE *pFVar52;
  xmlNodePtr pxVar53;
  undefined4 uVar54;
  int iVar55;
  xmlChar *pxVar56;
  undefined8 uVar57;
  int extraout_EDX;
  int extraout_EDX_00;
  int extraout_EDX_01;
  int extraout_EDX_02;
  int extraout_EDX_03;
  int extraout_EDX_04;
  int extraout_EDX_05;
  int extraout_EDX_06;
  int extraout_EDX_07;
  int extraout_EDX_08;
  int nr;
  int nr_00;
  int nr_01;
  int nr_02;
  int extraout_EDX_09;
  int extraout_EDX_10;
  int extraout_EDX_11;
  int extraout_EDX_12;
  int extraout_EDX_13;
  int extraout_EDX_14;
  int extraout_EDX_15;
  int extraout_EDX_16;
  int extraout_EDX_17;
  int extraout_EDX_18;
  int extraout_EDX_19;
  int nr_03;
  int extraout_EDX_20;
  int extraout_EDX_21;
  int nr_04;
  int extraout_EDX_22;
  int extraout_EDX_23;
  int extraout_EDX_24;
  int extraout_EDX_25;
  int extraout_EDX_26;
  int nr_05;
  int nr_06;
  int nr_07;
  int extraout_EDX_27;
  int extraout_EDX_28;
  int extraout_EDX_29;
  int extraout_EDX_30;
  int nr_08;
  int nr_09;
  int nr_10;
  int nr_11;
  int extraout_EDX_31;
  int extraout_EDX_32;
  int extraout_EDX_33;
  int extraout_EDX_34;
  int extraout_EDX_35;
  int extraout_EDX_36;
  int nr_12;
  int nr_13;
  int nr_14;
  int nr_15;
  int nr_16;
  int nr_17;
  int nr_18;
  int extraout_EDX_37;
  int extraout_EDX_38;
  int extraout_EDX_39;
  int extraout_EDX_40;
  int extraout_EDX_41;
  int extraout_EDX_42;
  int nr_19;
  int nr_20;
  int extraout_EDX_43;
  int extraout_EDX_44;
  int nr_21;
  int nr_22;
  int nr_23;
  int test_ret_9;
  undefined4 *puVar58;
  xmlNs *pxVar59;
  undefined *puVar60;
  bool bVar61;
  bool bVar62;
  int n_cur_2;
  uint uVar63;
  int iVar64;
  uint uVar65;
  ulong uVar66;
  xmlDocPtr in_RSI;
  char *pcVar67;
  undefined4 uVar68;
  int n_cur;
  uint uVar69;
  uint uVar70;
  ulong *puVar71;
  ulong uVar72;
  int n_string;
  uint uVar73;
  int iVar74;
  int test_ret_14;
  char *pcVar75;
  uint *puVar76;
  char *__s;
  int n_str;
  undefined8 *puVar77;
  int *piVar78;
  undefined1 auVar79 [12];
  int test_ret;
  int test_ret_2;
  int test_ret_27;
  int test_ret_1;
  int test_ret_5;
  int test_ret_28;
  int test_ret_4;
  int test_ret_17;
  int test_ret_3;
  
  if (quiet == '\0') {
    puts("Testing tree : 142 of 164 functions ...");
  }
  uVar63 = 0;
  iVar55 = 0;
  do {
    uVar69 = 0;
    do {
      iVar3 = (int)in_RSI;
      iVar2 = xmlMemBlocks();
      in_RSI = (xmlDocPtr)gen_xmlNodePtr(uVar63,iVar3);
      if (uVar69 == 0) {
        uVar47 = xmlNewPI("test",0);
      }
      else {
        uVar47 = 0;
      }
      pxVar41 = (xmlNodePtr)xmlAddChild(in_RSI,uVar47);
      if (pxVar41 == (xmlNodePtr)0x0) {
        xmlFreeNode(uVar47);
        iVar3 = extraout_EDX_00;
      }
      else {
        desret_xmlNodePtr(pxVar41);
        iVar3 = extraout_EDX;
      }
      call_tests = call_tests + 1;
      des_xmlNodePtr(uVar63,(xmlNodePtr)in_RSI,iVar3);
      xmlResetLastError();
      iVar3 = xmlMemBlocks();
      if (iVar2 != iVar3) {
        iVar3 = xmlMemBlocks();
        printf("Leak of %d blocks found in xmlAddChild",(ulong)(uint)(iVar3 - iVar2));
        iVar55 = iVar55 + 1;
        printf(" %d",(ulong)uVar63);
        in_RSI = (xmlDocPtr)(ulong)uVar69;
        printf(" %d");
        putchar(10);
      }
      uVar69 = uVar69 + 1;
    } while (uVar69 != 3);
    uVar63 = uVar63 + 1;
  } while (uVar63 != 3);
  function_tests = function_tests + 1;
  uVar63 = 0;
  iVar2 = 0;
  do {
    uVar69 = 0;
    do {
      iVar4 = (int)in_RSI;
      iVar3 = xmlMemBlocks();
      in_RSI = (xmlDocPtr)gen_xmlNodePtr(uVar63,iVar4);
      if (uVar69 == 0) {
        uVar47 = xmlNewPI("test",0);
      }
      else {
        uVar47 = 0;
      }
      pxVar41 = (xmlNodePtr)xmlAddChildList(in_RSI,uVar47);
      if (pxVar41 == (xmlNodePtr)0x0) {
        xmlFreeNodeList(uVar47);
        iVar4 = extraout_EDX_02;
      }
      else {
        desret_xmlNodePtr(pxVar41);
        iVar4 = extraout_EDX_01;
      }
      call_tests = call_tests + 1;
      des_xmlNodePtr(uVar63,(xmlNodePtr)in_RSI,iVar4);
      xmlResetLastError();
      iVar4 = xmlMemBlocks();
      if (iVar3 != iVar4) {
        iVar4 = xmlMemBlocks();
        printf("Leak of %d blocks found in xmlAddChildList",(ulong)(uint)(iVar4 - iVar3));
        iVar2 = iVar2 + 1;
        printf(" %d",(ulong)uVar63);
        in_RSI = (xmlDocPtr)(ulong)uVar69;
        printf(" %d");
        putchar(10);
      }
      uVar69 = uVar69 + 1;
    } while (uVar69 != 3);
    uVar63 = uVar63 + 1;
  } while (uVar63 != 3);
  function_tests = function_tests + 1;
  uVar63 = 0;
  iVar3 = 0;
  do {
    uVar69 = 0;
    do {
      iVar5 = (int)in_RSI;
      iVar4 = xmlMemBlocks();
      in_RSI = (xmlDocPtr)gen_xmlNodePtr(uVar63,iVar5);
      if (uVar69 == 0) {
        uVar47 = xmlNewPI("test",0);
      }
      else {
        uVar47 = 0;
      }
      pxVar41 = (xmlNodePtr)xmlAddNextSibling(in_RSI,uVar47);
      if (pxVar41 == (xmlNodePtr)0x0) {
        xmlFreeNode(uVar47);
        iVar5 = extraout_EDX_04;
      }
      else {
        desret_xmlNodePtr(pxVar41);
        iVar5 = extraout_EDX_03;
      }
      call_tests = call_tests + 1;
      des_xmlNodePtr(uVar63,(xmlNodePtr)in_RSI,iVar5);
      xmlResetLastError();
      iVar5 = xmlMemBlocks();
      if (iVar4 != iVar5) {
        iVar5 = xmlMemBlocks();
        printf("Leak of %d blocks found in xmlAddNextSibling",(ulong)(uint)(iVar5 - iVar4));
        iVar3 = iVar3 + 1;
        printf(" %d",(ulong)uVar63);
        in_RSI = (xmlDocPtr)(ulong)uVar69;
        printf(" %d");
        putchar(10);
      }
      uVar69 = uVar69 + 1;
    } while (uVar69 != 3);
    uVar63 = uVar63 + 1;
  } while (uVar63 != 3);
  function_tests = function_tests + 1;
  uVar63 = 0;
  iVar4 = 0;
  do {
    uVar69 = 0;
    do {
      iVar6 = (int)in_RSI;
      iVar5 = xmlMemBlocks();
      in_RSI = (xmlDocPtr)gen_xmlNodePtr(uVar63,iVar6);
      if (uVar69 == 0) {
        uVar47 = xmlNewPI("test",0);
      }
      else {
        uVar47 = 0;
      }
      pxVar41 = (xmlNodePtr)xmlAddPrevSibling(in_RSI,uVar47);
      if (pxVar41 == (xmlNodePtr)0x0) {
        xmlFreeNode(uVar47);
        iVar6 = extraout_EDX_06;
      }
      else {
        desret_xmlNodePtr(pxVar41);
        iVar6 = extraout_EDX_05;
      }
      call_tests = call_tests + 1;
      des_xmlNodePtr(uVar63,(xmlNodePtr)in_RSI,iVar6);
      xmlResetLastError();
      iVar6 = xmlMemBlocks();
      if (iVar5 != iVar6) {
        iVar6 = xmlMemBlocks();
        printf("Leak of %d blocks found in xmlAddPrevSibling",(ulong)(uint)(iVar6 - iVar5));
        iVar4 = iVar4 + 1;
        printf(" %d",(ulong)uVar63);
        in_RSI = (xmlDocPtr)(ulong)uVar69;
        printf(" %d");
        putchar(10);
      }
      uVar69 = uVar69 + 1;
    } while (uVar69 != 3);
    uVar63 = uVar63 + 1;
  } while (uVar63 != 3);
  function_tests = function_tests + 1;
  uVar63 = 0;
  test_ret_4 = 0;
  do {
    uVar69 = 0;
    do {
      iVar6 = (int)in_RSI;
      iVar5 = xmlMemBlocks();
      in_RSI = (xmlDocPtr)gen_xmlNodePtr(uVar63,iVar6);
      if (uVar69 == 0) {
        uVar47 = xmlNewPI("test",0);
      }
      else {
        uVar47 = 0;
      }
      pxVar41 = (xmlNodePtr)xmlAddSibling(in_RSI,uVar47);
      if (pxVar41 == (xmlNodePtr)0x0) {
        xmlFreeNode(uVar47);
        iVar6 = extraout_EDX_08;
      }
      else {
        desret_xmlNodePtr(pxVar41);
        iVar6 = extraout_EDX_07;
      }
      call_tests = call_tests + 1;
      des_xmlNodePtr(uVar63,(xmlNodePtr)in_RSI,iVar6);
      xmlResetLastError();
      iVar6 = xmlMemBlocks();
      if (iVar5 != iVar6) {
        iVar6 = xmlMemBlocks();
        printf("Leak of %d blocks found in xmlAddSibling",(ulong)(uint)(iVar6 - iVar5));
        test_ret_4 = test_ret_4 + 1;
        printf(" %d",(ulong)uVar63);
        in_RSI = (xmlDocPtr)(ulong)uVar69;
        printf(" %d");
        putchar(10);
      }
      uVar69 = uVar69 + 1;
    } while (uVar69 != 3);
    uVar63 = uVar63 + 1;
  } while (uVar63 != 3);
  function_tests = function_tests + 1;
  iVar5 = 0;
  uVar63 = 0;
  do {
    uVar69 = 0;
    do {
      uVar70 = 0;
      bVar1 = true;
      do {
        bVar61 = bVar1;
        puVar77 = &DAT_00162d68;
        pxVar48 = (xmlDocPtr)0x0;
        do {
          iVar7 = (int)in_RSI;
          iVar6 = xmlMemBlocks();
          pxVar42 = gen_xmlBufferPtr(uVar63,iVar7);
          pxVar43 = gen_xmlDocPtr(uVar69,iVar7);
          pxVar44 = gen_xmlAttrPtr(uVar70,iVar7);
          uVar73 = (uint)pxVar48;
          if (uVar73 < 4) {
            uVar47 = *puVar77;
          }
          else {
            uVar47 = 0;
          }
          in_RSI = pxVar43;
          xmlAttrSerializeTxtContent(pxVar42,pxVar43,pxVar44,uVar47);
          call_tests = call_tests + 1;
          if (pxVar42 != (xmlBufferPtr)0x0) {
            xmlBufferFree(pxVar42);
          }
          if (((pxVar43 != (xmlDocPtr)0x0) && (api_doc != pxVar43)) && (pxVar43->doc != api_doc)) {
            xmlFreeDoc(pxVar43);
          }
          if (bVar61) {
            xmlFreeDoc(api_doc);
            api_doc = (xmlDocPtr)0x0;
            api_dtd = (xmlDtdPtr)0x0;
            api_root = (xmlNodePtr)0x0;
            api_ns = (xmlNsPtr)0x0;
          }
          xmlResetLastError();
          iVar7 = xmlMemBlocks();
          if (iVar6 != iVar7) {
            iVar7 = xmlMemBlocks();
            printf("Leak of %d blocks found in xmlAttrSerializeTxtContent",
                   (ulong)(uint)(iVar7 - iVar6));
            iVar5 = iVar5 + 1;
            printf(" %d",(ulong)uVar63);
            printf(" %d",(ulong)uVar69);
            printf(" %d",(ulong)uVar70);
            printf(" %d");
            putchar(10);
            in_RSI = pxVar48;
          }
          uVar73 = uVar73 + 1;
          pxVar48 = (xmlDocPtr)(ulong)uVar73;
          puVar77 = puVar77 + 1;
        } while (uVar73 != 5);
        uVar70 = 1;
        bVar1 = false;
      } while (bVar61);
      uVar69 = uVar69 + 1;
    } while (uVar69 != 4);
    uVar63 = uVar63 + 1;
  } while (uVar63 != 3);
  function_tests = function_tests + 1;
  iVar6 = xmlMemBlocks();
  lVar45 = xmlBufContent(0);
  if (lVar45 != 0) {
    (*_xmlFree)(lVar45);
  }
  call_tests = call_tests + 1;
  xmlResetLastError();
  iVar7 = xmlMemBlocks();
  if (iVar6 != iVar7) {
    xmlMemBlocks();
    printf("Leak of %d blocks found in xmlBufContent");
    printf(" %d");
    putchar(10);
  }
  function_tests = function_tests + 1;
  iVar8 = xmlMemBlocks();
  lVar45 = xmlBufEnd(0);
  if (lVar45 != 0) {
    (*_xmlFree)(lVar45);
  }
  call_tests = call_tests + 1;
  xmlResetLastError();
  iVar9 = xmlMemBlocks();
  if (iVar8 != iVar9) {
    xmlMemBlocks();
    printf("Leak of %d blocks found in xmlBufEnd");
    printf(" %d");
    putchar(10);
  }
  function_tests = function_tests + 1;
  iVar10 = xmlMemBlocks();
  pxVar48 = (xmlDocPtr)0x0;
  xmlBufGetNodeContent(0);
  call_tests = call_tests + 1;
  xmlResetLastError();
  iVar11 = xmlMemBlocks();
  if (iVar10 != iVar11) {
    xmlMemBlocks();
    printf("Leak of %d blocks found in xmlBufGetNodeContent");
    printf(" %d");
    pxVar48 = (xmlDocPtr)0x0;
    printf(" %d");
    putchar(10);
  }
  function_tests = function_tests + 1;
  iVar40 = 0;
  uVar63 = 0;
  do {
    iVar64 = 0;
    do {
      piVar78 = &DAT_0015fd14;
      uVar69 = 0;
      do {
        iVar12 = xmlMemBlocks();
        pxVar42 = gen_xmlBufferPtr(uVar63,(int)pxVar48);
        switch(iVar64) {
        case 0:
          bVar1 = false;
          pcVar75 = "foo";
          break;
        case 1:
          bVar1 = false;
          pcVar75 = "<foo/>";
          break;
        case 2:
          bVar1 = false;
          pcVar75 = anon_var_dwarf_1b5;
          break;
        case 3:
          bVar1 = false;
          pcVar75 = " 2ab ";
          break;
        default:
          bVar1 = true;
          pcVar75 = (char *)0x0;
        }
        iVar13 = *piVar78;
        if ((bVar1) || (sVar46 = strlen(pcVar75), iVar13 <= (int)sVar46 + 1)) {
          xmlBufferAdd(pxVar42,pcVar75,iVar13);
          call_tests = call_tests + 1;
          pxVar48 = (xmlDocPtr)pcVar75;
          if (pxVar42 != (xmlBufferPtr)0x0) {
            xmlBufferFree(pxVar42);
            pxVar48 = (xmlDocPtr)pcVar75;
          }
          xmlResetLastError();
          iVar13 = xmlMemBlocks();
          if (iVar12 != iVar13) {
            iVar13 = xmlMemBlocks();
            printf("Leak of %d blocks found in xmlBufferAdd",(ulong)(uint)(iVar13 - iVar12));
            iVar40 = iVar40 + 1;
            printf(" %d",(ulong)uVar63);
            printf(" %d",iVar64);
            pxVar48 = (xmlDocPtr)(ulong)uVar69;
            printf(" %d");
            putchar(10);
          }
        }
        uVar69 = uVar69 + 1;
        piVar78 = piVar78 + 1;
      } while (uVar69 != 4);
      iVar64 = iVar64 + 1;
    } while (iVar64 != 5);
    uVar63 = uVar63 + 1;
  } while (uVar63 != 3);
  function_tests = function_tests + 1;
  iVar64 = 0;
  uVar63 = 0;
  do {
    iVar12 = 0;
    do {
      uVar69 = 0;
      piVar78 = &DAT_0015fd14;
      do {
        iVar13 = xmlMemBlocks();
        pxVar42 = gen_xmlBufferPtr(uVar63,(int)pxVar48);
        switch(iVar12) {
        case 0:
          bVar1 = false;
          pcVar75 = "foo";
          break;
        case 1:
          bVar1 = false;
          pcVar75 = "<foo/>";
          break;
        case 2:
          bVar1 = false;
          pcVar75 = anon_var_dwarf_1b5;
          break;
        case 3:
          bVar1 = false;
          pcVar75 = " 2ab ";
          break;
        default:
          bVar1 = true;
          pcVar75 = (char *)0x0;
        }
        iVar14 = *piVar78;
        if ((bVar1) || (sVar46 = strlen(pcVar75), iVar14 <= (int)sVar46 + 1)) {
          xmlBufferAddHead(pxVar42,pcVar75,iVar14);
          call_tests = call_tests + 1;
          pxVar48 = (xmlDocPtr)pcVar75;
          if (pxVar42 != (xmlBufferPtr)0x0) {
            xmlBufferFree(pxVar42);
            pxVar48 = (xmlDocPtr)pcVar75;
          }
          xmlResetLastError();
          iVar14 = xmlMemBlocks();
          if (iVar13 != iVar14) {
            iVar14 = xmlMemBlocks();
            printf("Leak of %d blocks found in xmlBufferAddHead",(ulong)(uint)(iVar14 - iVar13));
            iVar64 = iVar64 + 1;
            printf(" %d",(ulong)uVar63);
            printf(" %d",iVar12);
            pxVar48 = (xmlDocPtr)(ulong)uVar69;
            printf(" %d");
            putchar(10);
          }
        }
        uVar69 = uVar69 + 1;
        piVar78 = piVar78 + 1;
      } while (uVar69 != 4);
      iVar12 = iVar12 + 1;
    } while (iVar12 != 5);
    uVar63 = uVar63 + 1;
  } while (uVar63 != 3);
  function_tests = function_tests + 1;
  iVar12 = 0;
  uVar63 = 0;
  do {
    puVar77 = &DAT_00162d50;
    pxVar43 = (xmlDocPtr)0x0;
    do {
      iVar14 = (int)pxVar48;
      iVar13 = xmlMemBlocks();
      pxVar42 = gen_xmlBufferPtr(uVar63,iVar14);
      uVar69 = (uint)pxVar43;
      if (uVar69 < 3) {
        pxVar48 = (xmlDocPtr)*puVar77;
      }
      else {
        pxVar48 = (xmlDocPtr)0x0;
      }
      xmlBufferCCat(pxVar42);
      call_tests = call_tests + 1;
      if (pxVar42 != (xmlBufferPtr)0x0) {
        xmlBufferFree(pxVar42);
      }
      xmlResetLastError();
      iVar14 = xmlMemBlocks();
      if (iVar13 != iVar14) {
        iVar14 = xmlMemBlocks();
        printf("Leak of %d blocks found in xmlBufferCCat",(ulong)(uint)(iVar14 - iVar13));
        iVar12 = iVar12 + 1;
        printf(" %d",(ulong)uVar63);
        printf(" %d");
        putchar(10);
        pxVar48 = pxVar43;
      }
      uVar69 = uVar69 + 1;
      pxVar43 = (xmlDocPtr)(ulong)uVar69;
      puVar77 = puVar77 + 1;
    } while (uVar69 != 4);
    uVar63 = uVar63 + 1;
  } while (uVar63 != 3);
  function_tests = function_tests + 1;
  iVar13 = 0;
  uVar63 = 0;
  do {
    puVar77 = &DAT_00162d68;
    pxVar43 = (xmlDocPtr)0x0;
    do {
      iVar15 = (int)pxVar48;
      iVar14 = xmlMemBlocks();
      pxVar42 = gen_xmlBufferPtr(uVar63,iVar15);
      uVar69 = (uint)pxVar43;
      if (uVar69 < 4) {
        pxVar48 = (xmlDocPtr)*puVar77;
      }
      else {
        pxVar48 = (xmlDocPtr)0x0;
      }
      xmlBufferCat(pxVar42);
      call_tests = call_tests + 1;
      if (pxVar42 != (xmlBufferPtr)0x0) {
        xmlBufferFree(pxVar42);
      }
      xmlResetLastError();
      iVar15 = xmlMemBlocks();
      if (iVar14 != iVar15) {
        iVar15 = xmlMemBlocks();
        printf("Leak of %d blocks found in xmlBufferCat",(ulong)(uint)(iVar15 - iVar14));
        iVar13 = iVar13 + 1;
        printf(" %d",(ulong)uVar63);
        printf(" %d");
        putchar(10);
        pxVar48 = pxVar43;
      }
      uVar69 = uVar69 + 1;
      pxVar43 = (xmlDocPtr)(ulong)uVar69;
      puVar77 = puVar77 + 1;
    } while (uVar69 != 5);
    uVar63 = uVar63 + 1;
  } while (uVar63 != 3);
  function_tests = function_tests + 1;
  iVar14 = xmlMemBlocks();
  xmlBufferContent(0);
  call_tests = call_tests + 1;
  xmlResetLastError();
  iVar15 = xmlMemBlocks();
  if (iVar14 != iVar15) {
    xmlMemBlocks();
    printf("Leak of %d blocks found in xmlBufferContent");
    pxVar48 = (xmlDocPtr)0x0;
    printf(" %d");
    putchar(10);
  }
  function_tests = function_tests + 1;
  iVar16 = xmlMemBlocks();
  uVar47 = xmlBufferCreate();
  xmlBufferFree(uVar47);
  call_tests = call_tests + 1;
  xmlResetLastError();
  iVar17 = xmlMemBlocks();
  if (iVar16 != iVar17) {
    iVar18 = xmlMemBlocks();
    pxVar48 = (xmlDocPtr)(ulong)(uint)(iVar18 - iVar16);
    printf("Leak of %d blocks found in xmlBufferCreate");
    putchar(10);
  }
  function_tests = function_tests + 1;
  uVar63 = 0;
  iVar18 = 0;
  do {
    iVar19 = xmlMemBlocks();
    pxVar42 = gen_xmlBufferPtr(uVar63,(int)pxVar48);
    lVar45 = xmlBufferDetach(pxVar42);
    if (lVar45 != 0) {
      (*_xmlFree)(lVar45);
    }
    call_tests = call_tests + 1;
    if (pxVar42 != (xmlBufferPtr)0x0) {
      xmlBufferFree(pxVar42);
    }
    xmlResetLastError();
    iVar20 = xmlMemBlocks();
    if (iVar19 != iVar20) {
      iVar20 = xmlMemBlocks();
      printf("Leak of %d blocks found in xmlBufferDetach",(ulong)(uint)(iVar20 - iVar19));
      iVar18 = iVar18 + 1;
      pxVar48 = (xmlDocPtr)(ulong)uVar63;
      printf(" %d");
      putchar(10);
    }
    uVar63 = uVar63 + 1;
  } while (uVar63 != 3);
  function_tests = function_tests + 1;
  uVar63 = 0;
  iVar19 = 0;
  do {
    iVar20 = xmlMemBlocks();
    pxVar42 = gen_xmlBufferPtr(uVar63,(int)pxVar48);
    xmlBufferEmpty(pxVar42);
    call_tests = call_tests + 1;
    if (pxVar42 != (xmlBufferPtr)0x0) {
      xmlBufferFree(pxVar42);
    }
    xmlResetLastError();
    iVar21 = xmlMemBlocks();
    if (iVar20 != iVar21) {
      iVar21 = xmlMemBlocks();
      printf("Leak of %d blocks found in xmlBufferEmpty",(ulong)(uint)(iVar21 - iVar20));
      iVar19 = iVar19 + 1;
      pxVar48 = (xmlDocPtr)(ulong)uVar63;
      printf(" %d");
      putchar(10);
    }
    uVar63 = uVar63 + 1;
  } while (uVar63 != 3);
  function_tests = function_tests + 1;
  test_ret = (int)(iVar16 != iVar17);
  iVar16 = 0;
  uVar63 = 0;
  do {
    puVar76 = &DAT_001521ec;
    pxVar43 = (xmlDocPtr)0x0;
    do {
      iVar20 = (int)pxVar48;
      iVar17 = xmlMemBlocks();
      pxVar42 = gen_xmlBufferPtr(uVar63,iVar20);
      pxVar48 = (xmlDocPtr)(ulong)*puVar76;
      xmlBufferGrow(pxVar42);
      call_tests = call_tests + 1;
      if (pxVar42 != (xmlBufferPtr)0x0) {
        xmlBufferFree(pxVar42);
      }
      xmlResetLastError();
      iVar20 = xmlMemBlocks();
      iVar21 = (int)pxVar43;
      if (iVar17 != iVar20) {
        iVar20 = xmlMemBlocks();
        printf("Leak of %d blocks found in xmlBufferGrow",(ulong)(uint)(iVar20 - iVar17));
        iVar16 = iVar16 + 1;
        printf(" %d",(ulong)uVar63);
        printf(" %d");
        putchar(10);
        pxVar48 = pxVar43;
      }
      uVar69 = iVar21 + 1;
      pxVar43 = (xmlDocPtr)(ulong)uVar69;
      puVar76 = puVar76 + 1;
    } while (uVar69 != 3);
    uVar63 = uVar63 + 1;
  } while (uVar63 != 3);
  function_tests = function_tests + 1;
  iVar17 = xmlMemBlocks();
  xmlBufferLength(0);
  call_tests = call_tests + 1;
  xmlResetLastError();
  iVar20 = xmlMemBlocks();
  if (iVar17 != iVar20) {
    xmlMemBlocks();
    printf("Leak of %d blocks found in xmlBufferLength");
    pxVar48 = (xmlDocPtr)0x0;
    printf(" %d");
    putchar(10);
  }
  function_tests = function_tests + 1;
  iVar21 = 0;
  uVar63 = 0;
  do {
    pxVar43 = (xmlDocPtr)0x0;
    puVar76 = &DAT_001521ec;
    do {
      iVar23 = (int)pxVar48;
      iVar22 = xmlMemBlocks();
      pxVar42 = gen_xmlBufferPtr(uVar63,iVar23);
      pxVar48 = (xmlDocPtr)(ulong)*puVar76;
      xmlBufferResize(pxVar42);
      call_tests = call_tests + 1;
      if (pxVar42 != (xmlBufferPtr)0x0) {
        xmlBufferFree(pxVar42);
      }
      xmlResetLastError();
      iVar23 = xmlMemBlocks();
      iVar24 = (int)pxVar43;
      if (iVar22 != iVar23) {
        iVar23 = xmlMemBlocks();
        printf("Leak of %d blocks found in xmlBufferResize",(ulong)(uint)(iVar23 - iVar22));
        iVar21 = iVar21 + 1;
        printf(" %d",(ulong)uVar63);
        printf(" %d");
        putchar(10);
        pxVar48 = pxVar43;
      }
      uVar69 = iVar24 + 1;
      pxVar43 = (xmlDocPtr)(ulong)uVar69;
      puVar76 = puVar76 + 1;
    } while (uVar69 != 3);
    uVar63 = uVar63 + 1;
  } while (uVar63 != 3);
  function_tests = function_tests + 1;
  iVar22 = 0;
  uVar63 = 0;
  do {
    uVar69 = 0xffffffff;
    do {
      iVar24 = (int)pxVar48;
      iVar23 = xmlMemBlocks();
      pxVar42 = gen_xmlBufferPtr(uVar63,iVar24);
      pxVar48 = (xmlDocPtr)0x0;
      if (uVar69 < 3) {
        pxVar48 = (xmlDocPtr)(ulong)(uint)(&DAT_001521f8)[uVar69];
      }
      xmlBufferSetAllocationScheme(pxVar42);
      call_tests = call_tests + 1;
      if (pxVar42 != (xmlBufferPtr)0x0) {
        xmlBufferFree(pxVar42);
      }
      uVar69 = uVar69 + 1;
      xmlResetLastError();
      iVar24 = xmlMemBlocks();
      if (iVar23 != iVar24) {
        iVar24 = xmlMemBlocks();
        printf("Leak of %d blocks found in xmlBufferSetAllocationScheme",
               (ulong)(uint)(iVar24 - iVar23));
        iVar22 = iVar22 + 1;
        printf(" %d",(ulong)uVar63);
        pxVar48 = (xmlDocPtr)(ulong)uVar69;
        printf(" %d");
        putchar(10);
      }
    } while (uVar69 != 3);
    uVar63 = uVar63 + 1;
  } while (uVar63 != 3);
  function_tests = function_tests + 1;
  test_ret_2 = 0;
  uVar63 = 0;
  do {
    puVar76 = &DAT_001521ec;
    uVar69 = 0;
    do {
      iVar24 = (int)pxVar48;
      iVar23 = xmlMemBlocks();
      pxVar42 = gen_xmlBufferPtr(uVar63,iVar24);
      pxVar48 = (xmlDocPtr)(ulong)*puVar76;
      xmlBufferShrink(pxVar42);
      call_tests = call_tests + 1;
      if (pxVar42 != (xmlBufferPtr)0x0) {
        xmlBufferFree(pxVar42);
      }
      xmlResetLastError();
      iVar24 = xmlMemBlocks();
      if (iVar23 != iVar24) {
        iVar24 = xmlMemBlocks();
        printf("Leak of %d blocks found in xmlBufferShrink",(ulong)(uint)(iVar24 - iVar23));
        test_ret_2 = test_ret_2 + 1;
        printf(" %d",(ulong)uVar63);
        pxVar48 = (xmlDocPtr)(ulong)uVar69;
        printf(" %d");
        putchar(10);
      }
      uVar69 = uVar69 + 1;
      puVar76 = puVar76 + 1;
    } while (uVar69 != 3);
    uVar63 = uVar63 + 1;
  } while (uVar63 != 3);
  function_tests = function_tests + 1;
  iVar23 = 0;
  uVar63 = 0;
  do {
    puVar77 = &DAT_00162d68;
    uVar69 = 0;
    do {
      iVar25 = (int)pxVar48;
      iVar24 = xmlMemBlocks();
      pxVar42 = gen_xmlBufferPtr(uVar63,iVar25);
      if (uVar69 < 4) {
        pxVar48 = (xmlDocPtr)*puVar77;
      }
      else {
        pxVar48 = (xmlDocPtr)0x0;
      }
      xmlBufferWriteCHAR(pxVar42);
      call_tests = call_tests + 1;
      if (pxVar42 != (xmlBufferPtr)0x0) {
        xmlBufferFree(pxVar42);
      }
      xmlResetLastError();
      iVar25 = xmlMemBlocks();
      if (iVar24 != iVar25) {
        iVar25 = xmlMemBlocks();
        printf("Leak of %d blocks found in xmlBufferWriteCHAR",(ulong)(uint)(iVar25 - iVar24));
        iVar23 = iVar23 + 1;
        printf(" %d",(ulong)uVar63);
        pxVar48 = (xmlDocPtr)(ulong)uVar69;
        printf(" %d");
        putchar(10);
      }
      uVar69 = uVar69 + 1;
      puVar77 = puVar77 + 1;
    } while (uVar69 != 5);
    uVar63 = uVar63 + 1;
  } while (uVar63 != 3);
  function_tests = function_tests + 1;
  test_ret_17 = 0;
  uVar63 = 0;
  do {
    puVar77 = &DAT_00162d50;
    uVar69 = 0;
    do {
      iVar25 = (int)pxVar48;
      iVar24 = xmlMemBlocks();
      pxVar42 = gen_xmlBufferPtr(uVar63,iVar25);
      if (uVar69 < 3) {
        pxVar48 = (xmlDocPtr)*puVar77;
      }
      else {
        pxVar48 = (xmlDocPtr)0x0;
      }
      xmlBufferWriteChar(pxVar42);
      call_tests = call_tests + 1;
      if (pxVar42 != (xmlBufferPtr)0x0) {
        xmlBufferFree(pxVar42);
      }
      xmlResetLastError();
      iVar25 = xmlMemBlocks();
      if (iVar24 != iVar25) {
        iVar25 = xmlMemBlocks();
        printf("Leak of %d blocks found in xmlBufferWriteChar",(ulong)(uint)(iVar25 - iVar24));
        test_ret_17 = test_ret_17 + 1;
        printf(" %d",(ulong)uVar63);
        pxVar48 = (xmlDocPtr)(ulong)uVar69;
        printf(" %d");
        putchar(10);
      }
      uVar69 = uVar69 + 1;
      puVar77 = puVar77 + 1;
    } while (uVar69 != 4);
    uVar63 = uVar63 + 1;
  } while (uVar63 != 3);
  iVar55 = iVar18 + iVar19 +
           iVar2 + iVar55 + iVar3 + iVar4 + test_ret_4 + iVar5 + (uint)(iVar6 != iVar7) +
           (uint)(iVar8 != iVar9) + (uint)(iVar10 != iVar11) + iVar40 + iVar64 + iVar12 + iVar13 +
           (uint)(iVar14 != iVar15) + test_ret + iVar16 + (uint)(iVar17 != iVar20) + iVar21 + iVar22
           + test_ret_2;
  function_tests = function_tests + 1;
  iVar2 = 0;
  uVar63 = 0;
  do {
    puVar77 = &DAT_00162d68;
    uVar69 = 0;
    do {
      iVar4 = (int)pxVar48;
      iVar3 = xmlMemBlocks();
      pxVar42 = gen_xmlBufferPtr(uVar63,iVar4);
      if (uVar69 < 4) {
        pxVar48 = (xmlDocPtr)*puVar77;
      }
      else {
        pxVar48 = (xmlDocPtr)0x0;
      }
      xmlBufferWriteQuotedString(pxVar42);
      call_tests = call_tests + 1;
      if (pxVar42 != (xmlBufferPtr)0x0) {
        xmlBufferFree(pxVar42);
      }
      xmlResetLastError();
      iVar4 = xmlMemBlocks();
      if (iVar3 != iVar4) {
        iVar4 = xmlMemBlocks();
        printf("Leak of %d blocks found in xmlBufferWriteQuotedString",(ulong)(uint)(iVar4 - iVar3))
        ;
        iVar2 = iVar2 + 1;
        printf(" %d",(ulong)uVar63);
        pxVar48 = (xmlDocPtr)(ulong)uVar69;
        printf(" %d");
        putchar(10);
      }
      uVar69 = uVar69 + 1;
      puVar77 = puVar77 + 1;
    } while (uVar69 != 5);
    uVar63 = uVar63 + 1;
  } while (uVar63 != 3);
  function_tests = function_tests + 1;
  test_ret_4 = 0;
  uVar63 = 0;
  do {
    iVar3 = 0;
    do {
      _test_ret_3 = 0;
      bVar1 = true;
      do {
        bVar61 = bVar1;
        pxVar56 = (xmlChar *)0x0;
        if (bVar61) {
          pxVar56 = chartab;
        }
        piVar78 = &DAT_0015fd14;
        uVar69 = 0;
        do {
          iVar4 = xmlMemBlocks();
          if (uVar63 < 4) {
            _test_ret = (xmlDocPtr)(&DAT_00162d68)[uVar63];
          }
          else {
            _test_ret = (xmlDocPtr)0x0;
          }
          switch(iVar3) {
          case 0:
            bVar1 = false;
            pcVar75 = "foo";
            break;
          case 1:
            bVar1 = false;
            pcVar75 = "<foo/>";
            break;
          case 2:
            bVar1 = false;
            pcVar75 = anon_var_dwarf_1b5;
            break;
          case 3:
            bVar1 = false;
            pcVar75 = " 2ab ";
            break;
          default:
            bVar1 = true;
            pcVar75 = (char *)0x0;
          }
          iVar5 = *piVar78;
          if ((bVar1) || (sVar46 = strlen(pcVar75), iVar5 <= (int)sVar46 + 1)) {
            pxVar48 = (xmlDocPtr)pcVar75;
            pxVar43 = (xmlDocPtr)xmlBuildQName(_test_ret,pcVar75,pxVar56,iVar5);
            if ((pxVar43 != (xmlDocPtr)pxVar56) &&
               (((pxVar43 != (xmlDocPtr)pcVar75 && (pxVar43 != (xmlDocPtr)0x0)) &&
                (pxVar43 != _test_ret)))) {
              (*_xmlFree)(pxVar43);
            }
            call_tests = call_tests + 1;
            xmlResetLastError();
            iVar5 = xmlMemBlocks();
            if (iVar4 != iVar5) {
              iVar5 = xmlMemBlocks();
              printf("Leak of %d blocks found in xmlBuildQName",(ulong)(uint)(iVar5 - iVar4));
              test_ret_4 = test_ret_4 + 1;
              printf(" %d",(ulong)uVar63);
              printf(" %d",iVar3);
              printf(" %d",_test_ret_3);
              pxVar48 = (xmlDocPtr)(ulong)uVar69;
              printf(" %d");
              putchar(10);
            }
          }
          uVar69 = uVar69 + 1;
          piVar78 = piVar78 + 1;
        } while (uVar69 != 4);
        _test_ret_3 = 1;
        bVar1 = false;
      } while (bVar61);
      iVar3 = iVar3 + 1;
    } while (iVar3 != 5);
    uVar63 = uVar63 + 1;
  } while (uVar63 != 5);
  function_tests = function_tests + 1;
  uVar63 = 0;
  iVar3 = 0;
  do {
    iVar5 = (int)pxVar48;
    iVar4 = xmlMemBlocks();
    pxVar48 = (xmlDocPtr)gen_xmlNodePtr(uVar63,iVar5);
    xmlChildElementCount(pxVar48);
    call_tests = call_tests + 1;
    des_xmlNodePtr(uVar63,(xmlNodePtr)pxVar48,nr);
    xmlResetLastError();
    iVar5 = xmlMemBlocks();
    if (iVar4 != iVar5) {
      iVar5 = xmlMemBlocks();
      printf("Leak of %d blocks found in xmlChildElementCount",(ulong)(uint)(iVar5 - iVar4));
      iVar3 = iVar3 + 1;
      pxVar48 = (xmlDocPtr)(ulong)uVar63;
      printf(" %d");
      putchar(10);
    }
    uVar63 = uVar63 + 1;
  } while (uVar63 != 3);
  function_tests = function_tests + 1;
  iVar4 = 0;
  uVar63 = 0;
  do {
    puVar76 = &DAT_0015fd14;
    pxVar43 = (xmlDocPtr)0x0;
    do {
      iVar6 = (int)pxVar48;
      iVar5 = xmlMemBlocks();
      pxVar49 = gen_xmlDocPtr(uVar63,iVar6);
      pxVar48 = (xmlDocPtr)(ulong)*puVar76;
      pxVar50 = (xmlDocPtr)xmlCopyDoc(pxVar49);
      if (api_doc != pxVar50) {
        xmlFreeDoc(pxVar50);
      }
      call_tests = call_tests + 1;
      if (((pxVar49 != (xmlDocPtr)0x0) && (api_doc != pxVar49)) && (pxVar49->doc != api_doc)) {
        xmlFreeDoc(pxVar49);
      }
      xmlResetLastError();
      iVar6 = xmlMemBlocks();
      iVar7 = (int)pxVar43;
      if (iVar5 != iVar6) {
        iVar6 = xmlMemBlocks();
        printf("Leak of %d blocks found in xmlCopyDoc",(ulong)(uint)(iVar6 - iVar5));
        iVar4 = iVar4 + 1;
        printf(" %d",(ulong)uVar63);
        printf(" %d");
        putchar(10);
        pxVar48 = pxVar43;
      }
      uVar69 = iVar7 + 1;
      pxVar43 = (xmlDocPtr)(ulong)uVar69;
      puVar76 = puVar76 + 1;
    } while (uVar69 != 4);
    uVar63 = uVar63 + 1;
  } while (uVar63 != 4);
  function_tests = function_tests + 1;
  uVar63 = 0;
  iVar5 = 0;
  do {
    iVar7 = (int)pxVar48;
    iVar6 = xmlMemBlocks();
    pxVar48 = (xmlDocPtr)gen_xmlDtdPtr(uVar63,iVar7);
    pxVar41 = (xmlNodePtr)xmlCopyDtd(pxVar48);
    desret_xmlNodePtr(pxVar41);
    call_tests = call_tests + 1;
    des_xmlDtdPtr(uVar63,(xmlDtdPtr)pxVar48,nr_00);
    xmlResetLastError();
    iVar7 = xmlMemBlocks();
    if (iVar6 != iVar7) {
      iVar7 = xmlMemBlocks();
      printf("Leak of %d blocks found in xmlCopyDtd",(ulong)(uint)(iVar7 - iVar6));
      iVar5 = iVar5 + 1;
      pxVar48 = (xmlDocPtr)(ulong)uVar63;
      printf(" %d");
      putchar(10);
    }
    uVar63 = uVar63 + 1;
  } while (uVar63 != 3);
  function_tests = function_tests + 1;
  uVar63 = 0;
  test_ret_5 = 0;
  bVar1 = true;
  do {
    bVar61 = bVar1;
    iVar6 = xmlMemBlocks();
    if (bVar61) {
      get_api_root();
      pxVar59 = api_ns;
      if (api_root != (xmlNodePtr)0x0) {
        api_ns = api_root->nsDef;
        pxVar59 = api_ns;
      }
    }
    else {
      pxVar59 = (xmlNs *)0x0;
    }
    lVar45 = xmlCopyNamespace(pxVar59);
    if (lVar45 != 0) {
      xmlFreeNs();
    }
    call_tests = call_tests + 1;
    if (bVar61) {
      xmlFreeDoc();
      api_doc = (xmlDocPtr)0x0;
      api_dtd = (xmlDtdPtr)0x0;
      api_root = (xmlNodePtr)0x0;
      api_ns = (xmlNsPtr)0x0;
    }
    xmlResetLastError();
    iVar7 = xmlMemBlocks();
    if (iVar6 != iVar7) {
      iVar7 = xmlMemBlocks();
      printf("Leak of %d blocks found in xmlCopyNamespace",(ulong)(uint)(iVar7 - iVar6));
      test_ret_5 = test_ret_5 + 1;
      pxVar48 = (xmlDocPtr)(ulong)uVar63;
      printf(" %d");
      putchar(10);
    }
    uVar63 = 1;
    bVar1 = false;
  } while (bVar61);
  function_tests = function_tests + 1;
  uVar63 = 0;
  iVar6 = 0;
  bVar1 = true;
  do {
    bVar61 = bVar1;
    iVar7 = xmlMemBlocks();
    if (bVar61) {
      get_api_root();
      pxVar59 = api_ns;
      if (api_root != (xmlNodePtr)0x0) {
        api_ns = api_root->nsDef;
        pxVar59 = api_ns;
      }
    }
    else {
      pxVar59 = (xmlNs *)0x0;
    }
    lVar45 = xmlCopyNamespaceList(pxVar59);
    if (lVar45 != 0) {
      xmlFreeNsList();
    }
    call_tests = call_tests + 1;
    if (bVar61) {
      xmlFreeDoc();
      api_doc = (xmlDocPtr)0x0;
      api_dtd = (xmlDtdPtr)0x0;
      api_root = (xmlNodePtr)0x0;
      api_ns = (xmlNsPtr)0x0;
    }
    xmlResetLastError();
    iVar8 = xmlMemBlocks();
    if (iVar7 != iVar8) {
      iVar8 = xmlMemBlocks();
      printf("Leak of %d blocks found in xmlCopyNamespaceList",(ulong)(uint)(iVar8 - iVar7));
      iVar6 = iVar6 + 1;
      pxVar48 = (xmlDocPtr)(ulong)uVar63;
      printf(" %d");
      putchar(10);
    }
    uVar63 = 1;
    bVar1 = false;
  } while (bVar61);
  function_tests = function_tests + 1;
  iVar7 = 0;
  uVar63 = 0;
  do {
    pxVar43 = (xmlDocPtr)0x0;
    puVar58 = &DAT_0015fd14;
    do {
      iVar9 = (int)pxVar48;
      iVar8 = xmlMemBlocks();
      pxVar48 = (xmlDocPtr)gen_xmlNodePtr(uVar63,iVar9);
      pxVar41 = (xmlNodePtr)xmlCopyNode(pxVar48,*puVar58);
      desret_xmlNodePtr(pxVar41);
      call_tests = call_tests + 1;
      des_xmlNodePtr(uVar63,(xmlNodePtr)pxVar48,nr_01);
      xmlResetLastError();
      iVar9 = xmlMemBlocks();
      iVar10 = (int)pxVar43;
      if (iVar8 != iVar9) {
        iVar9 = xmlMemBlocks();
        printf("Leak of %d blocks found in xmlCopyNode",(ulong)(uint)(iVar9 - iVar8));
        iVar7 = iVar7 + 1;
        printf(" %d",(ulong)uVar63);
        printf(" %d");
        putchar(10);
        pxVar48 = pxVar43;
      }
      uVar69 = iVar10 + 1;
      pxVar43 = (xmlDocPtr)(ulong)uVar69;
      puVar58 = puVar58 + 1;
    } while (uVar69 != 4);
    uVar63 = uVar63 + 1;
  } while (uVar63 != 3);
  function_tests = function_tests + 1;
  uVar63 = 0;
  test_ret_2 = 0;
  do {
    iVar9 = (int)pxVar48;
    iVar8 = xmlMemBlocks();
    pxVar48 = (xmlDocPtr)gen_xmlNodePtr(uVar63,iVar9);
    pxVar41 = (xmlNodePtr)xmlCopyNodeList(pxVar48);
    desret_xmlNodePtr(pxVar41);
    call_tests = call_tests + 1;
    des_xmlNodePtr(uVar63,(xmlNodePtr)pxVar48,nr_02);
    xmlResetLastError();
    iVar9 = xmlMemBlocks();
    if (iVar8 != iVar9) {
      iVar9 = xmlMemBlocks();
      printf("Leak of %d blocks found in xmlCopyNodeList",(ulong)(uint)(iVar9 - iVar8));
      test_ret_2 = test_ret_2 + 1;
      pxVar48 = (xmlDocPtr)(ulong)uVar63;
      printf(" %d");
      putchar(10);
    }
    uVar63 = uVar63 + 1;
  } while (uVar63 != 3);
  function_tests = function_tests + 1;
  iVar8 = 0;
  uVar63 = 0;
  do {
    pxVar43 = (xmlDocPtr)0x0;
    bVar1 = true;
    do {
      bVar61 = bVar1;
      iVar9 = (int)pxVar48;
      iVar10 = xmlMemBlocks();
      pxVar48 = (xmlDocPtr)gen_xmlNodePtr(uVar63,iVar9);
      pxVar44 = gen_xmlAttrPtr((int)pxVar43,iVar9);
      auVar79 = xmlCopyProp(pxVar48,pxVar44);
      iVar9 = auVar79._8_4_;
      lVar45 = auVar79._0_8_;
      if (lVar45 != 0) {
        xmlUnlinkNode(lVar45);
        xmlFreeNode(lVar45);
        iVar9 = extraout_EDX_09;
      }
      call_tests = call_tests + 1;
      des_xmlNodePtr(uVar63,(xmlNodePtr)pxVar48,iVar9);
      if (bVar61) {
        xmlFreeDoc(api_doc);
        api_doc = (xmlDocPtr)0x0;
        api_dtd = (xmlDtdPtr)0x0;
        api_root = (xmlNodePtr)0x0;
        api_ns = (xmlNsPtr)0x0;
      }
      xmlResetLastError();
      iVar9 = xmlMemBlocks();
      if (iVar10 != iVar9) {
        iVar9 = xmlMemBlocks();
        printf("Leak of %d blocks found in xmlCopyProp",(ulong)(uint)(iVar9 - iVar10));
        iVar8 = iVar8 + 1;
        printf(" %d",(ulong)uVar63);
        printf(" %d");
        putchar(10);
        pxVar48 = pxVar43;
      }
      pxVar43 = (xmlDocPtr)0x1;
      bVar1 = false;
    } while (bVar61);
    uVar63 = uVar63 + 1;
  } while (uVar63 != 3);
  function_tests = function_tests + 1;
  test_ret_28 = 0;
  uVar63 = 0;
  do {
    uVar69 = 0;
    bVar1 = true;
    do {
      bVar61 = bVar1;
      iVar9 = (int)pxVar48;
      iVar10 = xmlMemBlocks();
      pxVar48 = (xmlDocPtr)gen_xmlNodePtr(uVar63,iVar9);
      pxVar44 = gen_xmlAttrPtr(uVar69,iVar9);
      auVar79 = xmlCopyPropList(pxVar48,pxVar44);
      iVar9 = auVar79._8_4_;
      lVar45 = auVar79._0_8_;
      if (lVar45 != 0) {
        xmlUnlinkNode(lVar45);
        xmlFreeNode(lVar45);
        iVar9 = extraout_EDX_10;
      }
      call_tests = call_tests + 1;
      des_xmlNodePtr(uVar63,(xmlNodePtr)pxVar48,iVar9);
      if (bVar61) {
        xmlFreeDoc(api_doc);
        api_doc = (xmlDocPtr)0x0;
        api_dtd = (xmlDtdPtr)0x0;
        api_root = (xmlNodePtr)0x0;
        api_ns = (xmlNsPtr)0x0;
      }
      xmlResetLastError();
      iVar9 = xmlMemBlocks();
      if (iVar10 != iVar9) {
        iVar9 = xmlMemBlocks();
        printf("Leak of %d blocks found in xmlCopyPropList",(ulong)(uint)(iVar9 - iVar10));
        test_ret_28 = test_ret_28 + 1;
        printf(" %d",(ulong)uVar63);
        pxVar48 = (xmlDocPtr)(ulong)uVar69;
        printf(" %d");
        putchar(10);
      }
      uVar69 = 1;
      bVar1 = false;
    } while (bVar61);
    uVar63 = uVar63 + 1;
  } while (uVar63 != 3);
  iVar55 = test_ret_5 + iVar6 +
           test_ret_17 + iVar2 + iVar55 + iVar23 + test_ret_4 + iVar3 + iVar4 + iVar5 + iVar7 +
           test_ret_2;
  function_tests = function_tests + 1;
  test_ret_2 = 0;
  uVar63 = 0;
  do {
    uVar69 = 0;
    do {
      uVar66 = 0;
      do {
        puVar77 = &DAT_00162d68;
        pxVar43 = (xmlDocPtr)0x0;
        do {
          iVar3 = (int)pxVar48;
          iVar2 = xmlMemBlocks();
          pxVar49 = gen_xmlDocPtr(uVar63,iVar3);
          if (uVar69 < 4) {
            pxVar48 = (xmlDocPtr)(&DAT_00162d68)[uVar69];
          }
          else {
            pxVar48 = (xmlDocPtr)0x0;
          }
          if ((uint)uVar66 < 4) {
            uVar47 = (&DAT_00162d68)[uVar66];
          }
          else {
            uVar47 = 0;
          }
          uVar70 = (uint)pxVar43;
          if (uVar70 < 4) {
            uVar57 = *puVar77;
          }
          else {
            uVar57 = 0;
          }
          pxVar41 = (xmlNodePtr)xmlCreateIntSubset(pxVar49,pxVar48,uVar47,uVar57);
          desret_xmlNodePtr(pxVar41);
          call_tests = call_tests + 1;
          if (((pxVar49 != (xmlDocPtr)0x0) && (api_doc != pxVar49)) && (pxVar49->doc != api_doc)) {
            xmlFreeDoc(pxVar49);
          }
          xmlResetLastError();
          iVar3 = xmlMemBlocks();
          if (iVar2 != iVar3) {
            iVar3 = xmlMemBlocks();
            printf("Leak of %d blocks found in xmlCreateIntSubset",(ulong)(uint)(iVar3 - iVar2));
            test_ret_2 = test_ret_2 + 1;
            printf(" %d",(ulong)uVar63);
            printf(" %d",(ulong)uVar69);
            printf(" %d",uVar66);
            printf(" %d");
            putchar(10);
            pxVar48 = pxVar43;
          }
          uVar70 = uVar70 + 1;
          pxVar43 = (xmlDocPtr)(ulong)uVar70;
          puVar77 = puVar77 + 1;
        } while (uVar70 != 5);
        uVar70 = (uint)uVar66 + 1;
        uVar66 = (ulong)uVar70;
      } while (uVar70 != 5);
      uVar69 = uVar69 + 1;
    } while (uVar69 != 5);
    uVar63 = uVar63 + 1;
  } while (uVar63 != 4);
  function_tests = function_tests + 1;
  test_ret_4 = 0;
  uVar63 = 0;
  do {
    iVar2 = 0;
    do {
      uVar69 = 0;
      do {
        iVar3 = 0;
        do {
          pxVar43 = (xmlDocPtr)0x0;
          puVar58 = &DAT_0015fd14;
          do {
            iVar4 = (int)pxVar48;
            iVar5 = xmlMemBlocks();
            pxVar49 = gen_xmlDocPtr(uVar63,iVar4);
            pxVar51 = gen_xmlNodePtr(iVar2,iVar4);
            pxVar50 = gen_xmlDocPtr(uVar69,iVar4);
            pxVar48 = (xmlDocPtr)gen_xmlNodePtr(iVar3,iVar4);
            xmlDOMWrapAdoptNode(0,pxVar49,pxVar51,pxVar50,pxVar48,*puVar58);
            pxVar41 = (xmlNodePtr)0x0;
            iVar4 = extraout_EDX_11;
            if ((pxVar51 != (xmlNodePtr)0x0) &&
               (pxVar41 = pxVar51, pxVar51->parent == (_xmlNode *)0x0)) {
              xmlUnlinkNode(pxVar51);
              xmlFreeNode(pxVar51);
              pxVar41 = (xmlNodePtr)0x0;
              iVar4 = extraout_EDX_12;
            }
            call_tests = call_tests + 1;
            if (((pxVar49 != (xmlDocPtr)0x0) && (api_doc != pxVar49)) && (pxVar49->doc != api_doc))
            {
              xmlFreeDoc(pxVar49);
              iVar4 = extraout_EDX_13;
            }
            des_xmlNodePtr(iVar2,pxVar41,iVar4);
            iVar4 = extraout_EDX_14;
            if (((pxVar50 != (xmlDocPtr)0x0) && (api_doc != pxVar50)) && (pxVar50->doc != api_doc))
            {
              xmlFreeDoc(pxVar50);
              iVar4 = extraout_EDX_15;
            }
            des_xmlNodePtr(iVar3,(xmlNodePtr)pxVar48,iVar4);
            xmlResetLastError();
            iVar4 = xmlMemBlocks();
            iVar6 = (int)pxVar43;
            if (iVar5 != iVar4) {
              iVar4 = xmlMemBlocks();
              printf("Leak of %d blocks found in xmlDOMWrapAdoptNode",(ulong)(uint)(iVar4 - iVar5));
              test_ret_4 = test_ret_4 + 1;
              printf(" %d",0);
              printf(" %d",(ulong)uVar63);
              printf(" %d",iVar2);
              printf(" %d",(ulong)uVar69);
              printf(" %d",iVar3);
              printf(" %d");
              putchar(10);
              pxVar48 = pxVar43;
            }
            uVar70 = iVar6 + 1;
            pxVar43 = (xmlDocPtr)(ulong)uVar70;
            puVar58 = puVar58 + 1;
          } while (uVar70 != 4);
          iVar3 = iVar3 + 1;
        } while (iVar3 != 3);
        uVar69 = uVar69 + 1;
      } while (uVar69 != 4);
      iVar2 = iVar2 + 1;
    } while (iVar2 != 3);
    uVar63 = uVar63 + 1;
  } while (uVar63 != 4);
  function_tests = function_tests + 1;
  iVar55 = test_ret_28 + test_ret_2 + iVar55 + iVar8 + test_ret_4;
  test_ret_4 = 0;
  uVar63 = 0;
  do {
    uVar69 = 0;
    do {
      uVar70 = 0;
      do {
        iVar2 = 0;
        do {
          uVar73 = 0;
          do {
            puVar58 = &DAT_0015fd14;
            pxVar43 = (xmlDocPtr)0x0;
            do {
              iVar4 = (int)pxVar48;
              iVar3 = xmlMemBlocks();
              pxVar49 = gen_xmlDocPtr(uVar63,iVar4);
              pxVar41 = gen_xmlNodePtr(uVar69,iVar4);
              pxVar50 = gen_xmlDocPtr(uVar70,iVar4);
              pxVar48 = (xmlDocPtr)gen_xmlNodePtr(iVar2,iVar4);
              uVar54 = 0xffffffff;
              if (uVar73 < 4) {
                uVar54 = (&DAT_0015fd14)[uVar73];
              }
              xmlDOMWrapCloneNode(0,pxVar49,pxVar41,0,pxVar50,pxVar48,uVar54,*puVar58);
              call_tests = call_tests + 1;
              iVar4 = extraout_EDX_16;
              if (((pxVar49 != (xmlDocPtr)0x0) && (api_doc != pxVar49)) && (pxVar49->doc != api_doc)
                 ) {
                xmlFreeDoc(pxVar49);
                iVar4 = extraout_EDX_17;
              }
              des_xmlNodePtr(uVar69,pxVar41,iVar4);
              iVar4 = extraout_EDX_18;
              if (((pxVar50 != (xmlDocPtr)0x0) && (api_doc != pxVar50)) && (pxVar50->doc != api_doc)
                 ) {
                xmlFreeDoc(pxVar50);
                iVar4 = extraout_EDX_19;
              }
              des_xmlNodePtr(iVar2,(xmlNodePtr)pxVar48,iVar4);
              xmlResetLastError();
              iVar4 = xmlMemBlocks();
              iVar5 = (int)pxVar43;
              if (iVar3 != iVar4) {
                iVar4 = xmlMemBlocks();
                printf("Leak of %d blocks found in xmlDOMWrapCloneNode",(ulong)(uint)(iVar4 - iVar3)
                      );
                test_ret_4 = test_ret_4 + 1;
                printf(" %d",0);
                printf(" %d",(ulong)uVar63);
                printf(" %d",(ulong)uVar69);
                printf(" %d",0);
                printf(" %d",(ulong)uVar70);
                printf(" %d",iVar2);
                printf(" %d",(ulong)uVar73);
                printf(" %d");
                putchar(10);
                pxVar48 = pxVar43;
              }
              uVar65 = iVar5 + 1;
              pxVar43 = (xmlDocPtr)(ulong)uVar65;
              puVar58 = puVar58 + 1;
            } while (uVar65 != 4);
            uVar73 = uVar73 + 1;
          } while (uVar73 != 4);
          iVar2 = iVar2 + 1;
        } while (iVar2 != 3);
        uVar70 = uVar70 + 1;
      } while (uVar70 != 4);
      uVar69 = uVar69 + 1;
    } while (uVar69 != 3);
    uVar63 = uVar63 + 1;
  } while (uVar63 != 4);
  function_tests = function_tests + 1;
  iVar2 = 0;
  uVar63 = 0;
  do {
    puVar58 = &DAT_0015fd14;
    uVar69 = 0;
    do {
      iVar4 = (int)pxVar48;
      iVar3 = xmlMemBlocks();
      pxVar48 = (xmlDocPtr)gen_xmlNodePtr(uVar63,iVar4);
      xmlDOMWrapReconcileNamespaces(0,pxVar48,*puVar58);
      call_tests = call_tests + 1;
      des_xmlNodePtr(uVar63,(xmlNodePtr)pxVar48,nr_03);
      xmlResetLastError();
      iVar4 = xmlMemBlocks();
      if (iVar3 != iVar4) {
        iVar4 = xmlMemBlocks();
        printf("Leak of %d blocks found in xmlDOMWrapReconcileNamespaces",
               (ulong)(uint)(iVar4 - iVar3));
        iVar2 = iVar2 + 1;
        printf(" %d",0);
        printf(" %d",(ulong)uVar63);
        pxVar48 = (xmlDocPtr)(ulong)uVar69;
        printf(" %d");
        putchar(10);
      }
      uVar69 = uVar69 + 1;
      puVar58 = puVar58 + 1;
    } while (uVar69 != 4);
    uVar63 = uVar63 + 1;
  } while (uVar63 != 3);
  function_tests = function_tests + 1;
  iVar3 = 0;
  uVar63 = 0;
  do {
    uVar69 = 0;
    do {
      pxVar43 = (xmlDocPtr)0x0;
      puVar58 = &DAT_0015fd14;
      do {
        iVar4 = (int)pxVar48;
        iVar5 = xmlMemBlocks();
        pxVar49 = gen_xmlDocPtr(uVar63,iVar4);
        pxVar48 = (xmlDocPtr)gen_xmlNodePtr(uVar69,iVar4);
        xmlDOMWrapRemoveNode(0,pxVar49,pxVar48,*puVar58);
        call_tests = call_tests + 1;
        iVar4 = extraout_EDX_20;
        if (((pxVar49 != (xmlDocPtr)0x0) && (api_doc != pxVar49)) && (pxVar49->doc != api_doc)) {
          xmlFreeDoc(pxVar49);
          iVar4 = extraout_EDX_21;
        }
        des_xmlNodePtr(uVar69,(xmlNodePtr)pxVar48,iVar4);
        xmlResetLastError();
        iVar4 = xmlMemBlocks();
        iVar6 = (int)pxVar43;
        if (iVar5 != iVar4) {
          iVar4 = xmlMemBlocks();
          printf("Leak of %d blocks found in xmlDOMWrapRemoveNode",(ulong)(uint)(iVar4 - iVar5));
          iVar3 = iVar3 + 1;
          printf(" %d",0);
          printf(" %d",(ulong)uVar63);
          printf(" %d",(ulong)uVar69);
          printf(" %d");
          putchar(10);
          pxVar48 = pxVar43;
        }
        uVar70 = iVar6 + 1;
        pxVar43 = (xmlDocPtr)(ulong)uVar70;
        puVar58 = puVar58 + 1;
      } while (uVar70 != 4);
      uVar69 = uVar69 + 1;
    } while (uVar69 != 3);
    uVar63 = uVar63 + 1;
  } while (uVar63 != 4);
  function_tests = function_tests + 1;
  iVar4 = 0;
  uVar63 = 0;
  do {
    uVar69 = 0;
    do {
      pxVar43 = (xmlDocPtr)0x0;
      puVar58 = &DAT_0015fd14;
      do {
        iVar6 = (int)pxVar48;
        iVar5 = xmlMemBlocks();
        pxVar48 = (xmlDocPtr)gen_xmlNodePtr(uVar63,iVar6);
        pxVar49 = gen_xmlDocPtr(uVar69,iVar6);
        pxVar41 = (xmlNodePtr)xmlDocCopyNode(pxVar48,pxVar49,*puVar58);
        desret_xmlNodePtr(pxVar41);
        call_tests = call_tests + 1;
        des_xmlNodePtr(uVar63,(xmlNodePtr)pxVar48,nr_04);
        if (((pxVar49 != (xmlDocPtr)0x0) && (api_doc != pxVar49)) && (pxVar49->doc != api_doc)) {
          xmlFreeDoc(pxVar49);
        }
        xmlResetLastError();
        iVar6 = xmlMemBlocks();
        iVar7 = (int)pxVar43;
        if (iVar5 != iVar6) {
          iVar6 = xmlMemBlocks();
          printf("Leak of %d blocks found in xmlDocCopyNode",(ulong)(uint)(iVar6 - iVar5));
          iVar4 = iVar4 + 1;
          printf(" %d",(ulong)uVar63);
          printf(" %d",(ulong)uVar69);
          printf(" %d");
          putchar(10);
          pxVar48 = pxVar43;
        }
        uVar70 = iVar7 + 1;
        pxVar43 = (xmlDocPtr)(ulong)uVar70;
        puVar58 = puVar58 + 1;
      } while (uVar70 != 4);
      uVar69 = uVar69 + 1;
    } while (uVar69 != 4);
    uVar63 = uVar63 + 1;
  } while (uVar63 != 3);
  function_tests = function_tests + 1;
  test_ret_3 = 0;
  uVar63 = 0;
  do {
    pxVar43 = (xmlDocPtr)0x0;
    do {
      iVar5 = (int)pxVar48;
      iVar6 = xmlMemBlocks();
      pxVar49 = gen_xmlDocPtr(uVar63,iVar5);
      iVar7 = (int)pxVar43;
      pxVar48 = (xmlDocPtr)gen_xmlNodePtr(iVar7,iVar5);
      pxVar41 = (xmlNodePtr)xmlDocCopyNodeList(pxVar49,pxVar48);
      desret_xmlNodePtr(pxVar41);
      call_tests = call_tests + 1;
      iVar5 = extraout_EDX_22;
      if (((pxVar49 != (xmlDocPtr)0x0) && (api_doc != pxVar49)) && (pxVar49->doc != api_doc)) {
        xmlFreeDoc(pxVar49);
        iVar5 = extraout_EDX_23;
      }
      des_xmlNodePtr(iVar7,(xmlNodePtr)pxVar48,iVar5);
      xmlResetLastError();
      iVar5 = xmlMemBlocks();
      if (iVar6 != iVar5) {
        iVar5 = xmlMemBlocks();
        printf("Leak of %d blocks found in xmlDocCopyNodeList",(ulong)(uint)(iVar5 - iVar6));
        test_ret_3 = test_ret_3 + 1;
        printf(" %d",(ulong)uVar63);
        printf(" %d");
        putchar(10);
        pxVar48 = pxVar43;
      }
      pxVar43 = (xmlDocPtr)(ulong)(iVar7 + 1U);
    } while (iVar7 + 1U != 3);
    uVar63 = uVar63 + 1;
  } while (uVar63 != 4);
  function_tests = function_tests + 1;
  iVar5 = 0;
  _test_ret = (xmlDocPtr)0x0;
  bVar1 = true;
  do {
    bVar61 = bVar1;
    uVar63 = 0;
    do {
      iVar7 = (int)pxVar48;
      iVar6 = xmlMemBlocks();
      if (bVar61) {
        iVar7 = 0x152a53;
        pFVar52 = fopen64("test.out","a+");
      }
      else {
        pFVar52 = (FILE *)0x0;
      }
      pxVar43 = gen_xmlDocPtr(uVar63,iVar7);
      pxVar48 = pxVar43;
      xmlDocDump(pFVar52);
      call_tests = call_tests + 1;
      if (pFVar52 != (FILE *)0x0) {
        fclose(pFVar52);
      }
      if (((pxVar43 != (xmlDocPtr)0x0) && (api_doc != pxVar43)) && (pxVar43->doc != api_doc)) {
        xmlFreeDoc(pxVar43);
      }
      xmlResetLastError();
      iVar7 = xmlMemBlocks();
      if (iVar6 != iVar7) {
        iVar7 = xmlMemBlocks();
        printf("Leak of %d blocks found in xmlDocDump",(ulong)(uint)(iVar7 - iVar6));
        iVar5 = iVar5 + 1;
        printf(" %d",_test_ret);
        pxVar48 = (xmlDocPtr)(ulong)uVar63;
        printf(" %d");
        putchar(10);
      }
      uVar63 = uVar63 + 1;
    } while (uVar63 != 4);
    _test_ret = (xmlDocPtr)0x1;
    bVar1 = false;
  } while (bVar61);
  function_tests = function_tests + 1;
  iVar6 = 0;
  uVar63 = 0;
  do {
    _test_ret = (xmlDocPtr)0x0;
    bVar1 = true;
    do {
      bVar61 = bVar1;
      uVar47 = 0;
      if (bVar61) {
        uVar47 = 0x1658d8;
      }
      puVar58 = &DAT_0015fd14;
      uVar69 = 0;
      do {
        iVar8 = (int)pxVar48;
        iVar7 = xmlMemBlocks();
        pxVar43 = gen_xmlDocPtr(uVar63,iVar8);
        pxVar48 = (xmlDocPtr)0x0;
        xmlDocDumpFormatMemory(pxVar43,0,uVar47,*puVar58);
        call_tests = call_tests + 1;
        if (((pxVar43 != (xmlDocPtr)0x0) && (api_doc != pxVar43)) && (pxVar43->doc != api_doc)) {
          xmlFreeDoc(pxVar43);
        }
        xmlResetLastError();
        iVar8 = xmlMemBlocks();
        if (iVar7 != iVar8) {
          iVar8 = xmlMemBlocks();
          printf("Leak of %d blocks found in xmlDocDumpFormatMemory",(ulong)(uint)(iVar8 - iVar7));
          iVar6 = iVar6 + 1;
          printf(" %d",(ulong)uVar63);
          printf(" %d",0);
          printf(" %d",_test_ret);
          pxVar48 = (xmlDocPtr)(ulong)uVar69;
          printf(" %d");
          putchar(10);
        }
        uVar69 = uVar69 + 1;
        puVar58 = puVar58 + 1;
      } while (uVar69 != 4);
      _test_ret = (xmlDocPtr)0x1;
      bVar1 = false;
    } while (bVar61);
    uVar63 = uVar63 + 1;
  } while (uVar63 != 4);
  function_tests = function_tests + 1;
  iVar7 = 0;
  uVar63 = 0;
  do {
    _test_ret_2 = 0;
    bVar1 = true;
    do {
      bVar61 = bVar1;
      uVar66 = 0;
      uVar47 = 0;
      if (bVar61) {
        uVar47 = 0x1658d8;
      }
      do {
        puVar58 = &DAT_0015fd14;
        pxVar43 = (xmlDocPtr)0x0;
        do {
          iVar9 = (int)pxVar48;
          iVar8 = xmlMemBlocks();
          pxVar49 = gen_xmlDocPtr(uVar63,iVar9);
          if ((uint)uVar66 < 3) {
            uVar57 = (&DAT_00162d50)[uVar66];
          }
          else {
            uVar57 = 0;
          }
          pxVar48 = (xmlDocPtr)0x0;
          xmlDocDumpFormatMemoryEnc(pxVar49,0,uVar47,uVar57,*puVar58);
          call_tests = call_tests + 1;
          if (((pxVar49 != (xmlDocPtr)0x0) && (api_doc != pxVar49)) && (pxVar49->doc != api_doc)) {
            xmlFreeDoc(pxVar49);
          }
          xmlResetLastError();
          iVar9 = xmlMemBlocks();
          iVar10 = (int)pxVar43;
          if (iVar8 != iVar9) {
            iVar9 = xmlMemBlocks();
            printf("Leak of %d blocks found in xmlDocDumpFormatMemoryEnc",
                   (ulong)(uint)(iVar9 - iVar8));
            iVar7 = iVar7 + 1;
            printf(" %d",(ulong)uVar63);
            printf(" %d",0);
            printf(" %d",_test_ret_2);
            printf(" %d",uVar66);
            printf(" %d");
            putchar(10);
            pxVar48 = pxVar43;
          }
          uVar69 = iVar10 + 1;
          pxVar43 = (xmlDocPtr)(ulong)uVar69;
          puVar58 = puVar58 + 1;
        } while (uVar69 != 4);
        uVar69 = (uint)uVar66 + 1;
        uVar66 = (ulong)uVar69;
      } while (uVar69 != 4);
      _test_ret_2 = 1;
      bVar1 = false;
    } while (bVar61);
    uVar63 = uVar63 + 1;
  } while (uVar63 != 4);
  function_tests = function_tests + 1;
  test_ret_1 = 0;
  uVar63 = 0;
  do {
    pxVar43 = (xmlDocPtr)0x0;
    bVar1 = true;
    do {
      bVar61 = bVar1;
      iVar9 = (int)pxVar48;
      iVar8 = xmlMemBlocks();
      pxVar49 = gen_xmlDocPtr(uVar63,iVar9);
      uVar47 = 0;
      if (bVar61) {
        uVar47 = 0x1658d8;
      }
      pxVar48 = (xmlDocPtr)0x0;
      xmlDocDumpMemory(pxVar49,0,uVar47);
      call_tests = call_tests + 1;
      if (((pxVar49 != (xmlDocPtr)0x0) && (api_doc != pxVar49)) && (pxVar49->doc != api_doc)) {
        xmlFreeDoc(pxVar49);
      }
      xmlResetLastError();
      iVar9 = xmlMemBlocks();
      if (iVar8 != iVar9) {
        iVar9 = xmlMemBlocks();
        printf("Leak of %d blocks found in xmlDocDumpMemory",(ulong)(uint)(iVar9 - iVar8));
        test_ret_1 = test_ret_1 + 1;
        printf(" %d",(ulong)uVar63);
        printf(" %d",0);
        printf(" %d");
        putchar(10);
        pxVar48 = pxVar43;
      }
      pxVar43 = (xmlDocPtr)0x1;
      bVar1 = false;
    } while (bVar61);
    uVar63 = uVar63 + 1;
  } while (uVar63 != 4);
  function_tests = function_tests + 1;
  iVar8 = 0;
  uVar66 = 0;
  do {
    _test_ret = (xmlDocPtr)0x0;
    bVar1 = true;
    do {
      bVar61 = bVar1;
      pxVar43 = (xmlDocPtr)0x0;
      uVar47 = 0;
      if (bVar61) {
        uVar47 = 0x1658d8;
      }
      puVar77 = &DAT_00162d50;
      do {
        iVar10 = (int)pxVar48;
        iVar9 = xmlMemBlocks();
        pxVar49 = gen_xmlDocPtr((int)uVar66,iVar10);
        uVar63 = (uint)pxVar43;
        if (uVar63 < 3) {
          uVar57 = *puVar77;
        }
        else {
          uVar57 = 0;
        }
        pxVar48 = (xmlDocPtr)0x0;
        xmlDocDumpMemoryEnc(pxVar49,0,uVar47,uVar57);
        call_tests = call_tests + 1;
        if (((pxVar49 != (xmlDocPtr)0x0) && (api_doc != pxVar49)) && (pxVar49->doc != api_doc)) {
          xmlFreeDoc(pxVar49);
        }
        xmlResetLastError();
        iVar10 = xmlMemBlocks();
        if (iVar9 != iVar10) {
          iVar10 = xmlMemBlocks();
          printf("Leak of %d blocks found in xmlDocDumpMemoryEnc",(ulong)(uint)(iVar10 - iVar9));
          iVar8 = iVar8 + 1;
          printf(" %d",uVar66);
          printf(" %d",0);
          printf(" %d",_test_ret);
          printf(" %d");
          putchar(10);
          pxVar48 = pxVar43;
        }
        uVar63 = uVar63 + 1;
        pxVar43 = (xmlDocPtr)(ulong)uVar63;
        puVar77 = puVar77 + 1;
      } while (uVar63 != 4);
      _test_ret = (xmlDocPtr)0x1;
      bVar1 = false;
    } while (bVar61);
    uVar63 = (int)uVar66 + 1;
    uVar66 = (ulong)uVar63;
  } while (uVar63 != 4);
  function_tests = function_tests + 1;
  iVar8 = test_ret_1 + iVar8;
  iVar9 = 0;
  _test_ret_2 = 0;
  bVar1 = true;
  do {
    bVar61 = bVar1;
    uVar63 = 0;
    do {
      pxVar43 = (xmlDocPtr)0x0;
      puVar58 = &DAT_0015fd14;
      do {
        iVar11 = (int)pxVar48;
        iVar10 = xmlMemBlocks();
        if (bVar61) {
          iVar11 = 0x152a53;
          pFVar52 = fopen64("test.out","a+");
        }
        else {
          pFVar52 = (FILE *)0x0;
        }
        pxVar49 = gen_xmlDocPtr(uVar63,iVar11);
        pxVar48 = pxVar49;
        xmlDocFormatDump(pFVar52,pxVar49,*puVar58);
        call_tests = call_tests + 1;
        if (pFVar52 != (FILE *)0x0) {
          fclose(pFVar52);
        }
        if (((pxVar49 != (xmlDocPtr)0x0) && (api_doc != pxVar49)) && (pxVar49->doc != api_doc)) {
          xmlFreeDoc(pxVar49);
        }
        xmlResetLastError();
        iVar11 = xmlMemBlocks();
        iVar40 = (int)pxVar43;
        if (iVar10 != iVar11) {
          iVar11 = xmlMemBlocks();
          printf("Leak of %d blocks found in xmlDocFormatDump",(ulong)(uint)(iVar11 - iVar10));
          iVar9 = iVar9 + 1;
          printf(" %d",_test_ret_2);
          printf(" %d",(ulong)uVar63);
          printf(" %d");
          putchar(10);
          pxVar48 = pxVar43;
        }
        uVar69 = iVar40 + 1;
        pxVar43 = (xmlDocPtr)(ulong)uVar69;
        puVar58 = puVar58 + 1;
      } while (uVar69 != 4);
      uVar63 = uVar63 + 1;
    } while (uVar63 != 4);
    _test_ret_2 = 1;
    bVar1 = false;
  } while (bVar61);
  function_tests = function_tests + 1;
  iVar10 = xmlMemBlocks();
  pxVar41 = (xmlNodePtr)xmlDocGetRootElement(0);
  desret_xmlNodePtr(pxVar41);
  call_tests = call_tests + 1;
  xmlResetLastError();
  iVar11 = xmlMemBlocks();
  if (iVar10 != iVar11) {
    xmlMemBlocks();
    printf("Leak of %d blocks found in xmlDocGetRootElement");
    pxVar48 = (xmlDocPtr)0x0;
    printf(" %d");
    putchar(10);
  }
  function_tests = function_tests + 1;
  uVar63 = 0;
  iVar40 = 0;
  do {
    pxVar43 = (xmlDocPtr)0x0;
    do {
      iVar12 = (int)pxVar48;
      iVar64 = xmlMemBlocks();
      pxVar49 = gen_xmlDocPtr(uVar63,iVar12);
      iVar12 = (int)pxVar43;
      if (iVar12 == 0) {
        pxVar50 = (xmlDocPtr)xmlNewPI("test",0);
      }
      else {
        pxVar50 = (xmlDocPtr)0x0;
      }
      pxVar48 = pxVar50;
      pxVar41 = (xmlNodePtr)xmlDocSetRootElement(pxVar49);
      if (pxVar49 == (xmlDocPtr)0x0) {
        xmlFreeNode(pxVar50);
        desret_xmlNodePtr(pxVar41);
        call_tests = call_tests + 1;
      }
      else {
        desret_xmlNodePtr(pxVar41);
        call_tests = call_tests + 1;
        if ((api_doc != pxVar49) && (pxVar49->doc != api_doc)) {
          xmlFreeDoc(pxVar49);
        }
      }
      xmlResetLastError();
      iVar13 = xmlMemBlocks();
      if (iVar64 != iVar13) {
        iVar13 = xmlMemBlocks();
        printf("Leak of %d blocks found in xmlDocSetRootElement",(ulong)(uint)(iVar13 - iVar64));
        iVar40 = iVar40 + 1;
        printf(" %d",(ulong)uVar63);
        printf(" %d");
        putchar(10);
        pxVar48 = pxVar43;
      }
      uVar69 = iVar12 + 1;
      pxVar43 = (xmlDocPtr)(ulong)uVar69;
    } while (uVar69 != 3);
    uVar63 = uVar63 + 1;
  } while (uVar63 != 4);
  function_tests = function_tests + 1;
  iVar64 = 0;
  _test_ret_2 = 0;
  bVar1 = true;
  do {
    bVar61 = bVar1;
    uVar63 = 0;
    do {
      pxVar43 = (xmlDocPtr)0x0;
      do {
        iVar13 = (int)pxVar48;
        iVar12 = xmlMemBlocks();
        if (bVar61) {
          iVar13 = 0x152a53;
          pFVar52 = fopen64("test.out","a+");
        }
        else {
          pFVar52 = (FILE *)0x0;
        }
        pxVar49 = gen_xmlDocPtr(uVar63,iVar13);
        iVar14 = (int)pxVar43;
        pxVar48 = (xmlDocPtr)gen_xmlNodePtr(iVar14,iVar13);
        xmlElemDump(pFVar52,pxVar49,pxVar48);
        call_tests = call_tests + 1;
        iVar13 = extraout_EDX_24;
        if (pFVar52 != (FILE *)0x0) {
          fclose(pFVar52);
          iVar13 = extraout_EDX_25;
        }
        if (((pxVar49 != (xmlDocPtr)0x0) && (api_doc != pxVar49)) && (pxVar49->doc != api_doc)) {
          xmlFreeDoc(pxVar49);
          iVar13 = extraout_EDX_26;
        }
        des_xmlNodePtr(iVar14,(xmlNodePtr)pxVar48,iVar13);
        xmlResetLastError();
        iVar13 = xmlMemBlocks();
        if (iVar12 != iVar13) {
          iVar13 = xmlMemBlocks();
          printf("Leak of %d blocks found in xmlElemDump",(ulong)(uint)(iVar13 - iVar12));
          iVar64 = iVar64 + 1;
          printf(" %d",_test_ret_2);
          printf(" %d",(ulong)uVar63);
          printf(" %d");
          putchar(10);
          pxVar48 = pxVar43;
        }
        pxVar43 = (xmlDocPtr)(ulong)(iVar14 + 1U);
      } while (iVar14 + 1U != 3);
      uVar63 = uVar63 + 1;
    } while (uVar63 != 4);
    _test_ret_2 = 1;
    bVar1 = false;
  } while (bVar61);
  function_tests = function_tests + 1;
  uVar63 = 0;
  iVar12 = 0;
  do {
    iVar14 = (int)pxVar48;
    iVar13 = xmlMemBlocks();
    pxVar48 = (xmlDocPtr)gen_xmlNodePtr(uVar63,iVar14);
    pxVar41 = (xmlNodePtr)xmlFirstElementChild(pxVar48);
    desret_xmlNodePtr(pxVar41);
    call_tests = call_tests + 1;
    des_xmlNodePtr(uVar63,(xmlNodePtr)pxVar48,nr_05);
    xmlResetLastError();
    iVar14 = xmlMemBlocks();
    if (iVar13 != iVar14) {
      iVar14 = xmlMemBlocks();
      printf("Leak of %d blocks found in xmlFirstElementChild",(ulong)(uint)(iVar14 - iVar13));
      iVar12 = iVar12 + 1;
      pxVar48 = (xmlDocPtr)(ulong)uVar63;
      printf(" %d");
      putchar(10);
    }
    uVar63 = uVar63 + 1;
  } while (uVar63 != 3);
  function_tests = function_tests + 1;
  iVar13 = xmlMemBlocks();
  xmlGetBufferAllocationScheme();
  call_tests = call_tests + 1;
  xmlResetLastError();
  iVar14 = xmlMemBlocks();
  if (iVar13 != iVar14) {
    xmlMemBlocks();
    printf("Leak of %d blocks found in xmlGetBufferAllocationScheme");
    putchar(10);
  }
  function_tests = function_tests + 1;
  iVar15 = xmlMemBlocks();
  xmlGetCompressMode();
  call_tests = call_tests + 1;
  xmlResetLastError();
  iVar16 = xmlMemBlocks();
  if (iVar15 != iVar16) {
    xmlMemBlocks();
    printf("Leak of %d blocks found in xmlGetCompressMode");
    putchar(10);
  }
  function_tests = function_tests + 1;
  iVar17 = xmlMemBlocks();
  xmlGetDocCompressMode(0);
  call_tests = call_tests + 1;
  xmlResetLastError();
  iVar18 = xmlMemBlocks();
  if (iVar17 != iVar18) {
    xmlMemBlocks();
    printf("Leak of %d blocks found in xmlGetDocCompressMode");
    printf(" %d");
    putchar(10);
  }
  function_tests = function_tests + 1;
  iVar19 = xmlMemBlocks();
  pxVar41 = (xmlNodePtr)xmlGetIntSubset(0);
  desret_xmlNodePtr(pxVar41);
  call_tests = call_tests + 1;
  xmlResetLastError();
  iVar20 = xmlMemBlocks();
  if (iVar19 != iVar20) {
    xmlMemBlocks();
    printf("Leak of %d blocks found in xmlGetIntSubset");
    printf(" %d");
    putchar(10);
  }
  function_tests = function_tests + 1;
  iVar21 = xmlMemBlocks();
  pxVar41 = (xmlNodePtr)xmlGetLastChild(0);
  desret_xmlNodePtr(pxVar41);
  call_tests = call_tests + 1;
  xmlResetLastError();
  iVar22 = xmlMemBlocks();
  if (iVar21 != iVar22) {
    xmlMemBlocks();
    printf("Leak of %d blocks found in xmlGetLastChild");
    printf(" %d");
    putchar(10);
  }
  function_tests = function_tests + 1;
  iVar23 = xmlMemBlocks();
  xmlGetLineNo(0);
  call_tests = call_tests + 1;
  xmlResetLastError();
  iVar24 = xmlMemBlocks();
  if (iVar23 != iVar24) {
    xmlMemBlocks();
    printf("Leak of %d blocks found in xmlGetLineNo");
    printf(" %d");
    putchar(10);
  }
  function_tests = function_tests + 1;
  iVar25 = 0;
  iVar74 = 0;
  do {
    iVar26 = xmlMemBlocks();
    lVar45 = xmlGetNoNsProp(0);
    if (lVar45 != 0) {
      (*_xmlFree)();
    }
    call_tests = call_tests + 1;
    xmlResetLastError();
    iVar27 = xmlMemBlocks();
    if (iVar26 != iVar27) {
      iVar27 = xmlMemBlocks();
      printf("Leak of %d blocks found in xmlGetNoNsProp",(ulong)(uint)(iVar27 - iVar26));
      iVar74 = iVar74 + 1;
      printf(" %d",0);
      printf(" %d");
      putchar(10);
    }
    iVar25 = iVar25 + 1;
  } while (iVar25 != 5);
  function_tests = function_tests + 1;
  iVar25 = xmlMemBlocks();
  lVar45 = xmlGetNodePath(0);
  if (lVar45 != 0) {
    (*_xmlFree)(lVar45);
  }
  call_tests = call_tests + 1;
  xmlResetLastError();
  iVar26 = xmlMemBlocks();
  if (iVar25 != iVar26) {
    xmlMemBlocks();
    printf("Leak of %d blocks found in xmlGetNodePath");
    printf(" %d");
    putchar(10);
  }
  function_tests = function_tests + 1;
  iVar27 = 0;
  uVar63 = 0;
  do {
    puVar77 = &DAT_00162d68;
    uVar69 = 0;
    do {
      iVar28 = xmlMemBlocks();
      if (uVar63 < 4) {
        uVar47 = (&DAT_00162d68)[uVar63];
      }
      else {
        uVar47 = 0;
      }
      if (uVar69 < 4) {
        uVar57 = *puVar77;
      }
      else {
        uVar57 = 0;
      }
      lVar45 = xmlGetNsProp(0,uVar47,uVar57);
      if (lVar45 != 0) {
        (*_xmlFree)();
      }
      call_tests = call_tests + 1;
      xmlResetLastError();
      iVar29 = xmlMemBlocks();
      if (iVar28 != iVar29) {
        iVar29 = xmlMemBlocks();
        printf("Leak of %d blocks found in xmlGetNsProp",(ulong)(uint)(iVar29 - iVar28));
        iVar27 = iVar27 + 1;
        printf(" %d",0);
        printf(" %d",(ulong)uVar63);
        printf(" %d");
        putchar(10);
      }
      uVar69 = uVar69 + 1;
      puVar77 = puVar77 + 1;
    } while (uVar69 != 5);
    uVar63 = uVar63 + 1;
  } while (uVar63 != 5);
  function_tests = function_tests + 1;
  iVar29 = 0;
  iVar28 = 0;
  do {
    iVar30 = xmlMemBlocks();
    lVar45 = xmlGetProp(0);
    if (lVar45 != 0) {
      (*_xmlFree)();
    }
    call_tests = call_tests + 1;
    xmlResetLastError();
    iVar31 = xmlMemBlocks();
    if (iVar30 != iVar31) {
      iVar31 = xmlMemBlocks();
      printf("Leak of %d blocks found in xmlGetProp",(ulong)(uint)(iVar31 - iVar30));
      iVar28 = iVar28 + 1;
      printf(" %d",0);
      printf(" %d");
      putchar(10);
    }
    iVar29 = iVar29 + 1;
  } while (iVar29 != 5);
  function_tests = function_tests + 1;
  iVar29 = 0;
  uVar63 = 0;
  do {
    puVar77 = &DAT_00162d68;
    uVar69 = 0;
    do {
      iVar30 = xmlMemBlocks();
      if (uVar63 < 4) {
        uVar47 = (&DAT_00162d68)[uVar63];
      }
      else {
        uVar47 = 0;
      }
      if (uVar69 < 4) {
        uVar57 = *puVar77;
      }
      else {
        uVar57 = 0;
      }
      lVar45 = xmlHasNsProp(0,uVar47,uVar57);
      if (lVar45 != 0) {
        xmlUnlinkNode(lVar45);
        xmlFreeNode();
      }
      call_tests = call_tests + 1;
      xmlResetLastError();
      iVar31 = xmlMemBlocks();
      if (iVar30 != iVar31) {
        iVar31 = xmlMemBlocks();
        printf("Leak of %d blocks found in xmlHasNsProp",(ulong)(uint)(iVar31 - iVar30));
        iVar29 = iVar29 + 1;
        printf(" %d",0);
        printf(" %d",(ulong)uVar63);
        printf(" %d");
        putchar(10);
      }
      uVar69 = uVar69 + 1;
      puVar77 = puVar77 + 1;
    } while (uVar69 != 5);
    uVar63 = uVar63 + 1;
  } while (uVar63 != 5);
  function_tests = function_tests + 1;
  iVar30 = 0;
  iVar31 = 0;
  do {
    iVar32 = xmlMemBlocks();
    lVar45 = xmlHasProp(0);
    if (lVar45 != 0) {
      xmlUnlinkNode(lVar45);
      xmlFreeNode();
    }
    call_tests = call_tests + 1;
    xmlResetLastError();
    iVar33 = xmlMemBlocks();
    if (iVar32 != iVar33) {
      iVar33 = xmlMemBlocks();
      printf("Leak of %d blocks found in xmlHasProp",(ulong)(uint)(iVar33 - iVar32));
      iVar31 = iVar31 + 1;
      printf(" %d",0);
      printf(" %d");
      putchar(10);
    }
    iVar30 = iVar30 + 1;
  } while (iVar30 != 5);
  function_tests = function_tests + 1;
  iVar30 = xmlMemBlocks();
  xmlIsBlankNode(0);
  call_tests = call_tests + 1;
  xmlResetLastError();
  iVar32 = xmlMemBlocks();
  if (iVar30 != iVar32) {
    xmlMemBlocks();
    printf("Leak of %d blocks found in xmlIsBlankNode");
    printf(" %d");
    putchar(10);
  }
  function_tests = function_tests + 1;
  iVar33 = 0;
  uVar63 = 0;
  do {
    pxVar41 = (xmlNodePtr)0x0;
    puVar77 = &DAT_00162d68;
    do {
      iVar34 = xmlMemBlocks();
      if (uVar63 < 4) {
        uVar47 = (&DAT_00162d68)[uVar63];
      }
      else {
        uVar47 = 0;
      }
      uVar69 = (uint)pxVar41;
      if (uVar69 < 4) {
        pxVar51 = (xmlNodePtr)*puVar77;
      }
      else {
        pxVar51 = (xmlNodePtr)0x0;
      }
      xmlIsXHTML(uVar47);
      call_tests = call_tests + 1;
      xmlResetLastError();
      iVar35 = xmlMemBlocks();
      if (iVar34 != iVar35) {
        iVar35 = xmlMemBlocks();
        printf("Leak of %d blocks found in xmlIsXHTML",(ulong)(uint)(iVar35 - iVar34));
        iVar33 = iVar33 + 1;
        printf(" %d",(ulong)uVar63);
        printf(" %d");
        putchar(10);
        pxVar51 = pxVar41;
      }
      uVar69 = uVar69 + 1;
      pxVar41 = (xmlNodePtr)(ulong)uVar69;
      puVar77 = puVar77 + 1;
    } while (uVar69 != 5);
    uVar63 = uVar63 + 1;
  } while (uVar63 != 5);
  function_tests = function_tests + 1;
  uVar63 = 0;
  iVar34 = 0;
  do {
    iVar36 = (int)pxVar51;
    iVar35 = xmlMemBlocks();
    pxVar51 = gen_xmlNodePtr(uVar63,iVar36);
    pxVar41 = (xmlNodePtr)xmlLastElementChild(pxVar51);
    desret_xmlNodePtr(pxVar41);
    call_tests = call_tests + 1;
    des_xmlNodePtr(uVar63,pxVar51,nr_06);
    xmlResetLastError();
    iVar36 = xmlMemBlocks();
    if (iVar35 != iVar36) {
      iVar36 = xmlMemBlocks();
      printf("Leak of %d blocks found in xmlLastElementChild",(ulong)(uint)(iVar36 - iVar35));
      iVar34 = iVar34 + 1;
      pxVar51 = (xmlNodePtr)(ulong)uVar63;
      printf(" %d");
      putchar(10);
    }
    uVar63 = uVar63 + 1;
  } while (uVar63 != 3);
  function_tests = function_tests + 1;
  iVar35 = 0;
  uVar63 = 0;
  do {
    iVar36 = 0;
    do {
      pxVar41 = (xmlNodePtr)0x0;
      piVar78 = &DAT_0015fd14;
      do {
        iVar37 = xmlMemBlocks();
        pxVar48 = gen_xmlDocPtr(uVar63,(int)pxVar51);
        switch(iVar36) {
        case 0:
          bVar1 = false;
          pcVar75 = "foo";
          break;
        case 1:
          bVar1 = false;
          pcVar75 = "<foo/>";
          break;
        case 2:
          bVar1 = false;
          pcVar75 = anon_var_dwarf_1b5;
          break;
        case 3:
          bVar1 = false;
          pcVar75 = " 2ab ";
          break;
        default:
          bVar1 = true;
          pcVar75 = (char *)0x0;
        }
        iVar38 = *piVar78;
        iVar39 = (int)pxVar41;
        if ((bVar1) || (sVar46 = strlen(pcVar75), iVar38 <= (int)sVar46 + 1)) {
          pxVar51 = (xmlNodePtr)xmlNewCDataBlock(pxVar48,pcVar75,iVar38);
          desret_xmlNodePtr(pxVar51);
          call_tests = call_tests + 1;
          if ((pxVar48 != (xmlDocPtr)0x0) && ((api_doc != pxVar48 && (pxVar48->doc != api_doc)))) {
            xmlFreeDoc(pxVar48);
          }
          xmlResetLastError();
          iVar38 = xmlMemBlocks();
          pxVar51 = (xmlNodePtr)pcVar75;
          if (iVar37 != iVar38) {
            iVar38 = xmlMemBlocks();
            printf("Leak of %d blocks found in xmlNewCDataBlock",(ulong)(uint)(iVar38 - iVar37));
            iVar35 = iVar35 + 1;
            printf(" %d",(ulong)uVar63);
            printf(" %d",iVar36);
            printf(" %d");
            putchar(10);
            pxVar51 = pxVar41;
          }
        }
        uVar69 = iVar39 + 1;
        pxVar41 = (xmlNodePtr)(ulong)uVar69;
        piVar78 = piVar78 + 1;
      } while (uVar69 != 4);
      iVar36 = iVar36 + 1;
    } while (iVar36 != 5);
    uVar63 = uVar63 + 1;
  } while (uVar63 != 4);
  function_tests = function_tests + 1;
  test_ret_1 = 0;
  uVar63 = 0;
  do {
    puVar77 = &DAT_00162d68;
    pxVar41 = (xmlNodePtr)0x0;
    do {
      iVar37 = (int)pxVar51;
      iVar36 = xmlMemBlocks();
      pxVar48 = gen_xmlDocPtr(uVar63,iVar37);
      uVar69 = (uint)pxVar41;
      if (uVar69 < 4) {
        pxVar51 = (xmlNodePtr)*puVar77;
      }
      else {
        pxVar51 = (xmlNodePtr)0x0;
      }
      pxVar53 = (xmlNodePtr)xmlNewCharRef(pxVar48);
      desret_xmlNodePtr(pxVar53);
      call_tests = call_tests + 1;
      if (((pxVar48 != (xmlDocPtr)0x0) && (api_doc != pxVar48)) && (pxVar48->doc != api_doc)) {
        xmlFreeDoc(pxVar48);
      }
      xmlResetLastError();
      iVar37 = xmlMemBlocks();
      if (iVar36 != iVar37) {
        iVar37 = xmlMemBlocks();
        printf("Leak of %d blocks found in xmlNewCharRef",(ulong)(uint)(iVar37 - iVar36));
        test_ret_1 = test_ret_1 + 1;
        printf(" %d",(ulong)uVar63);
        printf(" %d");
        putchar(10);
        pxVar51 = pxVar41;
      }
      uVar69 = uVar69 + 1;
      pxVar41 = (xmlNodePtr)(ulong)uVar69;
      puVar77 = puVar77 + 1;
    } while (uVar69 != 5);
    uVar63 = uVar63 + 1;
  } while (uVar63 != 4);
  function_tests = function_tests + 1;
  iVar36 = 0;
  uVar63 = 0;
  do {
    _test_ret_2 = 0;
    bVar1 = true;
    do {
      bVar61 = bVar1;
      uVar66 = 0;
      do {
        puVar77 = &DAT_00162d68;
        pxVar41 = (xmlNodePtr)0x0;
        do {
          iVar38 = (int)pxVar51;
          iVar37 = xmlMemBlocks();
          pxVar51 = gen_xmlNodePtr(uVar63,iVar38);
          if (bVar61) {
            get_api_root();
            pxVar59 = api_ns;
            if (api_root != (xmlNodePtr)0x0) {
              api_ns = api_root->nsDef;
              pxVar59 = api_ns;
            }
          }
          else {
            pxVar59 = (xmlNs *)0x0;
          }
          if ((uint)uVar66 < 4) {
            uVar47 = (&DAT_00162d68)[uVar66];
          }
          else {
            uVar47 = 0;
          }
          uVar69 = (uint)pxVar41;
          if (uVar69 < 4) {
            uVar57 = *puVar77;
          }
          else {
            uVar57 = 0;
          }
          pxVar53 = (xmlNodePtr)xmlNewChild(pxVar51,pxVar59,uVar47,uVar57);
          desret_xmlNodePtr(pxVar53);
          call_tests = call_tests + 1;
          des_xmlNodePtr(uVar63,pxVar51,nr_07);
          if (bVar61) {
            xmlFreeDoc(api_doc);
            api_doc = (xmlDocPtr)0x0;
            api_dtd = (xmlDtdPtr)0x0;
            api_root = (xmlNodePtr)0x0;
            api_ns = (xmlNsPtr)0x0;
          }
          xmlResetLastError();
          iVar38 = xmlMemBlocks();
          if (iVar37 != iVar38) {
            iVar38 = xmlMemBlocks();
            printf("Leak of %d blocks found in xmlNewChild",(ulong)(uint)(iVar38 - iVar37));
            iVar36 = iVar36 + 1;
            printf(" %d",(ulong)uVar63);
            printf(" %d",_test_ret_2);
            printf(" %d",uVar66);
            printf(" %d");
            putchar(10);
            pxVar51 = pxVar41;
          }
          uVar69 = uVar69 + 1;
          pxVar41 = (xmlNodePtr)(ulong)uVar69;
          puVar77 = puVar77 + 1;
        } while (uVar69 != 5);
        uVar69 = (uint)uVar66 + 1;
        uVar66 = (ulong)uVar69;
      } while (uVar69 != 5);
      _test_ret_2 = 1;
      bVar1 = false;
    } while (bVar61);
    uVar63 = uVar63 + 1;
  } while (uVar63 != 3);
  function_tests = function_tests + 1;
  puVar77 = &DAT_00162d68;
  uVar63 = 0;
  iVar37 = 0;
  do {
    iVar38 = xmlMemBlocks();
    if (uVar63 < 4) {
      uVar47 = *puVar77;
    }
    else {
      uVar47 = 0;
    }
    pxVar41 = (xmlNodePtr)xmlNewComment(uVar47);
    desret_xmlNodePtr(pxVar41);
    call_tests = call_tests + 1;
    xmlResetLastError();
    iVar39 = xmlMemBlocks();
    if (iVar38 != iVar39) {
      iVar39 = xmlMemBlocks();
      printf("Leak of %d blocks found in xmlNewComment",(ulong)(uint)(iVar39 - iVar38));
      iVar37 = iVar37 + 1;
      pxVar51 = (xmlNodePtr)(ulong)uVar63;
      printf(" %d");
      putchar(10);
    }
    uVar63 = uVar63 + 1;
    puVar77 = puVar77 + 1;
  } while (uVar63 != 5);
  iVar55 = iVar33 + iVar34 +
           iVar8 + test_ret_3 + iVar5 + iVar55 + test_ret_4 + iVar2 + iVar3 + iVar4 + iVar6 + iVar7
           + iVar9 + (uint)(iVar10 != iVar11) + iVar40 + iVar64 + iVar12 + (uint)(iVar13 != iVar14)
           + (uint)(iVar15 != iVar16) + (uint)(iVar17 != iVar18) + (uint)(iVar19 != iVar20) +
           (uint)(iVar21 != iVar22) + (uint)(iVar23 != iVar24) + iVar74 + (uint)(iVar25 != iVar26) +
           iVar27 + iVar28 + iVar29 + iVar31 + (uint)(iVar30 != iVar32) + iVar35 + test_ret_1;
  function_tests = function_tests + 1;
  puVar77 = &DAT_00162d68;
  uVar63 = 0;
  iVar2 = 0;
  do {
    iVar3 = xmlMemBlocks();
    if (uVar63 < 4) {
      uVar47 = *puVar77;
    }
    else {
      uVar47 = 0;
    }
    pxVar48 = (xmlDocPtr)xmlNewDoc(uVar47);
    if (api_doc != pxVar48) {
      xmlFreeDoc();
    }
    call_tests = call_tests + 1;
    xmlResetLastError();
    iVar4 = xmlMemBlocks();
    if (iVar3 != iVar4) {
      iVar4 = xmlMemBlocks();
      printf("Leak of %d blocks found in xmlNewDoc",(ulong)(uint)(iVar4 - iVar3));
      iVar2 = iVar2 + 1;
      pxVar51 = (xmlNodePtr)(ulong)uVar63;
      printf(" %d");
      putchar(10);
    }
    uVar63 = uVar63 + 1;
    puVar77 = puVar77 + 1;
  } while (uVar63 != 5);
  function_tests = function_tests + 1;
  iVar3 = 0;
  uVar63 = 0;
  do {
    puVar77 = &DAT_00162d68;
    pxVar41 = (xmlNodePtr)0x0;
    do {
      iVar5 = (int)pxVar51;
      iVar4 = xmlMemBlocks();
      pxVar48 = gen_xmlDocPtr(uVar63,iVar5);
      uVar69 = (uint)pxVar41;
      if (uVar69 < 4) {
        pxVar51 = (xmlNodePtr)*puVar77;
      }
      else {
        pxVar51 = (xmlNodePtr)0x0;
      }
      pxVar53 = (xmlNodePtr)xmlNewDocComment(pxVar48);
      desret_xmlNodePtr(pxVar53);
      call_tests = call_tests + 1;
      if (((pxVar48 != (xmlDocPtr)0x0) && (api_doc != pxVar48)) && (pxVar48->doc != api_doc)) {
        xmlFreeDoc(pxVar48);
      }
      xmlResetLastError();
      iVar5 = xmlMemBlocks();
      if (iVar4 != iVar5) {
        iVar5 = xmlMemBlocks();
        printf("Leak of %d blocks found in xmlNewDocComment",(ulong)(uint)(iVar5 - iVar4));
        iVar3 = iVar3 + 1;
        printf(" %d",(ulong)uVar63);
        printf(" %d");
        putchar(10);
        pxVar51 = pxVar41;
      }
      uVar69 = uVar69 + 1;
      pxVar41 = (xmlNodePtr)(ulong)uVar69;
      puVar77 = puVar77 + 1;
    } while (uVar69 != 5);
    uVar63 = uVar63 + 1;
  } while (uVar63 != 4);
  function_tests = function_tests + 1;
  uVar63 = 0;
  test_ret_4 = 0;
  do {
    iVar4 = xmlMemBlocks();
    pxVar48 = gen_xmlDocPtr(uVar63,(int)pxVar51);
    pxVar41 = (xmlNodePtr)xmlNewDocFragment(pxVar48);
    desret_xmlNodePtr(pxVar41);
    call_tests = call_tests + 1;
    if (((pxVar48 != (xmlDocPtr)0x0) && (api_doc != pxVar48)) && (pxVar48->doc != api_doc)) {
      xmlFreeDoc(pxVar48);
    }
    xmlResetLastError();
    iVar5 = xmlMemBlocks();
    if (iVar4 != iVar5) {
      iVar5 = xmlMemBlocks();
      printf("Leak of %d blocks found in xmlNewDocFragment",(ulong)(uint)(iVar5 - iVar4));
      test_ret_4 = test_ret_4 + 1;
      pxVar51 = (xmlNodePtr)(ulong)uVar63;
      printf(" %d");
      putchar(10);
    }
    uVar63 = uVar63 + 1;
  } while (uVar63 != 4);
  function_tests = function_tests + 1;
  test_ret_1 = 0;
  uVar63 = 0;
  do {
    _test_ret_2 = 0;
    bVar1 = true;
    do {
      bVar61 = bVar1;
      uVar66 = 0;
      do {
        puVar77 = &DAT_00162d68;
        pxVar41 = (xmlNodePtr)0x0;
        do {
          iVar5 = (int)pxVar51;
          iVar4 = xmlMemBlocks();
          pxVar48 = gen_xmlDocPtr(uVar63,iVar5);
          if (bVar61) {
            get_api_root();
            pxVar51 = (xmlNodePtr)api_ns;
            if (api_root != (xmlNodePtr)0x0) {
              api_ns = api_root->nsDef;
              pxVar51 = (xmlNodePtr)api_ns;
            }
          }
          else {
            pxVar51 = (xmlNodePtr)0x0;
          }
          if ((uint)uVar66 < 4) {
            uVar47 = (&DAT_00162d68)[uVar66];
          }
          else {
            uVar47 = 0;
          }
          uVar69 = (uint)pxVar41;
          if (uVar69 < 4) {
            uVar57 = *puVar77;
          }
          else {
            uVar57 = 0;
          }
          pxVar53 = (xmlNodePtr)xmlNewDocNode(pxVar48,pxVar51,uVar47,uVar57);
          desret_xmlNodePtr(pxVar53);
          call_tests = call_tests + 1;
          if (((pxVar48 != (xmlDocPtr)0x0) && (api_doc != pxVar48)) && (pxVar48->doc != api_doc)) {
            xmlFreeDoc(pxVar48);
          }
          if (bVar61) {
            xmlFreeDoc(api_doc);
            api_doc = (xmlDocPtr)0x0;
            api_dtd = (xmlDtdPtr)0x0;
            api_root = (xmlNodePtr)0x0;
            api_ns = (xmlNsPtr)0x0;
          }
          xmlResetLastError();
          iVar5 = xmlMemBlocks();
          if (iVar4 != iVar5) {
            iVar5 = xmlMemBlocks();
            printf("Leak of %d blocks found in xmlNewDocNode",(ulong)(uint)(iVar5 - iVar4));
            test_ret_1 = test_ret_1 + 1;
            printf(" %d",(ulong)uVar63);
            printf(" %d",_test_ret_2);
            printf(" %d",uVar66);
            printf(" %d");
            putchar(10);
            pxVar51 = pxVar41;
          }
          uVar69 = uVar69 + 1;
          pxVar41 = (xmlNodePtr)(ulong)uVar69;
          puVar77 = puVar77 + 1;
        } while (uVar69 != 5);
        uVar69 = (uint)uVar66 + 1;
        uVar66 = (ulong)uVar69;
      } while (uVar69 != 5);
      _test_ret_2 = 1;
      bVar1 = false;
    } while (bVar61);
    uVar63 = uVar63 + 1;
  } while (uVar63 != 4);
  function_tests = function_tests + 1;
  iVar4 = 0;
  uVar63 = 0;
  do {
    _test_ret_5 = 0;
    bVar1 = true;
    do {
      bVar61 = bVar1;
      _test_ret_27 = 0;
      bVar1 = true;
      do {
        bVar62 = bVar1;
        puVar77 = &DAT_00162d68;
        pxVar41 = (xmlNodePtr)0x0;
        do {
          iVar6 = (int)pxVar51;
          iVar5 = xmlMemBlocks();
          pxVar48 = gen_xmlDocPtr(uVar63,iVar6);
          if (bVar61) {
            get_api_root();
            pxVar51 = (xmlNodePtr)api_ns;
            if (api_root != (xmlNodePtr)0x0) {
              api_ns = api_root->nsDef;
              pxVar51 = (xmlNodePtr)api_ns;
            }
          }
          else {
            pxVar51 = (xmlNodePtr)0x0;
          }
          if (bVar62) {
            uVar47 = xmlStrdup("eaten");
          }
          else {
            uVar47 = 0;
          }
          uVar69 = (uint)pxVar41;
          if (uVar69 < 4) {
            uVar57 = *puVar77;
          }
          else {
            uVar57 = 0;
          }
          pxVar53 = (xmlNodePtr)xmlNewDocNodeEatName(pxVar48,pxVar51,uVar47,uVar57);
          desret_xmlNodePtr(pxVar53);
          call_tests = call_tests + 1;
          if (((pxVar48 != (xmlDocPtr)0x0) && (api_doc != pxVar48)) && (pxVar48->doc != api_doc)) {
            xmlFreeDoc(pxVar48);
          }
          if (bVar61) {
            xmlFreeDoc(api_doc);
            api_doc = (xmlDocPtr)0x0;
            api_dtd = (xmlDtdPtr)0x0;
            api_root = (xmlNodePtr)0x0;
            api_ns = (xmlNsPtr)0x0;
          }
          xmlResetLastError();
          iVar6 = xmlMemBlocks();
          if (iVar5 != iVar6) {
            iVar6 = xmlMemBlocks();
            printf("Leak of %d blocks found in xmlNewDocNodeEatName",(ulong)(uint)(iVar6 - iVar5));
            iVar4 = iVar4 + 1;
            printf(" %d",(ulong)uVar63);
            printf(" %d",_test_ret_5);
            printf(" %d",_test_ret_27);
            printf(" %d");
            putchar(10);
            pxVar51 = pxVar41;
          }
          uVar69 = uVar69 + 1;
          pxVar41 = (xmlNodePtr)(ulong)uVar69;
          puVar77 = puVar77 + 1;
        } while (uVar69 != 5);
        _test_ret_27 = 1;
        bVar1 = false;
      } while (bVar62);
      _test_ret_5 = 1;
      bVar1 = false;
    } while (bVar61);
    uVar63 = uVar63 + 1;
  } while (uVar63 != 4);
  function_tests = function_tests + 1;
  iVar5 = 0;
  uVar63 = 0;
  do {
    uVar69 = 0;
    do {
      pxVar41 = (xmlNodePtr)0x0;
      puVar77 = &DAT_00162d68;
      do {
        iVar7 = (int)pxVar51;
        iVar6 = xmlMemBlocks();
        pxVar48 = gen_xmlDocPtr(uVar63,iVar7);
        if (uVar69 < 4) {
          pxVar51 = (xmlNodePtr)(&DAT_00162d68)[uVar69];
        }
        else {
          pxVar51 = (xmlNodePtr)0x0;
        }
        uVar70 = (uint)pxVar41;
        if (uVar70 < 4) {
          uVar47 = *puVar77;
        }
        else {
          uVar47 = 0;
        }
        pxVar53 = (xmlNodePtr)xmlNewDocPI(pxVar48,pxVar51,uVar47);
        desret_xmlNodePtr(pxVar53);
        call_tests = call_tests + 1;
        if (((pxVar48 != (xmlDocPtr)0x0) && (api_doc != pxVar48)) && (pxVar48->doc != api_doc)) {
          xmlFreeDoc(pxVar48);
        }
        xmlResetLastError();
        iVar7 = xmlMemBlocks();
        if (iVar6 != iVar7) {
          iVar7 = xmlMemBlocks();
          printf("Leak of %d blocks found in xmlNewDocPI",(ulong)(uint)(iVar7 - iVar6));
          iVar5 = iVar5 + 1;
          printf(" %d",(ulong)uVar63);
          printf(" %d",(ulong)uVar69);
          printf(" %d");
          putchar(10);
          pxVar51 = pxVar41;
        }
        uVar70 = uVar70 + 1;
        pxVar41 = (xmlNodePtr)(ulong)uVar70;
        puVar77 = puVar77 + 1;
      } while (uVar70 != 5);
      uVar69 = uVar69 + 1;
    } while (uVar69 != 5);
    uVar63 = uVar63 + 1;
  } while (uVar63 != 4);
  iVar55 = iVar55 + iVar36 + iVar37 + iVar2 + iVar3 + test_ret_4 + test_ret_1;
  function_tests = function_tests + 1;
  iVar2 = 0;
  uVar63 = 0;
  do {
    uVar69 = 0;
    do {
      pxVar41 = (xmlNodePtr)0x0;
      puVar77 = &DAT_00162d68;
      do {
        iVar6 = (int)pxVar51;
        iVar3 = xmlMemBlocks();
        pxVar48 = gen_xmlDocPtr(uVar63,iVar6);
        if (uVar69 < 4) {
          pxVar51 = (xmlNodePtr)(&DAT_00162d68)[uVar69];
        }
        else {
          pxVar51 = (xmlNodePtr)0x0;
        }
        uVar70 = (uint)pxVar41;
        if (uVar70 < 4) {
          uVar47 = *puVar77;
        }
        else {
          uVar47 = 0;
        }
        lVar45 = xmlNewDocProp(pxVar48,pxVar51,uVar47);
        if (lVar45 != 0) {
          xmlUnlinkNode(lVar45);
          xmlFreeNode(lVar45);
        }
        call_tests = call_tests + 1;
        if (((pxVar48 != (xmlDocPtr)0x0) && (api_doc != pxVar48)) && (pxVar48->doc != api_doc)) {
          xmlFreeDoc(pxVar48);
        }
        xmlResetLastError();
        iVar6 = xmlMemBlocks();
        if (iVar3 != iVar6) {
          iVar6 = xmlMemBlocks();
          printf("Leak of %d blocks found in xmlNewDocProp",(ulong)(uint)(iVar6 - iVar3));
          iVar2 = iVar2 + 1;
          printf(" %d",(ulong)uVar63);
          printf(" %d",(ulong)uVar69);
          printf(" %d");
          putchar(10);
          pxVar51 = pxVar41;
        }
        uVar70 = uVar70 + 1;
        pxVar41 = (xmlNodePtr)(ulong)uVar70;
        puVar77 = puVar77 + 1;
      } while (uVar70 != 5);
      uVar69 = uVar69 + 1;
    } while (uVar69 != 5);
    uVar63 = uVar63 + 1;
  } while (uVar63 != 4);
  function_tests = function_tests + 1;
  test_ret_1 = 0;
  uVar63 = 0;
  do {
    _test_ret_2 = 0;
    bVar1 = true;
    do {
      bVar61 = bVar1;
      uVar66 = 0;
      do {
        puVar77 = &DAT_00162d68;
        pxVar41 = (xmlNodePtr)0x0;
        do {
          iVar6 = (int)pxVar51;
          iVar3 = xmlMemBlocks();
          pxVar48 = gen_xmlDocPtr(uVar63,iVar6);
          if (bVar61) {
            get_api_root();
            pxVar51 = (xmlNodePtr)api_ns;
            if (api_root != (xmlNodePtr)0x0) {
              api_ns = api_root->nsDef;
              pxVar51 = (xmlNodePtr)api_ns;
            }
          }
          else {
            pxVar51 = (xmlNodePtr)0x0;
          }
          if ((uint)uVar66 < 4) {
            uVar47 = (&DAT_00162d68)[uVar66];
          }
          else {
            uVar47 = 0;
          }
          uVar69 = (uint)pxVar41;
          if (uVar69 < 4) {
            uVar57 = *puVar77;
          }
          else {
            uVar57 = 0;
          }
          pxVar53 = (xmlNodePtr)xmlNewDocRawNode(pxVar48,pxVar51,uVar47,uVar57);
          desret_xmlNodePtr(pxVar53);
          call_tests = call_tests + 1;
          if (((pxVar48 != (xmlDocPtr)0x0) && (api_doc != pxVar48)) && (pxVar48->doc != api_doc)) {
            xmlFreeDoc(pxVar48);
          }
          if (bVar61) {
            xmlFreeDoc(api_doc);
            api_doc = (xmlDocPtr)0x0;
            api_dtd = (xmlDtdPtr)0x0;
            api_root = (xmlNodePtr)0x0;
            api_ns = (xmlNsPtr)0x0;
          }
          xmlResetLastError();
          iVar6 = xmlMemBlocks();
          if (iVar3 != iVar6) {
            iVar6 = xmlMemBlocks();
            printf("Leak of %d blocks found in xmlNewDocRawNode",(ulong)(uint)(iVar6 - iVar3));
            test_ret_1 = test_ret_1 + 1;
            printf(" %d",(ulong)uVar63);
            printf(" %d",_test_ret_2);
            printf(" %d",uVar66);
            printf(" %d");
            putchar(10);
            pxVar51 = pxVar41;
          }
          uVar69 = uVar69 + 1;
          pxVar41 = (xmlNodePtr)(ulong)uVar69;
          puVar77 = puVar77 + 1;
        } while (uVar69 != 5);
        uVar69 = (uint)uVar66 + 1;
        uVar66 = (ulong)uVar69;
      } while (uVar69 != 5);
      _test_ret_2 = 1;
      bVar1 = false;
    } while (bVar61);
    uVar63 = uVar63 + 1;
  } while (uVar63 != 4);
  function_tests = function_tests + 1;
  puVar71 = &DAT_00162d68;
  uVar63 = 0;
  iVar3 = 0;
  do {
    iVar6 = xmlMemBlocks();
    if (uVar63 < 4) {
      pcVar75 = (char *)*puVar71;
    }
    else {
      pcVar75 = (char *)0x0;
    }
    pxVar41 = (xmlNodePtr)xmlNewDocText(0);
    desret_xmlNodePtr(pxVar41);
    call_tests = call_tests + 1;
    xmlResetLastError();
    iVar7 = xmlMemBlocks();
    if (iVar6 != iVar7) {
      iVar7 = xmlMemBlocks();
      printf("Leak of %d blocks found in xmlNewDocText",(ulong)(uint)(iVar7 - iVar6));
      iVar3 = iVar3 + 1;
      printf(" %d",0);
      pcVar75 = (char *)(ulong)uVar63;
      printf(" %d");
      putchar(10);
    }
    uVar63 = uVar63 + 1;
    puVar71 = puVar71 + 1;
  } while (uVar63 != 5);
  function_tests = function_tests + 1;
  iVar6 = 0;
  uVar63 = 0;
  do {
    iVar7 = 0;
    do {
      pcVar67 = (char *)0x0;
      piVar78 = &DAT_0015fd14;
      do {
        iVar8 = xmlMemBlocks();
        pxVar48 = gen_xmlDocPtr(uVar63,(int)pcVar75);
        switch(iVar7) {
        case 0:
          bVar1 = false;
          __s = "foo";
          break;
        case 1:
          bVar1 = false;
          __s = "<foo/>";
          break;
        case 2:
          bVar1 = false;
          __s = anon_var_dwarf_1b5;
          break;
        case 3:
          bVar1 = false;
          __s = " 2ab ";
          break;
        default:
          bVar1 = true;
          __s = (char *)0x0;
        }
        iVar9 = *piVar78;
        iVar10 = (int)pcVar67;
        if ((bVar1) || (sVar46 = strlen(__s), iVar9 <= (int)sVar46 + 1)) {
          pxVar41 = (xmlNodePtr)xmlNewDocTextLen(pxVar48,__s,iVar9);
          desret_xmlNodePtr(pxVar41);
          call_tests = call_tests + 1;
          if ((pxVar48 != (xmlDocPtr)0x0) && ((api_doc != pxVar48 && (pxVar48->doc != api_doc)))) {
            xmlFreeDoc(pxVar48);
          }
          xmlResetLastError();
          iVar9 = xmlMemBlocks();
          pcVar75 = __s;
          if (iVar8 != iVar9) {
            iVar9 = xmlMemBlocks();
            printf("Leak of %d blocks found in xmlNewDocTextLen",(ulong)(uint)(iVar9 - iVar8));
            iVar6 = iVar6 + 1;
            printf(" %d",(ulong)uVar63);
            printf(" %d",iVar7);
            printf(" %d");
            putchar(10);
            pcVar75 = pcVar67;
          }
        }
        uVar69 = iVar10 + 1;
        pcVar67 = (char *)(ulong)uVar69;
        piVar78 = piVar78 + 1;
      } while (uVar69 != 4);
      iVar7 = iVar7 + 1;
    } while (iVar7 != 5);
    uVar63 = uVar63 + 1;
  } while (uVar63 != 4);
  function_tests = function_tests + 1;
  test_ret_2 = 0;
  uVar63 = 0;
  do {
    uVar66 = 0;
    do {
      uVar72 = 0;
      do {
        puVar77 = &DAT_00162d68;
        pcVar67 = (char *)0x0;
        do {
          iVar8 = (int)pcVar75;
          iVar7 = xmlMemBlocks();
          pxVar48 = gen_xmlDocPtr(uVar63,iVar8);
          if ((uint)uVar66 < 4) {
            pcVar75 = (char *)(&DAT_00162d68)[uVar66];
          }
          else {
            pcVar75 = (char *)0x0;
          }
          if ((uint)uVar72 < 4) {
            uVar47 = (&DAT_00162d68)[uVar72];
          }
          else {
            uVar47 = 0;
          }
          uVar69 = (uint)pcVar67;
          if (uVar69 < 4) {
            uVar57 = *puVar77;
          }
          else {
            uVar57 = 0;
          }
          pxVar41 = (xmlNodePtr)xmlNewDtd(pxVar48,pcVar75,uVar47,uVar57);
          desret_xmlNodePtr(pxVar41);
          call_tests = call_tests + 1;
          if (((pxVar48 != (xmlDocPtr)0x0) && (api_doc != pxVar48)) && (pxVar48->doc != api_doc)) {
            xmlFreeDoc(pxVar48);
          }
          xmlResetLastError();
          iVar8 = xmlMemBlocks();
          if (iVar7 != iVar8) {
            iVar8 = xmlMemBlocks();
            printf("Leak of %d blocks found in xmlNewDtd",(ulong)(uint)(iVar8 - iVar7));
            test_ret_2 = test_ret_2 + 1;
            printf(" %d",(ulong)uVar63);
            printf(" %d",uVar66);
            printf(" %d",uVar72);
            printf(" %d");
            putchar(10);
            pcVar75 = pcVar67;
          }
          uVar69 = uVar69 + 1;
          pcVar67 = (char *)(ulong)uVar69;
          puVar77 = puVar77 + 1;
        } while (uVar69 != 5);
        uVar69 = (uint)uVar72 + 1;
        uVar72 = (ulong)uVar69;
      } while (uVar69 != 5);
      uVar69 = (uint)uVar66 + 1;
      uVar66 = (ulong)uVar69;
    } while (uVar69 != 5);
    uVar63 = uVar63 + 1;
  } while (uVar63 != 4);
  function_tests = function_tests + 1;
  iVar7 = 0;
  uVar63 = 0;
  bVar1 = true;
  do {
    bVar61 = bVar1;
    iVar8 = 0;
    do {
      iVar9 = xmlMemBlocks();
      if (bVar61) {
        get_api_root();
        pxVar59 = api_ns;
        if (api_root != (xmlNodePtr)0x0) {
          api_ns = api_root->nsDef;
          pxVar59 = api_ns;
        }
      }
      else {
        pxVar59 = (xmlNs *)0x0;
      }
      pxVar41 = (xmlNodePtr)xmlNewNode(pxVar59);
      desret_xmlNodePtr(pxVar41);
      call_tests = call_tests + 1;
      if (bVar61) {
        xmlFreeDoc();
        api_doc = (xmlDocPtr)0x0;
        api_dtd = (xmlDtdPtr)0x0;
        api_root = (xmlNodePtr)0x0;
        api_ns = (xmlNsPtr)0x0;
      }
      xmlResetLastError();
      iVar10 = xmlMemBlocks();
      if (iVar9 != iVar10) {
        iVar10 = xmlMemBlocks();
        printf("Leak of %d blocks found in xmlNewNode",(ulong)(uint)(iVar10 - iVar9));
        iVar7 = iVar7 + 1;
        printf(" %d",(ulong)uVar63);
        printf(" %d");
        putchar(10);
      }
      iVar8 = iVar8 + 1;
    } while (iVar8 != 5);
    uVar63 = 1;
    bVar1 = false;
  } while (bVar61);
  function_tests = function_tests + 1;
  iVar8 = 0;
  _test_ret = (xmlDocPtr)0x0;
  bVar1 = true;
  do {
    bVar61 = bVar1;
    pxVar41 = (xmlNodePtr)0x0;
    bVar1 = true;
    do {
      bVar62 = bVar1;
      iVar9 = xmlMemBlocks();
      if (bVar61) {
        get_api_root();
        pxVar59 = api_ns;
        if (api_root != (xmlNodePtr)0x0) {
          api_ns = api_root->nsDef;
          pxVar59 = api_ns;
        }
      }
      else {
        pxVar59 = (xmlNs *)0x0;
      }
      if (bVar62) {
        pxVar51 = (xmlNodePtr)xmlStrdup("eaten");
      }
      else {
        pxVar51 = (xmlNodePtr)0x0;
      }
      pxVar53 = (xmlNodePtr)xmlNewNodeEatName(pxVar59);
      desret_xmlNodePtr(pxVar53);
      call_tests = call_tests + 1;
      if (bVar61) {
        xmlFreeDoc(api_doc);
        api_doc = (xmlDocPtr)0x0;
        api_dtd = (xmlDtdPtr)0x0;
        api_root = (xmlNodePtr)0x0;
        api_ns = (xmlNsPtr)0x0;
      }
      xmlResetLastError();
      iVar10 = xmlMemBlocks();
      if (iVar9 != iVar10) {
        iVar10 = xmlMemBlocks();
        printf("Leak of %d blocks found in xmlNewNodeEatName",(ulong)(uint)(iVar10 - iVar9));
        iVar8 = iVar8 + 1;
        printf(" %d",_test_ret);
        printf(" %d");
        putchar(10);
        pxVar51 = pxVar41;
      }
      pxVar41 = (xmlNodePtr)0x1;
      bVar1 = false;
    } while (bVar62);
    _test_ret = (xmlDocPtr)0x1;
    bVar1 = false;
  } while (bVar61);
  iVar55 = test_ret_1 + iVar3 + iVar55 + iVar4 + iVar5 + iVar2 + iVar6 + test_ret_2;
  function_tests = function_tests + 1;
  test_ret_28 = 0;
  uVar63 = 0;
  do {
    uVar69 = 0;
    do {
      puVar77 = &DAT_00162d68;
      pxVar41 = (xmlNodePtr)0x0;
      do {
        iVar3 = (int)pxVar51;
        iVar2 = xmlMemBlocks();
        pxVar51 = gen_xmlNodePtr(uVar63,iVar3);
        if (uVar69 < 4) {
          uVar47 = (&DAT_00162d68)[uVar69];
        }
        else {
          uVar47 = 0;
        }
        uVar70 = (uint)pxVar41;
        if (uVar70 < 4) {
          uVar57 = *puVar77;
        }
        else {
          uVar57 = 0;
        }
        auVar79 = xmlNewNs(pxVar51,uVar47,uVar57);
        iVar3 = auVar79._8_4_;
        if ((pxVar51 == (xmlNodePtr)0x0) && (auVar79._0_8_ != 0)) {
          xmlFreeNs(auVar79._0_8_);
          iVar3 = extraout_EDX_27;
        }
        call_tests = call_tests + 1;
        des_xmlNodePtr(uVar63,pxVar51,iVar3);
        xmlResetLastError();
        iVar3 = xmlMemBlocks();
        if (iVar2 != iVar3) {
          iVar3 = xmlMemBlocks();
          printf("Leak of %d blocks found in xmlNewNs",(ulong)(uint)(iVar3 - iVar2));
          test_ret_28 = test_ret_28 + 1;
          printf(" %d",(ulong)uVar63);
          printf(" %d",(ulong)uVar69);
          printf(" %d");
          putchar(10);
          pxVar51 = pxVar41;
        }
        uVar70 = uVar70 + 1;
        pxVar41 = (xmlNodePtr)(ulong)uVar70;
        puVar77 = puVar77 + 1;
      } while (uVar70 != 5);
      uVar69 = uVar69 + 1;
    } while (uVar69 != 5);
    uVar63 = uVar63 + 1;
  } while (uVar63 != 3);
  function_tests = function_tests + 1;
  iVar2 = 0;
  iVar3 = 0;
  do {
    _test_ret_27 = 0;
    bVar1 = true;
    do {
      bVar61 = bVar1;
      uVar66 = 0;
      do {
        puVar77 = &DAT_00162d68;
        pxVar41 = (xmlNodePtr)0x0;
        do {
          iVar5 = (int)pxVar51;
          iVar4 = xmlMemBlocks();
          pxVar51 = gen_xmlNodePtr(iVar3,iVar5);
          if (bVar61) {
            get_api_root();
            pxVar59 = api_ns;
            if (api_root != (xmlNodePtr)0x0) {
              api_ns = api_root->nsDef;
              pxVar59 = api_ns;
            }
          }
          else {
            pxVar59 = (xmlNs *)0x0;
          }
          if ((uint)uVar66 < 4) {
            uVar47 = (&DAT_00162d68)[uVar66];
          }
          else {
            uVar47 = 0;
          }
          uVar63 = (uint)pxVar41;
          if (uVar63 < 4) {
            uVar57 = *puVar77;
          }
          else {
            uVar57 = 0;
          }
          auVar79 = xmlNewNsProp(pxVar51,pxVar59,uVar47,uVar57);
          iVar5 = auVar79._8_4_;
          lVar45 = auVar79._0_8_;
          if (lVar45 != 0) {
            xmlUnlinkNode(lVar45);
            xmlFreeNode(lVar45);
            iVar5 = extraout_EDX_28;
          }
          call_tests = call_tests + 1;
          des_xmlNodePtr(iVar3,pxVar51,iVar5);
          if (bVar61) {
            xmlFreeDoc(api_doc);
            api_doc = (xmlDocPtr)0x0;
            api_dtd = (xmlDtdPtr)0x0;
            api_root = (xmlNodePtr)0x0;
            api_ns = (xmlNsPtr)0x0;
          }
          xmlResetLastError();
          iVar5 = xmlMemBlocks();
          if (iVar4 != iVar5) {
            iVar5 = xmlMemBlocks();
            printf("Leak of %d blocks found in xmlNewNsProp",(ulong)(uint)(iVar5 - iVar4));
            iVar2 = iVar2 + 1;
            printf(" %d",iVar3);
            printf(" %d",_test_ret_27);
            printf(" %d",uVar66);
            printf(" %d");
            putchar(10);
            pxVar51 = pxVar41;
          }
          uVar63 = uVar63 + 1;
          pxVar41 = (xmlNodePtr)(ulong)uVar63;
          puVar77 = puVar77 + 1;
        } while (uVar63 != 5);
        uVar63 = (uint)uVar66 + 1;
        uVar66 = (ulong)uVar63;
      } while (uVar63 != 5);
      _test_ret_27 = 1;
      bVar1 = false;
    } while (bVar61);
    iVar3 = iVar3 + 1;
  } while (iVar3 != 3);
  function_tests = function_tests + 1;
  test_ret_4 = 0;
  uVar63 = 0;
  do {
    _test_ret_5 = 0;
    bVar1 = true;
    do {
      bVar61 = bVar1;
      _test_ret_27 = 0;
      bVar1 = true;
      do {
        bVar62 = bVar1;
        puVar77 = &DAT_00162d68;
        pxVar41 = (xmlNodePtr)0x0;
        do {
          iVar4 = (int)pxVar51;
          iVar3 = xmlMemBlocks();
          pxVar51 = gen_xmlNodePtr(uVar63,iVar4);
          if (bVar61) {
            get_api_root();
            pxVar59 = api_ns;
            if (api_root != (xmlNodePtr)0x0) {
              api_ns = api_root->nsDef;
              pxVar59 = api_ns;
            }
          }
          else {
            pxVar59 = (xmlNs *)0x0;
          }
          if (bVar62) {
            uVar47 = xmlStrdup("eaten");
          }
          else {
            uVar47 = 0;
          }
          uVar69 = (uint)pxVar41;
          if (uVar69 < 4) {
            uVar57 = *puVar77;
          }
          else {
            uVar57 = 0;
          }
          auVar79 = xmlNewNsPropEatName(pxVar51,pxVar59,uVar47,uVar57);
          iVar4 = auVar79._8_4_;
          lVar45 = auVar79._0_8_;
          if (lVar45 != 0) {
            xmlUnlinkNode(lVar45);
            xmlFreeNode(lVar45);
            iVar4 = extraout_EDX_29;
          }
          call_tests = call_tests + 1;
          des_xmlNodePtr(uVar63,pxVar51,iVar4);
          if (bVar61) {
            xmlFreeDoc(api_doc);
            api_doc = (xmlDocPtr)0x0;
            api_dtd = (xmlDtdPtr)0x0;
            api_root = (xmlNodePtr)0x0;
            api_ns = (xmlNsPtr)0x0;
          }
          xmlResetLastError();
          iVar4 = xmlMemBlocks();
          if (iVar3 != iVar4) {
            iVar4 = xmlMemBlocks();
            printf("Leak of %d blocks found in xmlNewNsPropEatName",(ulong)(uint)(iVar4 - iVar3));
            test_ret_4 = test_ret_4 + 1;
            printf(" %d",(ulong)uVar63);
            printf(" %d",_test_ret_5);
            printf(" %d",_test_ret_27);
            printf(" %d");
            putchar(10);
            pxVar51 = pxVar41;
          }
          uVar69 = uVar69 + 1;
          pxVar41 = (xmlNodePtr)(ulong)uVar69;
          puVar77 = puVar77 + 1;
        } while (uVar69 != 5);
        _test_ret_27 = 1;
        bVar1 = false;
      } while (bVar62);
      _test_ret_5 = 1;
      bVar1 = false;
    } while (bVar61);
    uVar63 = uVar63 + 1;
  } while (uVar63 != 3);
  function_tests = function_tests + 1;
  iVar3 = 0;
  uVar63 = 0;
  do {
    puVar77 = &DAT_00162d68;
    uVar69 = 0;
    do {
      iVar4 = xmlMemBlocks();
      if (uVar63 < 4) {
        uVar47 = (&DAT_00162d68)[uVar63];
      }
      else {
        uVar47 = 0;
      }
      if (uVar69 < 4) {
        pxVar41 = (xmlNodePtr)*puVar77;
      }
      else {
        pxVar41 = (xmlNodePtr)0x0;
      }
      pxVar51 = (xmlNodePtr)xmlNewPI(uVar47);
      desret_xmlNodePtr(pxVar51);
      call_tests = call_tests + 1;
      xmlResetLastError();
      iVar5 = xmlMemBlocks();
      if (iVar4 != iVar5) {
        iVar5 = xmlMemBlocks();
        printf("Leak of %d blocks found in xmlNewPI",(ulong)(uint)(iVar5 - iVar4));
        iVar3 = iVar3 + 1;
        printf(" %d",(ulong)uVar63);
        pxVar41 = (xmlNodePtr)(ulong)uVar69;
        printf(" %d");
        putchar(10);
      }
      uVar69 = uVar69 + 1;
      puVar77 = puVar77 + 1;
    } while (uVar69 != 5);
    uVar63 = uVar63 + 1;
  } while (uVar63 != 5);
  function_tests = function_tests + 1;
  iVar4 = 0;
  uVar63 = 0;
  do {
    uVar69 = 0;
    do {
      pxVar51 = (xmlNodePtr)0x0;
      puVar77 = &DAT_00162d68;
      do {
        iVar6 = (int)pxVar41;
        iVar5 = xmlMemBlocks();
        pxVar41 = gen_xmlNodePtr(uVar63,iVar6);
        if (uVar69 < 4) {
          uVar47 = (&DAT_00162d68)[uVar69];
        }
        else {
          uVar47 = 0;
        }
        uVar70 = (uint)pxVar51;
        if (uVar70 < 4) {
          uVar57 = *puVar77;
        }
        else {
          uVar57 = 0;
        }
        auVar79 = xmlNewProp(pxVar41,uVar47,uVar57);
        iVar6 = auVar79._8_4_;
        lVar45 = auVar79._0_8_;
        if (lVar45 != 0) {
          xmlUnlinkNode(lVar45);
          xmlFreeNode(lVar45);
          iVar6 = extraout_EDX_30;
        }
        call_tests = call_tests + 1;
        des_xmlNodePtr(uVar63,pxVar41,iVar6);
        xmlResetLastError();
        iVar6 = xmlMemBlocks();
        if (iVar5 != iVar6) {
          iVar6 = xmlMemBlocks();
          printf("Leak of %d blocks found in xmlNewProp",(ulong)(uint)(iVar6 - iVar5));
          iVar4 = iVar4 + 1;
          printf(" %d",(ulong)uVar63);
          printf(" %d",(ulong)uVar69);
          printf(" %d");
          putchar(10);
          pxVar41 = pxVar51;
        }
        uVar70 = uVar70 + 1;
        pxVar51 = (xmlNodePtr)(ulong)uVar70;
        puVar77 = puVar77 + 1;
      } while (uVar70 != 5);
      uVar69 = uVar69 + 1;
    } while (uVar69 != 5);
    uVar63 = uVar63 + 1;
  } while (uVar63 != 3);
  function_tests = function_tests + 1;
  puVar77 = &DAT_00162d68;
  uVar63 = 0;
  iVar5 = 0;
  do {
    iVar6 = xmlMemBlocks();
    if (uVar63 < 4) {
      pxVar41 = (xmlNodePtr)*puVar77;
    }
    else {
      pxVar41 = (xmlNodePtr)0x0;
    }
    pxVar51 = (xmlNodePtr)xmlNewReference(0);
    desret_xmlNodePtr(pxVar51);
    call_tests = call_tests + 1;
    xmlResetLastError();
    iVar9 = xmlMemBlocks();
    if (iVar6 != iVar9) {
      iVar9 = xmlMemBlocks();
      printf("Leak of %d blocks found in xmlNewReference",(ulong)(uint)(iVar9 - iVar6));
      iVar5 = iVar5 + 1;
      printf(" %d",0);
      pxVar41 = (xmlNodePtr)(ulong)uVar63;
      printf(" %d");
      putchar(10);
    }
    uVar63 = uVar63 + 1;
    puVar77 = puVar77 + 1;
  } while (uVar63 != 5);
  function_tests = function_tests + 1;
  puVar77 = &DAT_00162d68;
  uVar63 = 0;
  test_ret_5 = 0;
  do {
    iVar6 = xmlMemBlocks();
    if (uVar63 < 4) {
      uVar47 = *puVar77;
    }
    else {
      uVar47 = 0;
    }
    pxVar51 = (xmlNodePtr)xmlNewText(uVar47);
    desret_xmlNodePtr(pxVar51);
    call_tests = call_tests + 1;
    xmlResetLastError();
    iVar9 = xmlMemBlocks();
    if (iVar6 != iVar9) {
      iVar9 = xmlMemBlocks();
      printf("Leak of %d blocks found in xmlNewText",(ulong)(uint)(iVar9 - iVar6));
      test_ret_5 = test_ret_5 + 1;
      pxVar41 = (xmlNodePtr)(ulong)uVar63;
      printf(" %d");
      putchar(10);
    }
    uVar63 = uVar63 + 1;
    puVar77 = puVar77 + 1;
  } while (uVar63 != 5);
  function_tests = function_tests + 1;
  iVar6 = 0;
  uVar63 = 0;
  do {
    _test_ret_2 = 0;
    bVar1 = true;
    do {
      bVar61 = bVar1;
      uVar66 = 0;
      do {
        puVar77 = &DAT_00162d68;
        pxVar51 = (xmlNodePtr)0x0;
        do {
          iVar10 = (int)pxVar41;
          iVar9 = xmlMemBlocks();
          pxVar41 = gen_xmlNodePtr(uVar63,iVar10);
          if (bVar61) {
            get_api_root();
            pxVar59 = api_ns;
            if (api_root != (xmlNodePtr)0x0) {
              api_ns = api_root->nsDef;
              pxVar59 = api_ns;
            }
          }
          else {
            pxVar59 = (xmlNs *)0x0;
          }
          if ((uint)uVar66 < 4) {
            uVar47 = (&DAT_00162d68)[uVar66];
          }
          else {
            uVar47 = 0;
          }
          uVar69 = (uint)pxVar51;
          if (uVar69 < 4) {
            uVar57 = *puVar77;
          }
          else {
            uVar57 = 0;
          }
          pxVar53 = (xmlNodePtr)xmlNewTextChild(pxVar41,pxVar59,uVar47,uVar57);
          desret_xmlNodePtr(pxVar53);
          call_tests = call_tests + 1;
          des_xmlNodePtr(uVar63,pxVar41,nr_08);
          if (bVar61) {
            xmlFreeDoc(api_doc);
            api_doc = (xmlDocPtr)0x0;
            api_dtd = (xmlDtdPtr)0x0;
            api_root = (xmlNodePtr)0x0;
            api_ns = (xmlNsPtr)0x0;
          }
          xmlResetLastError();
          iVar10 = xmlMemBlocks();
          if (iVar9 != iVar10) {
            iVar10 = xmlMemBlocks();
            printf("Leak of %d blocks found in xmlNewTextChild",(ulong)(uint)(iVar10 - iVar9));
            iVar6 = iVar6 + 1;
            printf(" %d",(ulong)uVar63);
            printf(" %d",_test_ret_2);
            printf(" %d",uVar66);
            printf(" %d");
            putchar(10);
            pxVar41 = pxVar51;
          }
          uVar69 = uVar69 + 1;
          pxVar51 = (xmlNodePtr)(ulong)uVar69;
          puVar77 = puVar77 + 1;
        } while (uVar69 != 5);
        uVar69 = (uint)uVar66 + 1;
        uVar66 = (ulong)uVar69;
      } while (uVar69 != 5);
      _test_ret_2 = 1;
      bVar1 = false;
    } while (bVar61);
    uVar63 = uVar63 + 1;
  } while (uVar63 != 3);
  function_tests = function_tests + 1;
  test_ret_2 = 0;
  uVar63 = 0;
  do {
    puVar76 = &DAT_0015fd14;
    pxVar51 = (xmlNodePtr)0x0;
    do {
      iVar9 = xmlMemBlocks();
      switch(uVar63) {
      case 0:
        bVar1 = false;
        pcVar75 = "foo";
        break;
      case 1:
        bVar1 = false;
        pcVar75 = "<foo/>";
        break;
      case 2:
        bVar1 = false;
        pcVar75 = anon_var_dwarf_1b5;
        break;
      case 3:
        bVar1 = false;
        pcVar75 = " 2ab ";
        break;
      default:
        bVar1 = true;
        pcVar75 = (char *)0x0;
      }
      uVar69 = *puVar76;
      iVar10 = (int)pxVar51;
      if ((bVar1) || (sVar46 = strlen(pcVar75), (int)uVar69 <= (int)sVar46 + 1)) {
        pxVar41 = (xmlNodePtr)(ulong)uVar69;
        pxVar53 = (xmlNodePtr)xmlNewTextLen(pcVar75);
        desret_xmlNodePtr(pxVar53);
        call_tests = call_tests + 1;
        xmlResetLastError();
        iVar11 = xmlMemBlocks();
        if (iVar9 != iVar11) {
          iVar11 = xmlMemBlocks();
          printf("Leak of %d blocks found in xmlNewTextLen",(ulong)(uint)(iVar11 - iVar9));
          test_ret_2 = test_ret_2 + 1;
          printf(" %d",(ulong)uVar63);
          printf(" %d");
          putchar(10);
          pxVar41 = pxVar51;
        }
      }
      uVar69 = iVar10 + 1;
      pxVar51 = (xmlNodePtr)(ulong)uVar69;
      puVar76 = puVar76 + 1;
    } while (uVar69 != 4);
    uVar63 = uVar63 + 1;
  } while (uVar63 != 5);
  function_tests = function_tests + 1;
  uVar63 = 0;
  test_ret_17 = 0;
  do {
    iVar10 = (int)pxVar41;
    iVar9 = xmlMemBlocks();
    pxVar41 = gen_xmlNodePtr(uVar63,iVar10);
    pxVar51 = (xmlNodePtr)xmlNextElementSibling(pxVar41);
    desret_xmlNodePtr(pxVar51);
    call_tests = call_tests + 1;
    des_xmlNodePtr(uVar63,pxVar41,nr_09);
    xmlResetLastError();
    iVar10 = xmlMemBlocks();
    if (iVar9 != iVar10) {
      iVar10 = xmlMemBlocks();
      printf("Leak of %d blocks found in xmlNextElementSibling",(ulong)(uint)(iVar10 - iVar9));
      test_ret_17 = test_ret_17 + 1;
      pxVar41 = (xmlNodePtr)(ulong)uVar63;
      printf(" %d");
      putchar(10);
    }
    uVar63 = uVar63 + 1;
  } while (uVar63 != 3);
  function_tests = function_tests + 1;
  iVar9 = 0;
  uVar63 = 0;
  do {
    puVar77 = &DAT_00162d68;
    pxVar51 = (xmlNodePtr)0x0;
    do {
      iVar11 = (int)pxVar41;
      iVar10 = xmlMemBlocks();
      pxVar41 = gen_xmlNodePtr(uVar63,iVar11);
      uVar69 = (uint)pxVar51;
      if (uVar69 < 4) {
        uVar47 = *puVar77;
      }
      else {
        uVar47 = 0;
      }
      xmlNodeAddContent(pxVar41,uVar47);
      call_tests = call_tests + 1;
      des_xmlNodePtr(uVar63,pxVar41,nr_10);
      xmlResetLastError();
      iVar11 = xmlMemBlocks();
      if (iVar10 != iVar11) {
        iVar11 = xmlMemBlocks();
        printf("Leak of %d blocks found in xmlNodeAddContent",(ulong)(uint)(iVar11 - iVar10));
        iVar9 = iVar9 + 1;
        printf(" %d",(ulong)uVar63);
        printf(" %d");
        putchar(10);
        pxVar41 = pxVar51;
      }
      uVar69 = uVar69 + 1;
      pxVar51 = (xmlNodePtr)(ulong)uVar69;
      puVar77 = puVar77 + 1;
    } while (uVar69 != 5);
    uVar63 = uVar63 + 1;
  } while (uVar63 != 3);
  iVar2 = test_ret_5 + iVar6 +
          iVar55 + iVar7 + iVar8 + test_ret_28 + iVar2 + test_ret_4 + iVar3 + iVar4 + iVar5 +
          test_ret_2;
  function_tests = function_tests + 1;
  iVar55 = 0;
  iVar3 = 0;
  do {
    uVar66 = 0;
    do {
      pxVar51 = (xmlNodePtr)0x0;
      piVar78 = &DAT_0015fd14;
      do {
        iVar4 = xmlMemBlocks();
        pxVar53 = gen_xmlNodePtr(iVar3,(int)pxVar41);
        switch(uVar66) {
        case 0:
          bVar1 = false;
          pcVar75 = "foo";
          break;
        case 1:
          bVar1 = false;
          pcVar75 = "<foo/>";
          break;
        case 2:
          bVar1 = false;
          pcVar75 = anon_var_dwarf_1b5;
          break;
        case 3:
          bVar1 = false;
          pcVar75 = " 2ab ";
          break;
        default:
          bVar1 = true;
          pcVar75 = (char *)0x0;
        }
        iVar5 = *piVar78;
        iVar6 = (int)pxVar51;
        if ((bVar1) || (sVar46 = strlen(pcVar75), iVar5 <= (int)sVar46 + 1)) {
          xmlNodeAddContentLen(pxVar53,pcVar75,iVar5);
          call_tests = call_tests + 1;
          des_xmlNodePtr(iVar3,pxVar53,nr_11);
          xmlResetLastError();
          iVar5 = xmlMemBlocks();
          pxVar41 = pxVar53;
          if (iVar4 != iVar5) {
            iVar5 = xmlMemBlocks();
            printf("Leak of %d blocks found in xmlNodeAddContentLen",(ulong)(uint)(iVar5 - iVar4));
            iVar55 = iVar55 + 1;
            printf(" %d",iVar3);
            printf(" %d",uVar66);
            printf(" %d");
            putchar(10);
            pxVar41 = pxVar51;
          }
        }
        uVar63 = iVar6 + 1;
        pxVar51 = (xmlNodePtr)(ulong)uVar63;
        piVar78 = piVar78 + 1;
      } while (uVar63 != 4);
      uVar63 = (int)uVar66 + 1;
      uVar66 = (ulong)uVar63;
    } while (uVar63 != 5);
    iVar3 = iVar3 + 1;
  } while (iVar3 != 3);
  function_tests = function_tests + 1;
  iVar4 = 0;
  iVar3 = 0;
  do {
    iVar6 = (int)pxVar41;
    iVar5 = xmlMemBlocks();
    pxVar42 = gen_xmlBufferPtr(iVar3,iVar6);
    pxVar41 = (xmlNodePtr)0x0;
    xmlNodeBufGetContent(pxVar42);
    call_tests = call_tests + 1;
    if (pxVar42 != (xmlBufferPtr)0x0) {
      xmlBufferFree(pxVar42);
    }
    xmlResetLastError();
    iVar6 = xmlMemBlocks();
    if (iVar5 != iVar6) {
      iVar6 = xmlMemBlocks();
      printf("Leak of %d blocks found in xmlNodeBufGetContent",(ulong)(uint)(iVar6 - iVar5));
      iVar4 = iVar4 + 1;
      printf(" %d");
      pxVar41 = (xmlNodePtr)0x0;
      printf(" %d");
      putchar(10);
    }
    iVar3 = iVar3 + 1;
  } while (iVar3 != 3);
  function_tests = function_tests + 1;
  test_ret_28 = 0;
  uVar63 = 0;
  do {
    uVar69 = 0;
    do {
      uVar70 = 0;
      do {
        uVar73 = 0;
        do {
          pxVar51 = (xmlNodePtr)0x0;
          puVar58 = &DAT_0015fd14;
          do {
            iVar5 = (int)pxVar41;
            iVar3 = xmlMemBlocks();
            pxVar42 = gen_xmlBufferPtr(uVar63,iVar5);
            pxVar48 = gen_xmlDocPtr(uVar69,iVar5);
            pxVar41 = gen_xmlNodePtr(uVar70,iVar5);
            uVar54 = 0xffffffff;
            if (uVar73 < 4) {
              uVar54 = (&DAT_0015fd14)[uVar73];
            }
            xmlNodeDump(pxVar42,pxVar48,pxVar41,uVar54,*puVar58);
            call_tests = call_tests + 1;
            iVar5 = extraout_EDX_31;
            if (pxVar42 != (xmlBufferPtr)0x0) {
              xmlBufferFree(pxVar42);
              iVar5 = extraout_EDX_32;
            }
            if (((pxVar48 != (xmlDocPtr)0x0) && (api_doc != pxVar48)) && (pxVar48->doc != api_doc))
            {
              xmlFreeDoc(pxVar48);
              iVar5 = extraout_EDX_33;
            }
            des_xmlNodePtr(uVar70,pxVar41,iVar5);
            xmlResetLastError();
            iVar5 = xmlMemBlocks();
            iVar6 = (int)pxVar51;
            if (iVar3 != iVar5) {
              iVar5 = xmlMemBlocks();
              printf("Leak of %d blocks found in xmlNodeDump",(ulong)(uint)(iVar5 - iVar3));
              test_ret_28 = test_ret_28 + 1;
              printf(" %d",(ulong)uVar63);
              printf(" %d",(ulong)uVar69);
              printf(" %d",(ulong)uVar70);
              printf(" %d",(ulong)uVar73);
              printf(" %d");
              putchar(10);
              pxVar41 = pxVar51;
            }
            uVar65 = iVar6 + 1;
            pxVar51 = (xmlNodePtr)(ulong)uVar65;
            puVar58 = puVar58 + 1;
          } while (uVar65 != 4);
          uVar73 = uVar73 + 1;
        } while (uVar73 != 4);
        uVar70 = uVar70 + 1;
      } while (uVar70 != 3);
      uVar69 = uVar69 + 1;
    } while (uVar69 != 4);
    uVar63 = uVar63 + 1;
  } while (uVar63 != 3);
  function_tests = function_tests + 1;
  iVar3 = 0;
  test_ret_4 = 0;
  bVar1 = true;
  do {
    bVar61 = bVar1;
    uVar63 = 0;
    do {
      uVar66 = 0;
      do {
        uVar69 = 0;
        do {
          uVar70 = 0;
          do {
            puVar77 = &DAT_00162d50;
            uVar73 = 0;
            do {
              iVar6 = (int)pxVar41;
              iVar5 = xmlMemBlocks();
              if (bVar61) {
                iVar6 = 0;
                lVar45 = xmlOutputBufferCreateFilename("test.out",0,0);
              }
              else {
                lVar45 = 0;
              }
              pxVar48 = gen_xmlDocPtr(uVar63,iVar6);
              iVar7 = (int)uVar66;
              pxVar41 = gen_xmlNodePtr(iVar7,iVar6);
              uVar68 = 0xffffffff;
              uVar54 = 0xffffffff;
              if (uVar69 < 4) {
                uVar54 = (&DAT_0015fd14)[uVar69];
              }
              if (uVar70 < 4) {
                uVar68 = (&DAT_0015fd14)[uVar70];
              }
              if (uVar73 < 3) {
                uVar47 = *puVar77;
              }
              else {
                uVar47 = 0;
              }
              xmlNodeDumpOutput(lVar45,pxVar48,pxVar41,uVar54,uVar68,uVar47);
              call_tests = call_tests + 1;
              iVar6 = extraout_EDX_34;
              if (lVar45 != 0) {
                xmlOutputBufferClose(lVar45);
                iVar6 = extraout_EDX_35;
              }
              if (((pxVar48 != (xmlDocPtr)0x0) && (api_doc != pxVar48)) && (pxVar48->doc != api_doc)
                 ) {
                xmlFreeDoc(pxVar48);
                iVar6 = extraout_EDX_36;
              }
              des_xmlNodePtr(iVar7,pxVar41,iVar6);
              xmlResetLastError();
              iVar6 = xmlMemBlocks();
              if (iVar5 != iVar6) {
                iVar6 = xmlMemBlocks();
                printf("Leak of %d blocks found in xmlNodeDumpOutput",(ulong)(uint)(iVar6 - iVar5));
                iVar3 = iVar3 + 1;
                printf(" %d",(ulong)(uint)test_ret_4);
                printf(" %d",(ulong)uVar63);
                printf(" %d",uVar66);
                printf(" %d",(ulong)uVar69);
                printf(" %d",(ulong)uVar70);
                pxVar41 = (xmlNodePtr)(ulong)uVar73;
                printf(" %d");
                putchar(10);
              }
              uVar73 = uVar73 + 1;
              puVar77 = puVar77 + 1;
            } while (uVar73 != 4);
            uVar70 = uVar70 + 1;
          } while (uVar70 != 4);
          uVar69 = uVar69 + 1;
        } while (uVar69 != 4);
        uVar66 = (ulong)(iVar7 + 1U);
      } while (iVar7 + 1U != 3);
      uVar63 = uVar63 + 1;
    } while (uVar63 != 4);
    test_ret_4 = 1;
    bVar1 = false;
  } while (bVar61);
  function_tests = function_tests + 1;
  iVar5 = xmlMemBlocks();
  lVar45 = xmlNodeGetBase(0);
  if (lVar45 != 0) {
    (*_xmlFree)(lVar45);
  }
  call_tests = call_tests + 1;
  xmlResetLastError();
  iVar6 = xmlMemBlocks();
  if (iVar5 != iVar6) {
    xmlMemBlocks();
    printf("Leak of %d blocks found in xmlNodeGetBase");
    printf(" %d");
    printf(" %d");
    putchar(10);
  }
  function_tests = function_tests + 1;
  iVar7 = xmlMemBlocks();
  lVar45 = xmlNodeGetContent(0);
  if (lVar45 != 0) {
    (*_xmlFree)(lVar45);
  }
  call_tests = call_tests + 1;
  xmlResetLastError();
  iVar8 = xmlMemBlocks();
  if (iVar7 != iVar8) {
    xmlMemBlocks();
    printf("Leak of %d blocks found in xmlNodeGetContent");
    printf(" %d");
    putchar(10);
  }
  function_tests = function_tests + 1;
  iVar10 = xmlMemBlocks();
  lVar45 = xmlNodeGetLang(0);
  if (lVar45 != 0) {
    (*_xmlFree)(lVar45);
  }
  call_tests = call_tests + 1;
  xmlResetLastError();
  iVar11 = xmlMemBlocks();
  if (iVar10 != iVar11) {
    xmlMemBlocks();
    printf("Leak of %d blocks found in xmlNodeGetLang");
    printf(" %d");
    putchar(10);
  }
  function_tests = function_tests + 1;
  iVar40 = xmlMemBlocks();
  xmlNodeGetSpacePreserve(0);
  call_tests = call_tests + 1;
  xmlResetLastError();
  iVar64 = xmlMemBlocks();
  if (iVar40 != iVar64) {
    xmlMemBlocks();
    printf("Leak of %d blocks found in xmlNodeGetSpacePreserve");
    printf(" %d");
    putchar(10);
  }
  function_tests = function_tests + 1;
  iVar12 = xmlMemBlocks();
  xmlNodeIsText(0);
  call_tests = call_tests + 1;
  xmlResetLastError();
  iVar13 = xmlMemBlocks();
  if (iVar12 != iVar13) {
    xmlMemBlocks();
    printf("Leak of %d blocks found in xmlNodeIsText");
    printf(" %d");
    putchar(10);
  }
  function_tests = function_tests + 1;
  uVar63 = 0;
  iVar14 = 0;
  puVar58 = &DAT_0015fd14;
  do {
    iVar15 = xmlMemBlocks();
    pxVar48 = (xmlDocPtr)0x0;
    lVar45 = xmlNodeListGetRawString(0,0,*puVar58);
    if (lVar45 != 0) {
      (*_xmlFree)();
    }
    call_tests = call_tests + 1;
    xmlResetLastError();
    iVar16 = xmlMemBlocks();
    if (iVar15 != iVar16) {
      iVar16 = xmlMemBlocks();
      printf("Leak of %d blocks found in xmlNodeListGetRawString",(ulong)(uint)(iVar16 - iVar15));
      iVar14 = iVar14 + 1;
      printf(" %d",0);
      printf(" %d",0);
      pxVar48 = (xmlDocPtr)(ulong)uVar63;
      printf(" %d");
      putchar(10);
    }
    uVar63 = uVar63 + 1;
    puVar58 = puVar58 + 1;
  } while (uVar63 != 4);
  function_tests = function_tests + 1;
  test_ret = 0;
  uVar63 = 0;
  do {
    puVar58 = &DAT_0015fd14;
    pxVar43 = (xmlDocPtr)0x0;
    do {
      iVar16 = (int)pxVar48;
      iVar15 = xmlMemBlocks();
      pxVar49 = gen_xmlDocPtr(uVar63,iVar16);
      pxVar48 = (xmlDocPtr)0x0;
      lVar45 = xmlNodeListGetString(pxVar49,0,*puVar58);
      if (lVar45 != 0) {
        (*_xmlFree)(lVar45);
      }
      call_tests = call_tests + 1;
      if (((pxVar49 != (xmlDocPtr)0x0) && (api_doc != pxVar49)) && (pxVar49->doc != api_doc)) {
        xmlFreeDoc(pxVar49);
      }
      xmlResetLastError();
      iVar16 = xmlMemBlocks();
      iVar17 = (int)pxVar43;
      if (iVar15 != iVar16) {
        iVar16 = xmlMemBlocks();
        printf("Leak of %d blocks found in xmlNodeListGetString",(ulong)(uint)(iVar16 - iVar15));
        test_ret = test_ret + 1;
        printf(" %d",(ulong)uVar63);
        printf(" %d",0);
        printf(" %d");
        putchar(10);
        pxVar48 = pxVar43;
      }
      uVar69 = iVar17 + 1;
      pxVar43 = (xmlDocPtr)(ulong)uVar69;
      puVar58 = puVar58 + 1;
    } while (uVar69 != 4);
    uVar63 = uVar63 + 1;
  } while (uVar63 != 4);
  function_tests = function_tests + 1;
  iVar15 = 0;
  uVar63 = 0;
  do {
    puVar77 = &DAT_00162d68;
    pxVar43 = (xmlDocPtr)0x0;
    do {
      iVar17 = (int)pxVar48;
      iVar16 = xmlMemBlocks();
      pxVar48 = (xmlDocPtr)gen_xmlNodePtr(uVar63,iVar17);
      uVar69 = (uint)pxVar43;
      if (uVar69 < 4) {
        uVar47 = *puVar77;
      }
      else {
        uVar47 = 0;
      }
      xmlNodeSetBase(pxVar48,uVar47);
      call_tests = call_tests + 1;
      des_xmlNodePtr(uVar63,(xmlNodePtr)pxVar48,nr_12);
      xmlResetLastError();
      iVar17 = xmlMemBlocks();
      if (iVar16 != iVar17) {
        iVar17 = xmlMemBlocks();
        printf("Leak of %d blocks found in xmlNodeSetBase",(ulong)(uint)(iVar17 - iVar16));
        iVar15 = iVar15 + 1;
        printf(" %d",(ulong)uVar63);
        printf(" %d");
        putchar(10);
        pxVar48 = pxVar43;
      }
      uVar69 = uVar69 + 1;
      pxVar43 = (xmlDocPtr)(ulong)uVar69;
      puVar77 = puVar77 + 1;
    } while (uVar69 != 5);
    uVar63 = uVar63 + 1;
  } while (uVar63 != 3);
  function_tests = function_tests + 1;
  iVar16 = 0;
  uVar63 = 0;
  do {
    puVar77 = &DAT_00162d68;
    pxVar43 = (xmlDocPtr)0x0;
    do {
      iVar18 = (int)pxVar48;
      iVar17 = xmlMemBlocks();
      pxVar48 = (xmlDocPtr)gen_xmlNodePtr(uVar63,iVar18);
      uVar69 = (uint)pxVar43;
      if (uVar69 < 4) {
        uVar47 = *puVar77;
      }
      else {
        uVar47 = 0;
      }
      xmlNodeSetContent(pxVar48,uVar47);
      call_tests = call_tests + 1;
      des_xmlNodePtr(uVar63,(xmlNodePtr)pxVar48,nr_13);
      xmlResetLastError();
      iVar18 = xmlMemBlocks();
      if (iVar17 != iVar18) {
        iVar18 = xmlMemBlocks();
        printf("Leak of %d blocks found in xmlNodeSetContent",(ulong)(uint)(iVar18 - iVar17));
        iVar16 = iVar16 + 1;
        printf(" %d",(ulong)uVar63);
        printf(" %d");
        putchar(10);
        pxVar48 = pxVar43;
      }
      uVar69 = uVar69 + 1;
      pxVar43 = (xmlDocPtr)(ulong)uVar69;
      puVar77 = puVar77 + 1;
    } while (uVar69 != 5);
    uVar63 = uVar63 + 1;
  } while (uVar63 != 3);
  function_tests = function_tests + 1;
  test_ret_5 = 0;
  iVar17 = 0;
  do {
    uVar66 = 0;
    do {
      pxVar43 = (xmlDocPtr)0x0;
      piVar78 = &DAT_0015fd14;
      do {
        iVar18 = xmlMemBlocks();
        pxVar49 = (xmlDocPtr)gen_xmlNodePtr(iVar17,(int)pxVar48);
        switch(uVar66) {
        case 0:
          bVar1 = false;
          pcVar75 = "foo";
          break;
        case 1:
          bVar1 = false;
          pcVar75 = "<foo/>";
          break;
        case 2:
          bVar1 = false;
          pcVar75 = anon_var_dwarf_1b5;
          break;
        case 3:
          bVar1 = false;
          pcVar75 = " 2ab ";
          break;
        default:
          bVar1 = true;
          pcVar75 = (char *)0x0;
        }
        iVar19 = *piVar78;
        iVar20 = (int)pxVar43;
        if ((bVar1) || (sVar46 = strlen(pcVar75), iVar19 <= (int)sVar46 + 1)) {
          xmlNodeSetContentLen(pxVar49,pcVar75,iVar19);
          call_tests = call_tests + 1;
          des_xmlNodePtr(iVar17,(xmlNodePtr)pxVar49,nr_14);
          xmlResetLastError();
          iVar19 = xmlMemBlocks();
          pxVar48 = pxVar49;
          if (iVar18 != iVar19) {
            iVar19 = xmlMemBlocks();
            printf("Leak of %d blocks found in xmlNodeSetContentLen",(ulong)(uint)(iVar19 - iVar18))
            ;
            test_ret_5 = test_ret_5 + 1;
            printf(" %d",iVar17);
            printf(" %d",uVar66);
            printf(" %d");
            putchar(10);
            pxVar48 = pxVar43;
          }
        }
        uVar63 = iVar20 + 1;
        pxVar43 = (xmlDocPtr)(ulong)uVar63;
        piVar78 = piVar78 + 1;
      } while (uVar63 != 4);
      uVar63 = (int)uVar66 + 1;
      uVar66 = (ulong)uVar63;
    } while (uVar63 != 5);
    iVar17 = iVar17 + 1;
  } while (iVar17 != 3);
  function_tests = function_tests + 1;
  iVar17 = 0;
  uVar63 = 0;
  do {
    puVar77 = &DAT_00162d68;
    pxVar43 = (xmlDocPtr)0x0;
    do {
      iVar19 = (int)pxVar48;
      iVar18 = xmlMemBlocks();
      pxVar48 = (xmlDocPtr)gen_xmlNodePtr(uVar63,iVar19);
      uVar69 = (uint)pxVar43;
      if (uVar69 < 4) {
        uVar47 = *puVar77;
      }
      else {
        uVar47 = 0;
      }
      xmlNodeSetLang(pxVar48,uVar47);
      call_tests = call_tests + 1;
      des_xmlNodePtr(uVar63,(xmlNodePtr)pxVar48,nr_15);
      xmlResetLastError();
      iVar19 = xmlMemBlocks();
      if (iVar18 != iVar19) {
        iVar19 = xmlMemBlocks();
        printf("Leak of %d blocks found in xmlNodeSetLang",(ulong)(uint)(iVar19 - iVar18));
        iVar17 = iVar17 + 1;
        printf(" %d",(ulong)uVar63);
        printf(" %d");
        putchar(10);
        pxVar48 = pxVar43;
      }
      uVar69 = uVar69 + 1;
      pxVar43 = (xmlDocPtr)(ulong)uVar69;
      puVar77 = puVar77 + 1;
    } while (uVar69 != 5);
    uVar63 = uVar63 + 1;
  } while (uVar63 != 3);
  function_tests = function_tests + 1;
  iVar18 = 0;
  uVar63 = 0;
  do {
    puVar77 = &DAT_00162d68;
    pxVar43 = (xmlDocPtr)0x0;
    do {
      iVar20 = (int)pxVar48;
      iVar19 = xmlMemBlocks();
      pxVar48 = (xmlDocPtr)gen_xmlNodePtr(uVar63,iVar20);
      uVar69 = (uint)pxVar43;
      if (uVar69 < 4) {
        uVar47 = *puVar77;
      }
      else {
        uVar47 = 0;
      }
      xmlNodeSetName(pxVar48,uVar47);
      call_tests = call_tests + 1;
      des_xmlNodePtr(uVar63,(xmlNodePtr)pxVar48,nr_16);
      xmlResetLastError();
      iVar20 = xmlMemBlocks();
      if (iVar19 != iVar20) {
        iVar20 = xmlMemBlocks();
        printf("Leak of %d blocks found in xmlNodeSetName",(ulong)(uint)(iVar20 - iVar19));
        iVar18 = iVar18 + 1;
        printf(" %d",(ulong)uVar63);
        printf(" %d");
        putchar(10);
        pxVar48 = pxVar43;
      }
      uVar69 = uVar69 + 1;
      pxVar43 = (xmlDocPtr)(ulong)uVar69;
      puVar77 = puVar77 + 1;
    } while (uVar69 != 5);
    uVar63 = uVar63 + 1;
  } while (uVar63 != 3);
  function_tests = function_tests + 1;
  iVar19 = 0;
  uVar63 = 0;
  do {
    puVar58 = &DAT_0015fd14;
    pxVar43 = (xmlDocPtr)0x0;
    do {
      iVar21 = (int)pxVar48;
      iVar20 = xmlMemBlocks();
      pxVar48 = (xmlDocPtr)gen_xmlNodePtr(uVar63,iVar21);
      xmlNodeSetSpacePreserve(pxVar48,*puVar58);
      call_tests = call_tests + 1;
      des_xmlNodePtr(uVar63,(xmlNodePtr)pxVar48,nr_17);
      xmlResetLastError();
      iVar21 = xmlMemBlocks();
      iVar22 = (int)pxVar43;
      if (iVar20 != iVar21) {
        iVar21 = xmlMemBlocks();
        printf("Leak of %d blocks found in xmlNodeSetSpacePreserve",(ulong)(uint)(iVar21 - iVar20));
        iVar19 = iVar19 + 1;
        printf(" %d",(ulong)uVar63);
        printf(" %d");
        putchar(10);
        pxVar48 = pxVar43;
      }
      uVar69 = iVar22 + 1;
      pxVar43 = (xmlDocPtr)(ulong)uVar69;
      puVar58 = puVar58 + 1;
    } while (uVar69 != 4);
    uVar63 = uVar63 + 1;
  } while (uVar63 != 3);
  function_tests = function_tests + 1;
  uVar63 = 0;
  iVar20 = 0;
  do {
    iVar22 = (int)pxVar48;
    iVar21 = xmlMemBlocks();
    pxVar48 = (xmlDocPtr)gen_xmlNodePtr(uVar63,iVar22);
    pxVar41 = (xmlNodePtr)xmlPreviousElementSibling(pxVar48);
    desret_xmlNodePtr(pxVar41);
    call_tests = call_tests + 1;
    des_xmlNodePtr(uVar63,(xmlNodePtr)pxVar48,nr_18);
    xmlResetLastError();
    iVar22 = xmlMemBlocks();
    if (iVar21 != iVar22) {
      iVar22 = xmlMemBlocks();
      printf("Leak of %d blocks found in xmlPreviousElementSibling",(ulong)(uint)(iVar22 - iVar21));
      iVar20 = iVar20 + 1;
      pxVar48 = (xmlDocPtr)(ulong)uVar63;
      printf(" %d");
      putchar(10);
    }
    uVar63 = uVar63 + 1;
  } while (uVar63 != 3);
  function_tests = function_tests + 1;
  iVar21 = 0;
  uVar63 = 0;
  do {
    uVar69 = 0;
    do {
      iVar22 = (int)pxVar48;
      iVar23 = xmlMemBlocks();
      pxVar43 = gen_xmlDocPtr(uVar63,iVar22);
      pxVar48 = (xmlDocPtr)gen_xmlNodePtr(uVar69,iVar22);
      xmlReconciliateNs(pxVar43,pxVar48);
      call_tests = call_tests + 1;
      iVar22 = extraout_EDX_37;
      if (((pxVar43 != (xmlDocPtr)0x0) && (api_doc != pxVar43)) && (pxVar43->doc != api_doc)) {
        xmlFreeDoc(pxVar43);
        iVar22 = extraout_EDX_38;
      }
      des_xmlNodePtr(uVar69,(xmlNodePtr)pxVar48,iVar22);
      xmlResetLastError();
      iVar22 = xmlMemBlocks();
      if (iVar23 != iVar22) {
        iVar22 = xmlMemBlocks();
        printf("Leak of %d blocks found in xmlReconciliateNs",(ulong)(uint)(iVar22 - iVar23));
        iVar21 = iVar21 + 1;
        printf(" %d",(ulong)uVar63);
        pxVar48 = (xmlDocPtr)(ulong)uVar69;
        printf(" %d");
        putchar(10);
      }
      uVar69 = uVar69 + 1;
    } while (uVar69 != 3);
    uVar63 = uVar63 + 1;
  } while (uVar63 != 4);
  function_tests = function_tests + 1;
  uVar63 = 0;
  iVar22 = 0;
  bVar1 = true;
  do {
    bVar61 = bVar1;
    iVar23 = xmlMemBlocks();
    pxVar44 = gen_xmlAttrPtr(uVar63,(int)pxVar48);
    xmlRemoveProp(pxVar44);
    call_tests = call_tests + 1;
    if (bVar61) {
      xmlFreeDoc(api_doc);
      api_doc = (xmlDocPtr)0x0;
      api_dtd = (xmlDtdPtr)0x0;
      api_root = (xmlNodePtr)0x0;
      api_ns = (xmlNsPtr)0x0;
    }
    xmlResetLastError();
    iVar24 = xmlMemBlocks();
    if (iVar23 != iVar24) {
      iVar24 = xmlMemBlocks();
      printf("Leak of %d blocks found in xmlRemoveProp",(ulong)(uint)(iVar24 - iVar23));
      iVar22 = iVar22 + 1;
      pxVar48 = (xmlDocPtr)(ulong)uVar63;
      printf(" %d");
      putchar(10);
    }
    uVar63 = 1;
    bVar1 = false;
  } while (bVar61);
  function_tests = function_tests + 1;
  uVar63 = 0;
  iVar23 = 0;
  do {
    uVar69 = 0;
    do {
      iVar25 = (int)pxVar48;
      iVar24 = xmlMemBlocks();
      pxVar41 = gen_xmlNodePtr(uVar63,iVar25);
      if (uVar69 == 0) {
        pxVar43 = (xmlDocPtr)xmlNewPI("test",0);
        pxVar48 = pxVar43;
        xmlReplaceNode(pxVar41);
        if (pxVar43 != (xmlDocPtr)0x0) {
          xmlUnlinkNode(pxVar43);
          xmlFreeNode(pxVar43);
        }
      }
      else {
        pxVar48 = (xmlDocPtr)0x0;
        xmlReplaceNode(pxVar41);
      }
      if (pxVar41 != (xmlNodePtr)0x0) {
        xmlUnlinkNode(pxVar41);
        xmlFreeNode(pxVar41);
      }
      call_tests = call_tests + 1;
      if (uVar63 == 1) {
        xmlFreeDoc(api_doc);
        api_doc = (xmlDocPtr)0x0;
        api_dtd = (xmlDtdPtr)0x0;
        api_root = (xmlNodePtr)0x0;
        api_ns = (xmlNsPtr)0x0;
      }
      xmlResetLastError();
      iVar25 = xmlMemBlocks();
      if (iVar24 != iVar25) {
        iVar25 = xmlMemBlocks();
        printf("Leak of %d blocks found in xmlReplaceNode",(ulong)(uint)(iVar25 - iVar24));
        iVar23 = iVar23 + 1;
        printf(" %d",(ulong)uVar63);
        pxVar48 = (xmlDocPtr)(ulong)uVar69;
        printf(" %d");
        putchar(10);
      }
      uVar69 = uVar69 + 1;
    } while (uVar69 != 3);
    uVar63 = uVar63 + 1;
  } while (uVar63 != 3);
  function_tests = function_tests + 1;
  iVar24 = 0;
  uVar63 = 0;
  do {
    uVar69 = 0;
    do {
      iVar74 = (int)pxVar48;
      iVar25 = xmlMemBlocks();
      if (uVar63 < 5) {
        puVar60 = (&PTR_anon_var_dwarf_62c_00162d28)[uVar63];
      }
      else {
        puVar60 = (undefined *)0x0;
      }
      pxVar43 = gen_xmlDocPtr(uVar69,iVar74);
      pxVar48 = pxVar43;
      xmlSaveFile(puVar60);
      call_tests = call_tests + 1;
      if (((pxVar43 != (xmlDocPtr)0x0) && (api_doc != pxVar43)) && (pxVar43->doc != api_doc)) {
        xmlFreeDoc(pxVar43);
      }
      xmlResetLastError();
      iVar74 = xmlMemBlocks();
      if (iVar25 != iVar74) {
        iVar74 = xmlMemBlocks();
        printf("Leak of %d blocks found in xmlSaveFile",(ulong)(uint)(iVar74 - iVar25));
        iVar24 = iVar24 + 1;
        printf(" %d",(ulong)uVar63);
        pxVar48 = (xmlDocPtr)(ulong)uVar69;
        printf(" %d");
        putchar(10);
      }
      uVar69 = uVar69 + 1;
    } while (uVar69 != 4);
    uVar63 = uVar63 + 1;
  } while (uVar63 != 6);
  function_tests = function_tests + 1;
  iVar25 = 0;
  uVar63 = 0;
  do {
    uVar69 = 0;
    do {
      pxVar43 = (xmlDocPtr)0x0;
      puVar77 = &DAT_00162d50;
      do {
        iVar26 = (int)pxVar48;
        iVar74 = xmlMemBlocks();
        if (uVar63 < 5) {
          puVar60 = (&PTR_anon_var_dwarf_62c_00162d28)[uVar63];
        }
        else {
          puVar60 = (undefined *)0x0;
        }
        pxVar49 = gen_xmlDocPtr(uVar69,iVar26);
        uVar70 = (uint)pxVar43;
        if (uVar70 < 3) {
          uVar47 = *puVar77;
        }
        else {
          uVar47 = 0;
        }
        pxVar48 = pxVar49;
        xmlSaveFileEnc(puVar60,pxVar49,uVar47);
        call_tests = call_tests + 1;
        if (((pxVar49 != (xmlDocPtr)0x0) && (api_doc != pxVar49)) && (pxVar49->doc != api_doc)) {
          xmlFreeDoc(pxVar49);
        }
        xmlResetLastError();
        iVar26 = xmlMemBlocks();
        if (iVar74 != iVar26) {
          iVar26 = xmlMemBlocks();
          printf("Leak of %d blocks found in xmlSaveFileEnc",(ulong)(uint)(iVar26 - iVar74));
          iVar25 = iVar25 + 1;
          printf(" %d",(ulong)uVar63);
          printf(" %d",(ulong)uVar69);
          printf(" %d");
          putchar(10);
          pxVar48 = pxVar43;
        }
        uVar70 = uVar70 + 1;
        pxVar43 = (xmlDocPtr)(ulong)uVar70;
        puVar77 = puVar77 + 1;
      } while (uVar70 != 4);
      uVar69 = uVar69 + 1;
    } while (uVar69 != 4);
    uVar63 = uVar63 + 1;
  } while (uVar63 != 6);
  function_tests = function_tests + 1;
  iVar74 = 0;
  _test_ret_2 = 0;
  bVar1 = true;
  do {
    bVar61 = bVar1;
    uVar63 = 0;
    do {
      pxVar43 = (xmlDocPtr)0x0;
      puVar77 = &DAT_00162d50;
      do {
        iVar27 = (int)pxVar48;
        iVar26 = xmlMemBlocks();
        if (bVar61) {
          iVar27 = 0;
          uVar47 = xmlOutputBufferCreateFilename("test.out",0,0);
        }
        else {
          uVar47 = 0;
        }
        pxVar49 = gen_xmlDocPtr(uVar63,iVar27);
        uVar69 = (uint)pxVar43;
        if (uVar69 < 3) {
          uVar57 = *puVar77;
        }
        else {
          uVar57 = 0;
        }
        pxVar48 = pxVar49;
        xmlSaveFileTo(uVar47,pxVar49,uVar57);
        call_tests = call_tests + 1;
        if (((pxVar49 != (xmlDocPtr)0x0) && (api_doc != pxVar49)) && (pxVar49->doc != api_doc)) {
          xmlFreeDoc(pxVar49);
        }
        xmlResetLastError();
        iVar27 = xmlMemBlocks();
        if (iVar26 != iVar27) {
          iVar27 = xmlMemBlocks();
          printf("Leak of %d blocks found in xmlSaveFileTo",(ulong)(uint)(iVar27 - iVar26));
          iVar74 = iVar74 + 1;
          printf(" %d",_test_ret_2);
          printf(" %d",(ulong)uVar63);
          printf(" %d");
          putchar(10);
          pxVar48 = pxVar43;
        }
        uVar69 = uVar69 + 1;
        pxVar43 = (xmlDocPtr)(ulong)uVar69;
        puVar77 = puVar77 + 1;
      } while (uVar69 != 4);
      uVar63 = uVar63 + 1;
    } while (uVar63 != 4);
    _test_ret_2 = 1;
    bVar1 = false;
  } while (bVar61);
  function_tests = function_tests + 1;
  iVar26 = 0;
  uVar63 = 0;
  do {
    uVar69 = 0;
    do {
      puVar58 = &DAT_0015fd14;
      uVar70 = 0;
      do {
        iVar28 = (int)pxVar48;
        iVar27 = xmlMemBlocks();
        if (uVar63 < 5) {
          puVar60 = (&PTR_anon_var_dwarf_62c_00162d28)[uVar63];
        }
        else {
          puVar60 = (undefined *)0x0;
        }
        pxVar43 = gen_xmlDocPtr(uVar69,iVar28);
        pxVar48 = pxVar43;
        xmlSaveFormatFile(puVar60,pxVar43,*puVar58);
        call_tests = call_tests + 1;
        if (((pxVar43 != (xmlDocPtr)0x0) && (api_doc != pxVar43)) && (pxVar43->doc != api_doc)) {
          xmlFreeDoc(pxVar43);
        }
        xmlResetLastError();
        iVar28 = xmlMemBlocks();
        if (iVar27 != iVar28) {
          iVar28 = xmlMemBlocks();
          printf("Leak of %d blocks found in xmlSaveFormatFile",(ulong)(uint)(iVar28 - iVar27));
          iVar26 = iVar26 + 1;
          printf(" %d",(ulong)uVar63);
          printf(" %d",(ulong)uVar69);
          pxVar48 = (xmlDocPtr)(ulong)uVar70;
          printf(" %d");
          putchar(10);
        }
        uVar70 = uVar70 + 1;
        puVar58 = puVar58 + 1;
      } while (uVar70 != 4);
      uVar69 = uVar69 + 1;
    } while (uVar69 != 4);
    uVar63 = uVar63 + 1;
  } while (uVar63 != 6);
  function_tests = function_tests + 1;
  iVar27 = 0;
  uVar63 = 0;
  do {
    uVar69 = 0;
    do {
      uVar70 = 0;
      do {
        puVar58 = &DAT_0015fd14;
        pxVar43 = (xmlDocPtr)0x0;
        do {
          iVar29 = (int)pxVar48;
          iVar28 = xmlMemBlocks();
          if (uVar63 < 5) {
            puVar60 = (&PTR_anon_var_dwarf_62c_00162d28)[uVar63];
          }
          else {
            puVar60 = (undefined *)0x0;
          }
          pxVar49 = gen_xmlDocPtr(uVar69,iVar29);
          if (uVar70 < 3) {
            uVar47 = (&DAT_00162d50)[uVar70];
          }
          else {
            uVar47 = 0;
          }
          pxVar48 = pxVar49;
          xmlSaveFormatFileEnc(puVar60,pxVar49,uVar47,*puVar58);
          call_tests = call_tests + 1;
          if (((pxVar49 != (xmlDocPtr)0x0) && (api_doc != pxVar49)) && (pxVar49->doc != api_doc)) {
            xmlFreeDoc(pxVar49);
          }
          xmlResetLastError();
          iVar29 = xmlMemBlocks();
          iVar30 = (int)pxVar43;
          if (iVar28 != iVar29) {
            iVar29 = xmlMemBlocks();
            printf("Leak of %d blocks found in xmlSaveFormatFileEnc",(ulong)(uint)(iVar29 - iVar28))
            ;
            iVar27 = iVar27 + 1;
            printf(" %d",(ulong)uVar63);
            printf(" %d",(ulong)uVar69);
            printf(" %d",(ulong)uVar70);
            printf(" %d");
            putchar(10);
            pxVar48 = pxVar43;
          }
          uVar73 = iVar30 + 1;
          pxVar43 = (xmlDocPtr)(ulong)uVar73;
          puVar58 = puVar58 + 1;
        } while (uVar73 != 4);
        uVar70 = uVar70 + 1;
      } while (uVar70 != 4);
      uVar69 = uVar69 + 1;
    } while (uVar69 != 4);
    uVar63 = uVar63 + 1;
  } while (uVar63 != 6);
  function_tests = function_tests + 1;
  iVar28 = 0;
  _test_ret_27 = 0;
  bVar1 = true;
  do {
    bVar61 = bVar1;
    uVar63 = 0;
    do {
      uVar66 = 0;
      do {
        puVar58 = &DAT_0015fd14;
        pxVar43 = (xmlDocPtr)0x0;
        do {
          iVar30 = (int)pxVar48;
          iVar29 = xmlMemBlocks();
          if (bVar61) {
            iVar30 = 0;
            uVar47 = xmlOutputBufferCreateFilename("test.out",0,0);
          }
          else {
            uVar47 = 0;
          }
          pxVar49 = gen_xmlDocPtr(uVar63,iVar30);
          if ((uint)uVar66 < 3) {
            uVar57 = (&DAT_00162d50)[uVar66];
          }
          else {
            uVar57 = 0;
          }
          pxVar48 = pxVar49;
          xmlSaveFormatFileTo(uVar47,pxVar49,uVar57,*puVar58);
          call_tests = call_tests + 1;
          if (((pxVar49 != (xmlDocPtr)0x0) && (api_doc != pxVar49)) && (pxVar49->doc != api_doc)) {
            xmlFreeDoc(pxVar49);
          }
          xmlResetLastError();
          iVar30 = xmlMemBlocks();
          iVar31 = (int)pxVar43;
          if (iVar29 != iVar30) {
            iVar30 = xmlMemBlocks();
            printf("Leak of %d blocks found in xmlSaveFormatFileTo",(ulong)(uint)(iVar30 - iVar29));
            iVar28 = iVar28 + 1;
            printf(" %d",_test_ret_27);
            printf(" %d",(ulong)uVar63);
            printf(" %d",uVar66);
            printf(" %d");
            putchar(10);
            pxVar48 = pxVar43;
          }
          uVar69 = iVar31 + 1;
          pxVar43 = (xmlDocPtr)(ulong)uVar69;
          puVar58 = puVar58 + 1;
        } while (uVar69 != 4);
        uVar69 = (uint)uVar66 + 1;
        uVar66 = (ulong)uVar69;
      } while (uVar69 != 4);
      uVar63 = uVar63 + 1;
    } while (uVar63 != 4);
    _test_ret_27 = 1;
    bVar1 = false;
  } while (bVar61);
  function_tests = function_tests + 1;
  test_ret_2 = 0;
  uVar63 = 0;
  do {
    uVar69 = 0;
    do {
      puVar77 = &DAT_00162d68;
      pxVar43 = (xmlDocPtr)0x0;
      do {
        iVar30 = (int)pxVar48;
        iVar29 = xmlMemBlocks();
        pxVar49 = gen_xmlDocPtr(uVar63,iVar30);
        pxVar48 = (xmlDocPtr)gen_xmlNodePtr(uVar69,iVar30);
        uVar70 = (uint)pxVar43;
        if (uVar70 < 4) {
          uVar47 = *puVar77;
        }
        else {
          uVar47 = 0;
        }
        xmlSearchNs(pxVar49,pxVar48,uVar47);
        call_tests = call_tests + 1;
        iVar30 = extraout_EDX_39;
        if (((pxVar49 != (xmlDocPtr)0x0) && (api_doc != pxVar49)) && (pxVar49->doc != api_doc)) {
          xmlFreeDoc(pxVar49);
          iVar30 = extraout_EDX_40;
        }
        des_xmlNodePtr(uVar69,(xmlNodePtr)pxVar48,iVar30);
        xmlResetLastError();
        iVar30 = xmlMemBlocks();
        if (iVar29 != iVar30) {
          iVar30 = xmlMemBlocks();
          printf("Leak of %d blocks found in xmlSearchNs",(ulong)(uint)(iVar30 - iVar29));
          test_ret_2 = test_ret_2 + 1;
          printf(" %d",(ulong)uVar63);
          printf(" %d",(ulong)uVar69);
          printf(" %d");
          putchar(10);
          pxVar48 = pxVar43;
        }
        uVar70 = uVar70 + 1;
        pxVar43 = (xmlDocPtr)(ulong)uVar70;
        puVar77 = puVar77 + 1;
      } while (uVar70 != 5);
      uVar69 = uVar69 + 1;
    } while (uVar69 != 3);
    uVar63 = uVar63 + 1;
  } while (uVar63 != 4);
  function_tests = function_tests + 1;
  iVar29 = 0;
  uVar63 = 0;
  do {
    uVar69 = 0;
    do {
      pxVar43 = (xmlDocPtr)0x0;
      puVar77 = &DAT_00162d68;
      do {
        iVar31 = (int)pxVar48;
        iVar30 = xmlMemBlocks();
        pxVar49 = gen_xmlDocPtr(uVar63,iVar31);
        pxVar48 = (xmlDocPtr)gen_xmlNodePtr(uVar69,iVar31);
        uVar70 = (uint)pxVar43;
        if (uVar70 < 4) {
          uVar47 = *puVar77;
        }
        else {
          uVar47 = 0;
        }
        xmlSearchNsByHref(pxVar49,pxVar48,uVar47);
        call_tests = call_tests + 1;
        iVar31 = extraout_EDX_41;
        if (((pxVar49 != (xmlDocPtr)0x0) && (api_doc != pxVar49)) && (pxVar49->doc != api_doc)) {
          xmlFreeDoc(pxVar49);
          iVar31 = extraout_EDX_42;
        }
        des_xmlNodePtr(uVar69,(xmlNodePtr)pxVar48,iVar31);
        xmlResetLastError();
        iVar31 = xmlMemBlocks();
        if (iVar30 != iVar31) {
          iVar31 = xmlMemBlocks();
          printf("Leak of %d blocks found in xmlSearchNsByHref",(ulong)(uint)(iVar31 - iVar30));
          iVar29 = iVar29 + 1;
          printf(" %d",(ulong)uVar63);
          printf(" %d",(ulong)uVar69);
          printf(" %d");
          putchar(10);
          pxVar48 = pxVar43;
        }
        uVar70 = uVar70 + 1;
        pxVar43 = (xmlDocPtr)(ulong)uVar70;
        puVar77 = puVar77 + 1;
      } while (uVar70 != 5);
      uVar69 = uVar69 + 1;
    } while (uVar69 != 3);
    uVar63 = uVar63 + 1;
  } while (uVar63 != 4);
  function_tests = function_tests + 1;
  uVar63 = 0xffffffff;
  iVar30 = 0;
  do {
    iVar31 = xmlMemBlocks();
    uVar54 = 0;
    if (uVar63 < 3) {
      uVar54 = (&DAT_001521f8)[uVar63];
    }
    uVar63 = uVar63 + 1;
    xmlSetBufferAllocationScheme(uVar54);
    call_tests = call_tests + 1;
    xmlResetLastError();
    iVar32 = xmlMemBlocks();
    if (iVar31 != iVar32) {
      iVar32 = xmlMemBlocks();
      printf("Leak of %d blocks found in xmlSetBufferAllocationScheme",
             (ulong)(uint)(iVar32 - iVar31));
      iVar30 = iVar30 + 1;
      pxVar48 = (xmlDocPtr)(ulong)uVar63;
      printf(" %d");
      putchar(10);
    }
  } while (uVar63 != 3);
  function_tests = function_tests + 1;
  iVar55 = iVar25 + iVar74 +
           iVar17 + iVar18 +
           iVar15 + iVar16 +
           test_ret_17 + iVar9 + iVar2 + iVar55 + iVar4 + test_ret_28 + iVar3 +
           (uint)(iVar5 != iVar6) + (uint)(iVar7 != iVar8) + (uint)(iVar10 != iVar11) +
           (uint)(iVar40 != iVar64) + (uint)(iVar12 != iVar13) + iVar14 + test_ret + test_ret_5 +
           iVar19 + iVar20 + iVar21 + iVar22 + iVar23 + iVar24 + iVar26 + iVar27 + iVar28 +
           test_ret_2;
  puVar58 = &DAT_0015fd14;
  pxVar43 = (xmlDocPtr)0x0;
  iVar2 = 0;
  do {
    iVar3 = xmlMemBlocks();
    xmlSetCompressMode(*puVar58);
    call_tests = call_tests + 1;
    xmlResetLastError();
    iVar4 = xmlMemBlocks();
    iVar5 = (int)pxVar43;
    if (iVar3 != iVar4) {
      iVar4 = xmlMemBlocks();
      printf("Leak of %d blocks found in xmlSetCompressMode",(ulong)(uint)(iVar4 - iVar3));
      iVar2 = iVar2 + 1;
      printf(" %d");
      putchar(10);
      pxVar48 = pxVar43;
    }
    uVar63 = iVar5 + 1;
    pxVar43 = (xmlDocPtr)(ulong)uVar63;
    puVar58 = puVar58 + 1;
  } while (uVar63 != 4);
  function_tests = function_tests + 1;
  test_ret_4 = 0;
  uVar63 = 0;
  do {
    puVar76 = &DAT_0015fd14;
    pxVar43 = (xmlDocPtr)0x0;
    do {
      iVar4 = (int)pxVar48;
      iVar3 = xmlMemBlocks();
      pxVar49 = gen_xmlDocPtr(uVar63,iVar4);
      pxVar48 = (xmlDocPtr)(ulong)*puVar76;
      xmlSetDocCompressMode(pxVar49);
      call_tests = call_tests + 1;
      if (((pxVar49 != (xmlDocPtr)0x0) && (api_doc != pxVar49)) && (pxVar49->doc != api_doc)) {
        xmlFreeDoc(pxVar49);
      }
      xmlResetLastError();
      iVar4 = xmlMemBlocks();
      iVar5 = (int)pxVar43;
      if (iVar3 != iVar4) {
        iVar4 = xmlMemBlocks();
        printf("Leak of %d blocks found in xmlSetDocCompressMode",(ulong)(uint)(iVar4 - iVar3));
        test_ret_4 = test_ret_4 + 1;
        printf(" %d",(ulong)uVar63);
        printf(" %d");
        putchar(10);
        pxVar48 = pxVar43;
      }
      uVar69 = iVar5 + 1;
      pxVar43 = (xmlDocPtr)(ulong)uVar69;
      puVar76 = puVar76 + 1;
    } while (uVar69 != 4);
    uVar63 = uVar63 + 1;
  } while (uVar63 != 4);
  function_tests = function_tests + 1;
  iVar3 = 0;
  uVar63 = 0;
  do {
    pxVar43 = (xmlDocPtr)0x0;
    bVar1 = true;
    do {
      bVar61 = bVar1;
      iVar5 = (int)pxVar48;
      iVar4 = xmlMemBlocks();
      pxVar48 = (xmlDocPtr)gen_xmlNodePtr(uVar63,iVar5);
      if (bVar61) {
        get_api_root();
        if (api_root != (xmlNodePtr)0x0) {
          api_ns = api_root->nsDef;
        }
        xmlSetNs(pxVar48,api_ns);
        call_tests = call_tests + 1;
        des_xmlNodePtr(uVar63,(xmlNodePtr)pxVar48,nr_20);
        xmlFreeDoc(api_doc);
        api_doc = (xmlDocPtr)0x0;
        api_dtd = (xmlDtdPtr)0x0;
        api_root = (xmlNodePtr)0x0;
        api_ns = (xmlNsPtr)0x0;
      }
      else {
        xmlSetNs(pxVar48,0);
        call_tests = call_tests + 1;
        des_xmlNodePtr(uVar63,(xmlNodePtr)pxVar48,nr_19);
      }
      xmlResetLastError();
      iVar5 = xmlMemBlocks();
      if (iVar4 != iVar5) {
        iVar5 = xmlMemBlocks();
        printf("Leak of %d blocks found in xmlSetNs",(ulong)(uint)(iVar5 - iVar4));
        iVar3 = iVar3 + 1;
        printf(" %d",(ulong)uVar63);
        printf(" %d");
        putchar(10);
        pxVar48 = pxVar43;
      }
      pxVar43 = (xmlDocPtr)0x1;
      bVar1 = false;
    } while (bVar61);
    uVar63 = uVar63 + 1;
  } while (uVar63 != 3);
  function_tests = function_tests + 1;
  iVar4 = 0;
  iVar5 = 0;
  do {
    _test_ret_27 = 0;
    bVar1 = true;
    do {
      bVar61 = bVar1;
      uVar66 = 0;
      do {
        puVar77 = &DAT_00162d68;
        pxVar43 = (xmlDocPtr)0x0;
        do {
          iVar7 = (int)pxVar48;
          iVar6 = xmlMemBlocks();
          pxVar48 = (xmlDocPtr)gen_xmlNodePtr(iVar5,iVar7);
          if (bVar61) {
            get_api_root();
            pxVar59 = api_ns;
            if (api_root != (xmlNodePtr)0x0) {
              api_ns = api_root->nsDef;
              pxVar59 = api_ns;
            }
          }
          else {
            pxVar59 = (xmlNs *)0x0;
          }
          if ((uint)uVar66 < 4) {
            uVar47 = (&DAT_00162d68)[uVar66];
          }
          else {
            uVar47 = 0;
          }
          uVar63 = (uint)pxVar43;
          if (uVar63 < 4) {
            uVar57 = *puVar77;
          }
          else {
            uVar57 = 0;
          }
          auVar79 = xmlSetNsProp(pxVar48,pxVar59,uVar47,uVar57);
          iVar7 = auVar79._8_4_;
          lVar45 = auVar79._0_8_;
          if (lVar45 != 0) {
            xmlUnlinkNode(lVar45);
            xmlFreeNode(lVar45);
            iVar7 = extraout_EDX_43;
          }
          call_tests = call_tests + 1;
          des_xmlNodePtr(iVar5,(xmlNodePtr)pxVar48,iVar7);
          if (bVar61) {
            xmlFreeDoc(api_doc);
            api_doc = (xmlDocPtr)0x0;
            api_dtd = (xmlDtdPtr)0x0;
            api_root = (xmlNodePtr)0x0;
            api_ns = (xmlNsPtr)0x0;
          }
          xmlResetLastError();
          iVar7 = xmlMemBlocks();
          if (iVar6 != iVar7) {
            iVar7 = xmlMemBlocks();
            printf("Leak of %d blocks found in xmlSetNsProp",(ulong)(uint)(iVar7 - iVar6));
            iVar4 = iVar4 + 1;
            printf(" %d",iVar5);
            printf(" %d",_test_ret_27);
            printf(" %d",uVar66);
            printf(" %d");
            putchar(10);
            pxVar48 = pxVar43;
          }
          uVar63 = uVar63 + 1;
          pxVar43 = (xmlDocPtr)(ulong)uVar63;
          puVar77 = puVar77 + 1;
        } while (uVar63 != 5);
        uVar63 = (uint)uVar66 + 1;
        uVar66 = (ulong)uVar63;
      } while (uVar63 != 5);
      _test_ret_27 = 1;
      bVar1 = false;
    } while (bVar61);
    iVar5 = iVar5 + 1;
  } while (iVar5 != 3);
  function_tests = function_tests + 1;
  test_ret_2 = 0;
  uVar63 = 0;
  do {
    uVar69 = 0;
    do {
      pxVar43 = (xmlDocPtr)0x0;
      puVar77 = &DAT_00162d68;
      do {
        iVar6 = (int)pxVar48;
        iVar5 = xmlMemBlocks();
        pxVar48 = (xmlDocPtr)gen_xmlNodePtr(uVar63,iVar6);
        if (uVar69 < 4) {
          uVar47 = (&DAT_00162d68)[uVar69];
        }
        else {
          uVar47 = 0;
        }
        uVar70 = (uint)pxVar43;
        if (uVar70 < 4) {
          uVar57 = *puVar77;
        }
        else {
          uVar57 = 0;
        }
        auVar79 = xmlSetProp(pxVar48,uVar47,uVar57);
        iVar6 = auVar79._8_4_;
        lVar45 = auVar79._0_8_;
        if (lVar45 != 0) {
          xmlUnlinkNode(lVar45);
          xmlFreeNode(lVar45);
          iVar6 = extraout_EDX_44;
        }
        call_tests = call_tests + 1;
        des_xmlNodePtr(uVar63,(xmlNodePtr)pxVar48,iVar6);
        xmlResetLastError();
        iVar6 = xmlMemBlocks();
        if (iVar5 != iVar6) {
          iVar6 = xmlMemBlocks();
          printf("Leak of %d blocks found in xmlSetProp",(ulong)(uint)(iVar6 - iVar5));
          test_ret_2 = test_ret_2 + 1;
          printf(" %d",(ulong)uVar63);
          printf(" %d",(ulong)uVar69);
          printf(" %d");
          putchar(10);
          pxVar48 = pxVar43;
        }
        uVar70 = uVar70 + 1;
        pxVar43 = (xmlDocPtr)(ulong)uVar70;
        puVar77 = puVar77 + 1;
      } while (uVar70 != 5);
      uVar69 = uVar69 + 1;
    } while (uVar69 != 5);
    uVar63 = uVar63 + 1;
  } while (uVar63 != 3);
  function_tests = function_tests + 1;
  puVar77 = &DAT_00162d68;
  iVar5 = 0;
  uVar63 = 0;
  do {
    iVar6 = xmlMemBlocks();
    if (uVar63 < 4) {
      uVar47 = *puVar77;
    }
    else {
      uVar47 = 0;
    }
    lVar45 = xmlSplitQName2(uVar47,0);
    if (lVar45 != 0) {
      (*_xmlFree)();
    }
    call_tests = call_tests + 1;
    xmlResetLastError();
    iVar7 = xmlMemBlocks();
    if (iVar6 != iVar7) {
      iVar7 = xmlMemBlocks();
      printf("Leak of %d blocks found in xmlSplitQName2",(ulong)(uint)(iVar7 - iVar6));
      iVar5 = iVar5 + 1;
      printf(" %d");
      printf(" %d");
      putchar(10);
    }
    uVar63 = uVar63 + 1;
    puVar77 = puVar77 + 1;
  } while (uVar63 != 5);
  function_tests = function_tests + 1;
  _test_ret = (xmlDocPtr)&DAT_00162d68;
  iVar6 = 0;
  uVar63 = 0;
  do {
    bVar1 = true;
    do {
      bVar61 = bVar1;
      iVar7 = xmlMemBlocks();
      if (uVar63 < 4) {
        uVar47 = (&DAT_00162d68)[uVar63];
      }
      else {
        uVar47 = 0;
      }
      xmlSplitQName3(uVar47);
      call_tests = call_tests + 1;
      xmlResetLastError();
      iVar8 = xmlMemBlocks();
      if (iVar7 != iVar8) {
        iVar8 = xmlMemBlocks();
        printf("Leak of %d blocks found in xmlSplitQName3",(ulong)(uint)(iVar8 - iVar7));
        iVar6 = iVar6 + 1;
        printf(" %d",(ulong)uVar63);
        printf(" %d");
        putchar(10);
      }
      bVar1 = false;
    } while (bVar61);
    uVar63 = uVar63 + 1;
  } while (uVar63 != 5);
  iVar55 = iVar29 + iVar30 + iVar55 + iVar2 + test_ret_4 + iVar3 + iVar4 + test_ret_2;
  function_tests = function_tests + 1;
  uVar63 = 0;
  iVar2 = 0;
  do {
    iVar3 = xmlMemBlocks();
    if (uVar63 < 4) {
      pxVar41 = *(xmlNodePtr *)_test_ret;
    }
    else {
      pxVar41 = (xmlNodePtr)0x0;
    }
    pxVar51 = (xmlNodePtr)xmlStringGetNodeList(0);
    desret_xmlNodePtr(pxVar51);
    call_tests = call_tests + 1;
    xmlResetLastError();
    iVar4 = xmlMemBlocks();
    if (iVar3 != iVar4) {
      iVar4 = xmlMemBlocks();
      printf("Leak of %d blocks found in xmlStringGetNodeList",(ulong)(uint)(iVar4 - iVar3));
      iVar2 = iVar2 + 1;
      printf(" %d",0);
      pxVar41 = (xmlNodePtr)(ulong)uVar63;
      printf(" %d");
      putchar(10);
    }
    uVar63 = uVar63 + 1;
    _test_ret = (xmlDocPtr)((long)_test_ret + 8);
  } while (uVar63 != 5);
  function_tests = function_tests + 1;
  test_ret_2 = 0;
  uVar63 = 0;
  do {
    piVar78 = &DAT_0015fd14;
    pxVar51 = (xmlNodePtr)0x0;
    do {
      iVar3 = xmlMemBlocks();
      switch(uVar63) {
      case 0:
        bVar1 = false;
        pcVar75 = "foo";
        break;
      case 1:
        bVar1 = false;
        pcVar75 = "<foo/>";
        break;
      case 2:
        bVar1 = false;
        pcVar75 = anon_var_dwarf_1b5;
        break;
      case 3:
        bVar1 = false;
        pcVar75 = " 2ab ";
        break;
      default:
        bVar1 = true;
        pcVar75 = (char *)0x0;
      }
      iVar4 = *piVar78;
      iVar7 = (int)pxVar51;
      if ((bVar1) || (sVar46 = strlen(pcVar75), iVar4 <= (int)sVar46 + 1)) {
        pxVar41 = (xmlNodePtr)xmlStringLenGetNodeList(0,pcVar75,iVar4);
        desret_xmlNodePtr(pxVar41);
        call_tests = call_tests + 1;
        xmlResetLastError();
        iVar4 = xmlMemBlocks();
        pxVar41 = (xmlNodePtr)pcVar75;
        if (iVar3 != iVar4) {
          iVar4 = xmlMemBlocks();
          printf("Leak of %d blocks found in xmlStringLenGetNodeList",(ulong)(uint)(iVar4 - iVar3));
          test_ret_2 = test_ret_2 + 1;
          printf(" %d",0);
          printf(" %d",(ulong)uVar63);
          printf(" %d");
          putchar(10);
          pxVar41 = pxVar51;
        }
      }
      uVar69 = iVar7 + 1;
      pxVar51 = (xmlNodePtr)(ulong)uVar69;
      piVar78 = piVar78 + 1;
    } while (uVar69 != 4);
    uVar63 = uVar63 + 1;
  } while (uVar63 != 5);
  function_tests = function_tests + 1;
  iVar55 = iVar6 + iVar2 + iVar55 + iVar5 + test_ret_2;
  iVar2 = 0;
  iVar3 = 0;
  do {
    uVar66 = 0;
    do {
      pxVar51 = (xmlNodePtr)0x0;
      piVar78 = &DAT_0015fd14;
      do {
        iVar4 = xmlMemBlocks();
        pxVar53 = gen_xmlNodePtr(iVar3,(int)pxVar41);
        switch(uVar66) {
        case 0:
          bVar1 = false;
          pcVar75 = "foo";
          break;
        case 1:
          bVar1 = false;
          pcVar75 = "<foo/>";
          break;
        case 2:
          bVar1 = false;
          pcVar75 = anon_var_dwarf_1b5;
          break;
        case 3:
          bVar1 = false;
          pcVar75 = " 2ab ";
          break;
        default:
          bVar1 = true;
          pcVar75 = (char *)0x0;
        }
        iVar5 = *piVar78;
        iVar6 = (int)pxVar51;
        if ((bVar1) || (sVar46 = strlen(pcVar75), iVar5 <= (int)sVar46 + 1)) {
          xmlTextConcat(pxVar53,pcVar75,iVar5);
          call_tests = call_tests + 1;
          des_xmlNodePtr(iVar3,pxVar53,nr_21);
          xmlResetLastError();
          iVar5 = xmlMemBlocks();
          pxVar41 = pxVar53;
          if (iVar4 != iVar5) {
            iVar5 = xmlMemBlocks();
            printf("Leak of %d blocks found in xmlTextConcat",(ulong)(uint)(iVar5 - iVar4));
            iVar2 = iVar2 + 1;
            printf(" %d",iVar3);
            printf(" %d",uVar66);
            printf(" %d");
            putchar(10);
            pxVar41 = pxVar51;
          }
        }
        uVar63 = iVar6 + 1;
        pxVar51 = (xmlNodePtr)(ulong)uVar63;
        piVar78 = piVar78 + 1;
      } while (uVar63 != 4);
      uVar63 = (int)uVar66 + 1;
      uVar66 = (ulong)uVar63;
    } while (uVar63 != 5);
    iVar3 = iVar3 + 1;
  } while (iVar3 != 3);
  function_tests = function_tests + 1;
  uVar63 = 0;
  iVar3 = 0;
  do {
    uVar69 = 0;
    do {
      iVar4 = xmlMemBlocks();
      if (uVar63 == 0) {
        lVar45 = xmlNewPI("test",0);
      }
      else {
        lVar45 = 0;
      }
      if (uVar69 == 0) {
        pxVar41 = (xmlNodePtr)xmlNewPI("test",0);
      }
      else {
        pxVar41 = (xmlNodePtr)0x0;
      }
      pxVar51 = pxVar41;
      pxVar53 = (xmlNodePtr)xmlTextMerge(lVar45);
      if ((lVar45 != 0) && (*(int *)(lVar45 + 8) != 3)) {
        xmlUnlinkNode(pxVar41);
        xmlFreeNode(pxVar41);
      }
      desret_xmlNodePtr(pxVar53);
      call_tests = call_tests + 1;
      xmlResetLastError();
      iVar5 = xmlMemBlocks();
      if (iVar4 != iVar5) {
        iVar5 = xmlMemBlocks();
        printf("Leak of %d blocks found in xmlTextMerge",(ulong)(uint)(iVar5 - iVar4));
        iVar3 = iVar3 + 1;
        printf(" %d",(ulong)uVar63);
        pxVar51 = (xmlNodePtr)(ulong)uVar69;
        printf(" %d");
        putchar(10);
      }
      uVar69 = uVar69 + 1;
    } while (uVar69 != 3);
    uVar63 = uVar63 + 1;
  } while (uVar63 != 3);
  function_tests = function_tests + 1;
  test_ret_2 = 0;
  uVar63 = 0;
  do {
    _test_ret = (xmlDocPtr)0x0;
    bVar1 = true;
    do {
      bVar61 = bVar1;
      pxVar41 = (xmlNodePtr)0x0;
      puVar77 = &DAT_00162d68;
      do {
        iVar5 = (int)pxVar51;
        iVar4 = xmlMemBlocks();
        pxVar51 = gen_xmlNodePtr(uVar63,iVar5);
        if (bVar61) {
          get_api_root();
          pxVar59 = api_ns;
          if (api_root != (xmlNodePtr)0x0) {
            api_ns = api_root->nsDef;
            pxVar59 = api_ns;
          }
        }
        else {
          pxVar59 = (xmlNs *)0x0;
        }
        uVar69 = (uint)pxVar41;
        if (uVar69 < 4) {
          uVar47 = *puVar77;
        }
        else {
          uVar47 = 0;
        }
        xmlUnsetNsProp(pxVar51,pxVar59,uVar47);
        call_tests = call_tests + 1;
        des_xmlNodePtr(uVar63,pxVar51,nr_22);
        if (bVar61) {
          xmlFreeDoc(api_doc);
          api_doc = (xmlDocPtr)0x0;
          api_dtd = (xmlDtdPtr)0x0;
          api_root = (xmlNodePtr)0x0;
          api_ns = (xmlNsPtr)0x0;
        }
        xmlResetLastError();
        iVar5 = xmlMemBlocks();
        if (iVar4 != iVar5) {
          iVar5 = xmlMemBlocks();
          printf("Leak of %d blocks found in xmlUnsetNsProp",(ulong)(uint)(iVar5 - iVar4));
          test_ret_2 = test_ret_2 + 1;
          printf(" %d",(ulong)uVar63);
          printf(" %d",_test_ret);
          printf(" %d");
          putchar(10);
          pxVar51 = pxVar41;
        }
        uVar69 = uVar69 + 1;
        pxVar41 = (xmlNodePtr)(ulong)uVar69;
        puVar77 = puVar77 + 1;
      } while (uVar69 != 5);
      _test_ret = (xmlDocPtr)0x1;
      bVar1 = false;
    } while (bVar61);
    uVar63 = uVar63 + 1;
  } while (uVar63 != 3);
  function_tests = function_tests + 1;
  iVar4 = 0;
  uVar63 = 0;
  do {
    puVar77 = &DAT_00162d68;
    pxVar41 = (xmlNodePtr)0x0;
    do {
      iVar6 = (int)pxVar51;
      iVar5 = xmlMemBlocks();
      pxVar51 = gen_xmlNodePtr(uVar63,iVar6);
      uVar69 = (uint)pxVar41;
      if (uVar69 < 4) {
        uVar47 = *puVar77;
      }
      else {
        uVar47 = 0;
      }
      xmlUnsetProp(pxVar51,uVar47);
      call_tests = call_tests + 1;
      des_xmlNodePtr(uVar63,pxVar51,nr_23);
      xmlResetLastError();
      iVar6 = xmlMemBlocks();
      if (iVar5 != iVar6) {
        iVar6 = xmlMemBlocks();
        printf("Leak of %d blocks found in xmlUnsetProp",(ulong)(uint)(iVar6 - iVar5));
        iVar4 = iVar4 + 1;
        printf(" %d",(ulong)uVar63);
        printf(" %d");
        putchar(10);
        pxVar51 = pxVar41;
      }
      uVar69 = uVar69 + 1;
      pxVar41 = (xmlNodePtr)(ulong)uVar69;
      puVar77 = puVar77 + 1;
    } while (uVar69 != 5);
    uVar63 = uVar63 + 1;
  } while (uVar63 != 3);
  function_tests = function_tests + 1;
  iVar5 = 0;
  uVar63 = 0;
  do {
    puVar58 = &DAT_0015fd14;
    uVar69 = 0;
    do {
      iVar6 = xmlMemBlocks();
      if (uVar63 < 4) {
        uVar47 = (&DAT_00162d68)[uVar63];
      }
      else {
        uVar47 = 0;
      }
      xmlValidateNCName(uVar47,*puVar58);
      call_tests = call_tests + 1;
      xmlResetLastError();
      iVar7 = xmlMemBlocks();
      if (iVar6 != iVar7) {
        iVar7 = xmlMemBlocks();
        printf("Leak of %d blocks found in xmlValidateNCName",(ulong)(uint)(iVar7 - iVar6));
        iVar5 = iVar5 + 1;
        printf(" %d",(ulong)uVar63);
        printf(" %d",(ulong)uVar69);
        putchar(10);
      }
      uVar69 = uVar69 + 1;
      puVar58 = puVar58 + 1;
    } while (uVar69 != 4);
    uVar63 = uVar63 + 1;
  } while (uVar63 != 5);
  function_tests = function_tests + 1;
  iVar6 = 0;
  uVar63 = 0;
  do {
    puVar58 = &DAT_0015fd14;
    uVar69 = 0;
    do {
      iVar7 = xmlMemBlocks();
      if (uVar63 < 4) {
        uVar47 = (&DAT_00162d68)[uVar63];
      }
      else {
        uVar47 = 0;
      }
      xmlValidateNMToken(uVar47,*puVar58);
      call_tests = call_tests + 1;
      xmlResetLastError();
      iVar8 = xmlMemBlocks();
      if (iVar7 != iVar8) {
        iVar8 = xmlMemBlocks();
        printf("Leak of %d blocks found in xmlValidateNMToken",(ulong)(uint)(iVar8 - iVar7));
        iVar6 = iVar6 + 1;
        printf(" %d",(ulong)uVar63);
        printf(" %d",(ulong)uVar69);
        putchar(10);
      }
      uVar69 = uVar69 + 1;
      puVar58 = puVar58 + 1;
    } while (uVar69 != 4);
    uVar63 = uVar63 + 1;
  } while (uVar63 != 5);
  function_tests = function_tests + 1;
  iVar7 = 0;
  uVar63 = 0;
  do {
    puVar58 = &DAT_0015fd14;
    uVar69 = 0;
    do {
      iVar8 = xmlMemBlocks();
      if (uVar63 < 4) {
        uVar47 = (&DAT_00162d68)[uVar63];
      }
      else {
        uVar47 = 0;
      }
      xmlValidateName(uVar47,*puVar58);
      call_tests = call_tests + 1;
      xmlResetLastError();
      iVar9 = xmlMemBlocks();
      if (iVar8 != iVar9) {
        iVar9 = xmlMemBlocks();
        printf("Leak of %d blocks found in xmlValidateName",(ulong)(uint)(iVar9 - iVar8));
        iVar7 = iVar7 + 1;
        printf(" %d",(ulong)uVar63);
        printf(" %d",(ulong)uVar69);
        putchar(10);
      }
      uVar69 = uVar69 + 1;
      puVar58 = puVar58 + 1;
    } while (uVar69 != 4);
    uVar63 = uVar63 + 1;
  } while (uVar63 != 5);
  function_tests = function_tests + 1;
  iVar8 = 0;
  uVar63 = 0;
  do {
    puVar58 = &DAT_0015fd14;
    uVar69 = 0;
    do {
      iVar9 = xmlMemBlocks();
      if (uVar63 < 4) {
        uVar47 = (&DAT_00162d68)[uVar63];
      }
      else {
        uVar47 = 0;
      }
      xmlValidateQName(uVar47,*puVar58);
      call_tests = call_tests + 1;
      xmlResetLastError();
      iVar10 = xmlMemBlocks();
      if (iVar9 != iVar10) {
        iVar10 = xmlMemBlocks();
        printf("Leak of %d blocks found in xmlValidateQName",(ulong)(uint)(iVar10 - iVar9));
        iVar8 = iVar8 + 1;
        printf(" %d",(ulong)uVar63);
        printf(" %d",(ulong)uVar69);
        putchar(10);
      }
      uVar69 = uVar69 + 1;
      puVar58 = puVar58 + 1;
    } while (uVar69 != 4);
    uVar63 = uVar63 + 1;
  } while (uVar63 != 5);
  function_tests = function_tests + 1;
  uVar63 = test_ret_2 + iVar4 + iVar55 + iVar2 + iVar3 + iVar5 + iVar6 + iVar7 + iVar8;
  if (uVar63 != 0) {
    printf("Module tree: %d errors\n",(ulong)uVar63);
  }
  return uVar63;
}

Assistant:

static int
test_tree(void) {
    int test_ret = 0;

    if (quiet == 0) printf("Testing tree : 142 of 164 functions ...\n");
    test_ret += test_xmlAddChild();
    test_ret += test_xmlAddChildList();
    test_ret += test_xmlAddNextSibling();
    test_ret += test_xmlAddPrevSibling();
    test_ret += test_xmlAddSibling();
    test_ret += test_xmlAttrSerializeTxtContent();
    test_ret += test_xmlBufContent();
    test_ret += test_xmlBufEnd();
    test_ret += test_xmlBufGetNodeContent();
    test_ret += test_xmlBufNodeDump();
    test_ret += test_xmlBufShrink();
    test_ret += test_xmlBufUse();
    test_ret += test_xmlBufferAdd();
    test_ret += test_xmlBufferAddHead();
    test_ret += test_xmlBufferCCat();
    test_ret += test_xmlBufferCat();
    test_ret += test_xmlBufferContent();
    test_ret += test_xmlBufferCreate();
    test_ret += test_xmlBufferCreateSize();
    test_ret += test_xmlBufferCreateStatic();
    test_ret += test_xmlBufferDetach();
    test_ret += test_xmlBufferEmpty();
    test_ret += test_xmlBufferGrow();
    test_ret += test_xmlBufferLength();
    test_ret += test_xmlBufferResize();
    test_ret += test_xmlBufferSetAllocationScheme();
    test_ret += test_xmlBufferShrink();
    test_ret += test_xmlBufferWriteCHAR();
    test_ret += test_xmlBufferWriteChar();
    test_ret += test_xmlBufferWriteQuotedString();
    test_ret += test_xmlBuildQName();
    test_ret += test_xmlChildElementCount();
    test_ret += test_xmlCopyDoc();
    test_ret += test_xmlCopyDtd();
    test_ret += test_xmlCopyNamespace();
    test_ret += test_xmlCopyNamespaceList();
    test_ret += test_xmlCopyNode();
    test_ret += test_xmlCopyNodeList();
    test_ret += test_xmlCopyProp();
    test_ret += test_xmlCopyPropList();
    test_ret += test_xmlCreateIntSubset();
    test_ret += test_xmlDOMWrapAdoptNode();
    test_ret += test_xmlDOMWrapCloneNode();
    test_ret += test_xmlDOMWrapNewCtxt();
    test_ret += test_xmlDOMWrapReconcileNamespaces();
    test_ret += test_xmlDOMWrapRemoveNode();
    test_ret += test_xmlDocCopyNode();
    test_ret += test_xmlDocCopyNodeList();
    test_ret += test_xmlDocDump();
    test_ret += test_xmlDocDumpFormatMemory();
    test_ret += test_xmlDocDumpFormatMemoryEnc();
    test_ret += test_xmlDocDumpMemory();
    test_ret += test_xmlDocDumpMemoryEnc();
    test_ret += test_xmlDocFormatDump();
    test_ret += test_xmlDocGetRootElement();
    test_ret += test_xmlDocSetRootElement();
    test_ret += test_xmlElemDump();
    test_ret += test_xmlFirstElementChild();
    test_ret += test_xmlGetBufferAllocationScheme();
    test_ret += test_xmlGetCompressMode();
    test_ret += test_xmlGetDocCompressMode();
    test_ret += test_xmlGetIntSubset();
    test_ret += test_xmlGetLastChild();
    test_ret += test_xmlGetLineNo();
    test_ret += test_xmlGetNoNsProp();
    test_ret += test_xmlGetNodePath();
    test_ret += test_xmlGetNsList();
    test_ret += test_xmlGetNsProp();
    test_ret += test_xmlGetProp();
    test_ret += test_xmlHasNsProp();
    test_ret += test_xmlHasProp();
    test_ret += test_xmlIsBlankNode();
    test_ret += test_xmlIsXHTML();
    test_ret += test_xmlLastElementChild();
    test_ret += test_xmlNewCDataBlock();
    test_ret += test_xmlNewCharRef();
    test_ret += test_xmlNewChild();
    test_ret += test_xmlNewComment();
    test_ret += test_xmlNewDoc();
    test_ret += test_xmlNewDocComment();
    test_ret += test_xmlNewDocFragment();
    test_ret += test_xmlNewDocNode();
    test_ret += test_xmlNewDocNodeEatName();
    test_ret += test_xmlNewDocPI();
    test_ret += test_xmlNewDocProp();
    test_ret += test_xmlNewDocRawNode();
    test_ret += test_xmlNewDocText();
    test_ret += test_xmlNewDocTextLen();
    test_ret += test_xmlNewDtd();
    test_ret += test_xmlNewNode();
    test_ret += test_xmlNewNodeEatName();
    test_ret += test_xmlNewNs();
    test_ret += test_xmlNewNsProp();
    test_ret += test_xmlNewNsPropEatName();
    test_ret += test_xmlNewPI();
    test_ret += test_xmlNewProp();
    test_ret += test_xmlNewReference();
    test_ret += test_xmlNewText();
    test_ret += test_xmlNewTextChild();
    test_ret += test_xmlNewTextLen();
    test_ret += test_xmlNextElementSibling();
    test_ret += test_xmlNodeAddContent();
    test_ret += test_xmlNodeAddContentLen();
    test_ret += test_xmlNodeBufGetContent();
    test_ret += test_xmlNodeDump();
    test_ret += test_xmlNodeDumpOutput();
    test_ret += test_xmlNodeGetBase();
    test_ret += test_xmlNodeGetContent();
    test_ret += test_xmlNodeGetLang();
    test_ret += test_xmlNodeGetSpacePreserve();
    test_ret += test_xmlNodeIsText();
    test_ret += test_xmlNodeListGetRawString();
    test_ret += test_xmlNodeListGetString();
    test_ret += test_xmlNodeSetBase();
    test_ret += test_xmlNodeSetContent();
    test_ret += test_xmlNodeSetContentLen();
    test_ret += test_xmlNodeSetLang();
    test_ret += test_xmlNodeSetName();
    test_ret += test_xmlNodeSetSpacePreserve();
    test_ret += test_xmlPreviousElementSibling();
    test_ret += test_xmlReconciliateNs();
    test_ret += test_xmlRemoveProp();
    test_ret += test_xmlReplaceNode();
    test_ret += test_xmlSaveFile();
    test_ret += test_xmlSaveFileEnc();
    test_ret += test_xmlSaveFileTo();
    test_ret += test_xmlSaveFormatFile();
    test_ret += test_xmlSaveFormatFileEnc();
    test_ret += test_xmlSaveFormatFileTo();
    test_ret += test_xmlSearchNs();
    test_ret += test_xmlSearchNsByHref();
    test_ret += test_xmlSetBufferAllocationScheme();
    test_ret += test_xmlSetCompressMode();
    test_ret += test_xmlSetDocCompressMode();
    test_ret += test_xmlSetNs();
    test_ret += test_xmlSetNsProp();
    test_ret += test_xmlSetProp();
    test_ret += test_xmlSplitQName2();
    test_ret += test_xmlSplitQName3();
    test_ret += test_xmlStringGetNodeList();
    test_ret += test_xmlStringLenGetNodeList();
    test_ret += test_xmlTextConcat();
    test_ret += test_xmlTextMerge();
    test_ret += test_xmlUnsetNsProp();
    test_ret += test_xmlUnsetProp();
    test_ret += test_xmlValidateNCName();
    test_ret += test_xmlValidateNMToken();
    test_ret += test_xmlValidateName();
    test_ret += test_xmlValidateQName();

    if (test_ret != 0)
	printf("Module tree: %d errors\n", test_ret);
    return(test_ret);
}